

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_rgb.c
# Opt level: O1

void yuv420_rgb24_sseu(uint32_t width,uint32_t height,uint8_t *Y,uint8_t *U,uint8_t *V,
                      uint32_t Y_stride,uint32_t UV_stride,uint8_t *RGB,uint32_t RGB_stride,
                      YCbCrType yuv_type)

{
  uint8_t *puVar1;
  byte bVar2;
  byte bVar10;
  byte bVar18;
  byte bVar26;
  byte bVar38;
  byte bVar46;
  byte bVar54;
  byte bVar62;
  byte bVar70;
  byte bVar78;
  byte bVar86;
  byte bVar94;
  byte bVar102;
  byte bVar110;
  byte bVar118;
  int iVar119;
  int iVar120;
  undefined1 auVar121 [15];
  undefined1 auVar122 [15];
  undefined1 auVar123 [15];
  undefined1 auVar124 [15];
  undefined1 auVar125 [15];
  undefined1 auVar126 [15];
  unkbyte10 Var127;
  undefined1 auVar128 [12];
  undefined1 auVar129 [14];
  unkbyte10 Var130;
  undefined1 auVar131 [12];
  undefined1 auVar132 [14];
  undefined1 auVar133 [15];
  unkuint9 Var134;
  undefined1 auVar135 [11];
  undefined1 auVar136 [13];
  undefined1 auVar137 [14];
  undefined1 auVar138 [12];
  unkuint10 Var139;
  undefined1 auVar140 [14];
  undefined1 auVar141 [12];
  undefined1 auVar142 [14];
  undefined1 auVar143 [12];
  undefined1 auVar144 [15];
  undefined1 auVar145 [15];
  undefined1 auVar146 [15];
  undefined1 auVar147 [15];
  undefined1 auVar148 [15];
  undefined1 auVar149 [15];
  undefined1 auVar150 [15];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [15];
  undefined1 auVar154 [15];
  undefined1 auVar155 [15];
  undefined1 auVar156 [15];
  undefined1 auVar157 [15];
  undefined1 auVar158 [15];
  undefined1 auVar159 [15];
  undefined1 auVar160 [15];
  undefined1 auVar161 [15];
  undefined1 auVar162 [15];
  undefined1 auVar163 [15];
  undefined1 auVar164 [15];
  undefined1 auVar165 [15];
  ulong uVar166;
  long lVar167;
  ulong uVar168;
  uint8_t *puVar169;
  ulong uVar170;
  uint uVar171;
  uint uVar172;
  undefined4 uVar173;
  undefined4 uVar174;
  undefined4 uVar175;
  undefined1 auVar182 [12];
  undefined1 auVar183 [12];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined4 uVar198;
  undefined4 uVar199;
  undefined1 auVar204 [12];
  undefined1 auVar205 [12];
  undefined1 auVar208 [12];
  undefined1 auVar214 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined4 uVar231;
  short sVar246;
  short sVar247;
  short sVar248;
  undefined1 auVar234 [12];
  undefined1 auVar235 [12];
  undefined1 auVar237 [12];
  short sVar249;
  ushort uVar250;
  short sVar251;
  undefined4 uVar252;
  ushort uVar276;
  short sVar277;
  ushort uVar278;
  short sVar279;
  ushort uVar280;
  short sVar281;
  ushort uVar282;
  short sVar283;
  ushort uVar284;
  short sVar285;
  undefined1 auVar255 [12];
  undefined1 auVar256 [12];
  undefined1 auVar257 [12];
  undefined1 auVar258 [12];
  undefined1 auVar260 [12];
  undefined1 auVar261 [12];
  ushort uVar286;
  short sVar287;
  ushort uVar288;
  short sVar289;
  ushort uVar290;
  ushort uVar322;
  undefined4 uVar291;
  undefined1 auVar294 [12];
  undefined1 auVar295 [12];
  undefined1 auVar296 [12];
  ushort uVar325;
  ushort uVar328;
  undefined1 auVar298 [12];
  ushort uVar323;
  short sVar324;
  ushort uVar326;
  ushort uVar329;
  undefined1 in_XMM4 [16];
  undefined1 auVar304 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  short sVar321;
  short sVar327;
  short sVar330;
  undefined1 auVar315 [16];
  ushort uVar331;
  short sVar332;
  ushort uVar333;
  short sVar352;
  short sVar354;
  short sVar356;
  short sVar358;
  short sVar360;
  undefined1 auVar334 [12];
  undefined1 auVar335 [12];
  undefined1 auVar336 [12];
  undefined1 auVar337 [12];
  ushort uVar353;
  ushort uVar355;
  ushort uVar357;
  ushort uVar359;
  ushort uVar361;
  undefined1 auVar338 [12];
  undefined1 auVar339 [12];
  short sVar362;
  ushort uVar363;
  short sVar364;
  ushort uVar365;
  short sVar366;
  ushort uVar367;
  ushort uVar393;
  undefined4 uVar368;
  short sVar392;
  short sVar394;
  short sVar396;
  short sVar398;
  short sVar400;
  undefined1 auVar371 [12];
  undefined1 auVar372 [12];
  undefined1 auVar373 [12];
  undefined1 auVar374 [12];
  ushort uVar395;
  ushort uVar397;
  ushort uVar399;
  ushort uVar401;
  undefined1 auVar376 [12];
  undefined1 auVar377 [12];
  short sVar402;
  ushort uVar403;
  short sVar404;
  ushort uVar405;
  undefined4 uVar406;
  undefined1 auVar409 [12];
  undefined1 auVar410 [12];
  undefined1 auVar412 [12];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined4 uVar423;
  undefined1 auVar426 [12];
  undefined1 auVar427 [12];
  undefined1 auVar435 [12];
  undefined1 auVar436 [12];
  undefined1 auVar441 [16];
  ushort uVar442;
  ushort uVar449;
  short sVar450;
  undefined4 uVar443;
  ushort uVar451;
  ushort uVar452;
  short sVar453;
  ushort uVar454;
  ushort uVar455;
  short sVar456;
  ushort uVar457;
  ushort uVar458;
  short sVar459;
  short sVar460;
  short sVar470;
  short sVar471;
  undefined4 uVar461;
  short sVar472;
  short sVar473;
  short sVar474;
  short sVar475;
  short sVar476;
  short sVar477;
  undefined1 auVar465 [12];
  short sVar478;
  short sVar479;
  short sVar480;
  ushort uVar481;
  undefined1 auVar482 [12];
  undefined1 auVar483 [12];
  undefined1 auVar484 [12];
  undefined1 auVar485 [12];
  ushort uVar495;
  ushort uVar496;
  ushort uVar497;
  ushort uVar498;
  ushort uVar499;
  ushort uVar500;
  undefined1 auVar490 [16];
  ushort uVar501;
  short sVar503;
  short sVar504;
  short sVar505;
  undefined1 auVar502 [16];
  short sVar506;
  short sVar507;
  undefined4 uVar508;
  undefined1 auVar512 [12];
  undefined1 auVar513 [12];
  short sVar522;
  short sVar523;
  short sVar524;
  short sVar525;
  short sVar526;
  short sVar527;
  short sVar528;
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 local_d8 [16];
  short local_b8;
  short sStack_b6;
  short local_a8;
  short sStack_a6;
  short local_98;
  short sStack_96;
  short local_88;
  short sStack_86;
  short local_78;
  short sStack_76;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  char cVar35;
  char cVar36;
  char cVar37;
  char cVar39;
  char cVar40;
  char cVar41;
  char cVar42;
  char cVar43;
  char cVar44;
  char cVar45;
  char cVar47;
  char cVar48;
  char cVar49;
  char cVar50;
  char cVar51;
  char cVar52;
  char cVar53;
  char cVar55;
  char cVar56;
  char cVar57;
  char cVar58;
  char cVar59;
  char cVar60;
  char cVar61;
  char cVar63;
  char cVar64;
  char cVar65;
  char cVar66;
  char cVar67;
  char cVar68;
  char cVar69;
  char cVar71;
  char cVar72;
  char cVar73;
  char cVar74;
  char cVar75;
  char cVar76;
  char cVar77;
  char cVar79;
  char cVar80;
  char cVar81;
  char cVar82;
  char cVar83;
  char cVar84;
  char cVar85;
  char cVar87;
  char cVar88;
  char cVar89;
  char cVar90;
  char cVar91;
  char cVar92;
  char cVar93;
  char cVar95;
  char cVar96;
  char cVar97;
  char cVar98;
  char cVar99;
  char cVar100;
  char cVar101;
  char cVar103;
  char cVar104;
  char cVar105;
  char cVar106;
  char cVar107;
  char cVar108;
  char cVar109;
  char cVar111;
  char cVar112;
  char cVar113;
  char cVar114;
  char cVar115;
  char cVar116;
  char cVar117;
  undefined6 uVar176;
  undefined6 uVar177;
  undefined8 uVar178;
  undefined8 uVar179;
  undefined1 auVar180 [12];
  undefined1 auVar181 [12];
  undefined1 auVar184 [14];
  undefined1 auVar185 [14];
  undefined1 auVar186 [14];
  undefined1 auVar187 [14];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined6 uVar200;
  undefined6 uVar201;
  undefined1 auVar215 [16];
  undefined8 uVar202;
  undefined8 uVar203;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar206 [12];
  undefined1 auVar207 [12];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar209 [14];
  undefined1 auVar210 [14];
  undefined1 auVar211 [14];
  undefined1 auVar212 [14];
  undefined1 auVar213 [14];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined6 uVar232;
  undefined8 uVar233;
  undefined1 auVar236 [12];
  undefined1 auVar238 [14];
  undefined1 auVar239 [14];
  undefined1 auVar240 [14];
  undefined1 auVar241 [14];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined6 uVar253;
  undefined8 uVar254;
  undefined1 auVar259 [12];
  undefined1 auVar262 [14];
  undefined1 auVar263 [14];
  undefined1 auVar264 [14];
  undefined1 auVar265 [14];
  undefined1 auVar266 [14];
  undefined1 auVar267 [14];
  undefined1 auVar268 [14];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined6 uVar292;
  undefined1 auVar305 [16];
  undefined8 uVar293;
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar297 [12];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar299 [14];
  undefined1 auVar300 [14];
  undefined1 auVar301 [14];
  undefined1 auVar302 [14];
  undefined1 auVar303 [14];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar340 [14];
  undefined1 auVar341 [14];
  undefined1 auVar342 [14];
  undefined1 auVar343 [14];
  undefined1 auVar344 [14];
  undefined1 auVar345 [14];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined6 uVar369;
  undefined8 uVar370;
  undefined1 auVar375 [12];
  undefined1 auVar378 [14];
  undefined1 auVar379 [14];
  undefined1 auVar380 [14];
  undefined1 auVar381 [14];
  undefined1 auVar382 [14];
  undefined1 auVar383 [14];
  undefined1 auVar384 [14];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined6 uVar407;
  undefined8 uVar408;
  undefined1 auVar411 [12];
  undefined1 auVar413 [14];
  undefined1 auVar414 [14];
  undefined1 auVar415 [14];
  undefined1 auVar416 [14];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined6 uVar424;
  undefined8 uVar425;
  undefined1 auVar428 [12];
  undefined1 auVar429 [14];
  undefined1 auVar430 [14];
  undefined1 auVar431 [14];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar437 [14];
  undefined1 auVar438 [14];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined6 uVar444;
  undefined8 uVar445;
  undefined1 auVar446 [12];
  undefined1 auVar447 [14];
  undefined1 auVar448 [16];
  undefined6 uVar462;
  undefined8 uVar463;
  undefined1 auVar464 [12];
  undefined1 auVar466 [14];
  undefined1 auVar467 [14];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar486 [14];
  undefined1 auVar487 [14];
  undefined1 auVar488 [14];
  undefined1 auVar489 [14];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined6 uVar509;
  undefined8 uVar510;
  undefined1 auVar511 [12];
  undefined1 auVar514 [14];
  undefined1 auVar515 [14];
  undefined1 auVar516 [14];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  undefined1 auVar521 [16];
  
  if (height != 1) {
    uVar166 = (ulong)yuv_type;
    iVar119 = Y_stride * 2;
    iVar120 = RGB_stride * 2;
    uVar172 = 0;
    uVar170 = 0;
    uVar171 = 0;
    auVar222 = _DAT_0010a570;
    do {
      if (width != 0x1f) {
        uVar168 = (ulong)((uVar171 >> 1) * UV_stride);
        auVar188 = pshuflw(ZEXT116(YUV2RGB[uVar166].cr_factor),ZEXT116(YUV2RGB[uVar166].cr_factor),0
                          );
        auVar189 = pshuflw(ZEXT116(YUV2RGB[uVar166].g_cb_factor),
                           ZEXT116(YUV2RGB[uVar166].g_cb_factor),0);
        auVar190 = pshuflw(ZEXT116(YUV2RGB[uVar166].g_cr_factor),
                           ZEXT116(YUV2RGB[uVar166].g_cr_factor),0);
        auVar191 = pshuflw(ZEXT116(YUV2RGB[uVar166].cb_factor),ZEXT116(YUV2RGB[uVar166].cb_factor),0
                          );
        auVar192 = ZEXT216(CONCAT11(YUV2RGB[uVar166].y_offset,YUV2RGB[uVar166].y_offset));
        auVar192 = pshuflw(auVar192,auVar192,0);
        uVar173 = auVar192._0_4_;
        auVar192 = pshuflw(ZEXT116(YUV2RGB[uVar166].y_factor),ZEXT116(YUV2RGB[uVar166].y_factor),0);
        lVar167 = 0;
        puVar169 = RGB;
        do {
          auVar441 = _DAT_0010a580;
          auVar490 = *(undefined1 (*) [16])(U + uVar168) ^ auVar222;
          auVar193 = *(undefined1 (*) [16])(V + uVar168) ^ auVar222;
          auVar221._0_14_ = auVar222._0_14_;
          auVar221[0xe] = auVar222[7];
          auVar221[0xf] = auVar490[7];
          auVar220._14_2_ = auVar221._14_2_;
          auVar220._0_13_ = auVar222._0_13_;
          auVar220[0xd] = auVar490[6];
          auVar219._13_3_ = auVar220._13_3_;
          auVar219._0_12_ = auVar222._0_12_;
          auVar219[0xc] = auVar222[6];
          auVar218._12_4_ = auVar219._12_4_;
          auVar218._0_11_ = auVar222._0_11_;
          auVar218[0xb] = auVar490[5];
          auVar217._11_5_ = auVar218._11_5_;
          auVar217._0_10_ = auVar222._0_10_;
          auVar217[10] = auVar222[5];
          auVar216._10_6_ = auVar217._10_6_;
          auVar216._0_9_ = auVar222._0_9_;
          auVar216[9] = auVar490[4];
          auVar215._9_7_ = auVar216._9_7_;
          auVar215._0_8_ = auVar222._0_8_;
          auVar215[8] = auVar222[4];
          auVar214._8_8_ = auVar215._8_8_;
          auVar214[7] = auVar490[3];
          auVar214[6] = auVar222[3];
          auVar214[5] = auVar490[2];
          auVar214[4] = auVar222[2];
          auVar214[3] = auVar490[1];
          auVar214[2] = auVar222[1];
          auVar214[0] = auVar222[0];
          auVar214[1] = auVar490[0];
          auVar222 = psraw(auVar214,8);
          auVar311._0_14_ = in_XMM4._0_14_;
          auVar311[0xe] = in_XMM4[7];
          auVar311[0xf] = auVar193[7];
          auVar310._14_2_ = auVar311._14_2_;
          auVar310._0_13_ = in_XMM4._0_13_;
          auVar310[0xd] = auVar193[6];
          auVar309._13_3_ = auVar310._13_3_;
          auVar309._0_12_ = in_XMM4._0_12_;
          auVar309[0xc] = in_XMM4[6];
          auVar308._12_4_ = auVar309._12_4_;
          auVar308._0_11_ = in_XMM4._0_11_;
          auVar308[0xb] = auVar193[5];
          auVar307._11_5_ = auVar308._11_5_;
          auVar307._0_10_ = in_XMM4._0_10_;
          auVar307[10] = in_XMM4[5];
          auVar306._10_6_ = auVar307._10_6_;
          auVar306._0_9_ = in_XMM4._0_9_;
          auVar306[9] = auVar193[4];
          auVar305._9_7_ = auVar306._9_7_;
          auVar305._0_8_ = in_XMM4._0_8_;
          auVar305[8] = in_XMM4[4];
          auVar304._8_8_ = auVar305._8_8_;
          auVar304[7] = auVar193[3];
          auVar304[6] = in_XMM4[3];
          auVar304[5] = auVar193[2];
          auVar304[4] = in_XMM4[2];
          auVar304[3] = auVar193[1];
          auVar304[2] = in_XMM4[1];
          auVar304[0] = in_XMM4[0];
          auVar304[1] = auVar193[0];
          auVar312 = psraw(auVar304,8);
          local_a8 = auVar190._0_2_;
          sStack_a6 = auVar190._2_2_;
          local_88 = auVar188._0_2_;
          sStack_86 = auVar188._2_2_;
          auVar313._0_2_ = auVar312._0_2_ * local_88;
          auVar313._2_2_ = auVar312._2_2_ * sStack_86;
          auVar313._4_2_ = auVar312._4_2_ * local_88;
          auVar313._6_2_ = auVar312._6_2_ * sStack_86;
          auVar313._8_2_ = auVar312._8_2_ * local_88;
          auVar313._10_2_ = auVar312._10_2_ * sStack_86;
          auVar313._12_2_ = auVar312._12_2_ * local_88;
          auVar313._14_2_ = auVar312._14_2_ * sStack_86;
          auVar314 = psraw(auVar313,6);
          local_98 = auVar189._0_2_;
          sStack_96 = auVar189._2_2_;
          auVar417._0_2_ = local_98 * auVar222._0_2_ + local_a8 * auVar312._0_2_;
          auVar417._2_2_ = sStack_96 * auVar222._2_2_ + sStack_a6 * auVar312._2_2_;
          auVar417._4_2_ = local_98 * auVar222._4_2_ + local_a8 * auVar312._4_2_;
          auVar417._6_2_ = sStack_96 * auVar222._6_2_ + sStack_a6 * auVar312._6_2_;
          auVar417._8_2_ = local_98 * auVar222._8_2_ + local_a8 * auVar312._8_2_;
          auVar417._10_2_ = sStack_96 * auVar222._10_2_ + sStack_a6 * auVar312._10_2_;
          auVar417._12_2_ = local_98 * auVar222._12_2_ + local_a8 * auVar312._12_2_;
          auVar417._14_2_ = sStack_96 * auVar222._14_2_ + sStack_a6 * auVar312._14_2_;
          auVar418 = psraw(auVar417,7);
          local_b8 = auVar191._0_2_;
          sStack_b6 = auVar191._2_2_;
          auVar223._0_2_ = auVar222._0_2_ * local_b8;
          auVar223._2_2_ = auVar222._2_2_ * sStack_b6;
          auVar223._4_2_ = auVar222._4_2_ * local_b8;
          auVar223._6_2_ = auVar222._6_2_ * sStack_b6;
          auVar223._8_2_ = auVar222._8_2_ * local_b8;
          auVar223._10_2_ = auVar222._10_2_ * sStack_b6;
          auVar223._12_2_ = auVar222._12_2_ * local_b8;
          auVar223._14_2_ = auVar222._14_2_ * sStack_b6;
          auVar312 = psraw(auVar223,6);
          sVar528 = auVar314._6_2_;
          sVar526 = auVar314._4_2_;
          sVar524 = auVar314._2_2_;
          sVar522 = auVar314._0_2_;
          sVar459 = auVar418._6_2_;
          sVar456 = auVar418._4_2_;
          sVar453 = auVar418._2_2_;
          sVar450 = auVar418._0_2_;
          sVar480 = auVar312._6_2_;
          sVar477 = auVar312._4_2_;
          sVar474 = auVar312._2_2_;
          sVar471 = auVar312._0_2_;
          sVar321 = auVar314._8_2_;
          sVar324 = auVar314._10_2_;
          sVar327 = auVar314._12_2_;
          sVar330 = auVar314._14_2_;
          sVar246 = auVar418._8_2_;
          sVar247 = auVar418._10_2_;
          sVar248 = auVar418._12_2_;
          sVar249 = auVar418._14_2_;
          sVar503 = auVar312._8_2_;
          sVar504 = auVar312._10_2_;
          sVar505 = auVar312._12_2_;
          sVar506 = auVar312._14_2_;
          auVar222._4_4_ = uVar173;
          auVar222._0_4_ = uVar173;
          auVar222._8_4_ = uVar173;
          auVar222._12_4_ = uVar173;
          auVar314 = psubusb(*(undefined1 (*) [16])(Y + lVar167 + uVar170),auVar222);
          auVar121[0xd] = 0;
          auVar121._0_13_ = auVar314._0_13_;
          auVar121[0xe] = auVar314[7];
          auVar122[0xc] = auVar314[6];
          auVar122._0_12_ = auVar314._0_12_;
          auVar122._13_2_ = auVar121._13_2_;
          auVar123[0xb] = 0;
          auVar123._0_11_ = auVar314._0_11_;
          auVar123._12_3_ = auVar122._12_3_;
          auVar124[10] = auVar314[5];
          auVar124._0_10_ = auVar314._0_10_;
          auVar124._11_4_ = auVar123._11_4_;
          auVar125[9] = 0;
          auVar125._0_9_ = auVar314._0_9_;
          auVar125._10_5_ = auVar124._10_5_;
          auVar126[8] = auVar314[4];
          auVar126._0_8_ = auVar314._0_8_;
          auVar126._9_6_ = auVar125._9_6_;
          auVar133._7_8_ = 0;
          auVar133._0_7_ = auVar126._8_7_;
          Var134 = CONCAT81(SUB158(auVar133 << 0x40,7),auVar314[3]);
          auVar144._9_6_ = 0;
          auVar144._0_9_ = Var134;
          auVar135._1_10_ = SUB1510(auVar144 << 0x30,5);
          auVar135[0] = auVar314[2];
          auVar145._11_4_ = 0;
          auVar145._0_11_ = auVar135;
          auVar136._1_12_ = SUB1512(auVar145 << 0x20,3);
          auVar136[0] = auVar314[1];
          local_78 = auVar192._0_2_;
          sStack_76 = auVar192._2_2_;
          uVar250 = (ushort)((ushort)auVar314[0] * local_78) >> 7;
          uVar276 = (ushort)(auVar136._0_2_ * sStack_76) >> 7;
          uVar278 = (ushort)(auVar135._0_2_ * local_78) >> 7;
          uVar280 = (ushort)((short)Var134 * sStack_76) >> 7;
          uVar282 = (ushort)(auVar126._8_2_ * local_78) >> 7;
          uVar284 = (ushort)(auVar124._10_2_ * sStack_76) >> 7;
          uVar286 = (ushort)(auVar122._12_2_ * local_78) >> 7;
          uVar288 = (ushort)((auVar121._13_2_ >> 8) * sStack_76) >> 7;
          uVar442 = (ushort)((ushort)auVar314[8] * local_78) >> 7;
          uVar449 = (ushort)((ushort)auVar314[9] * sStack_76) >> 7;
          uVar451 = (ushort)((ushort)auVar314[10] * local_78) >> 7;
          uVar452 = (ushort)((ushort)auVar314[0xb] * sStack_76) >> 7;
          uVar454 = (ushort)((ushort)auVar314[0xc] * local_78) >> 7;
          uVar455 = (ushort)((ushort)auVar314[0xd] * sStack_76) >> 7;
          uVar457 = (ushort)((ushort)auVar314[0xe] * local_78) >> 7;
          uVar458 = (ushort)((ushort)auVar314[0xf] * sStack_76) >> 7;
          sVar332 = uVar250 + sVar522;
          sVar352 = uVar276 + sVar522;
          sVar354 = uVar278 + sVar524;
          sVar356 = uVar280 + sVar524;
          sVar358 = uVar282 + sVar526;
          sVar360 = uVar284 + sVar526;
          sVar362 = uVar286 + sVar528;
          sVar364 = uVar288 + sVar528;
          sVar366 = uVar250 - sVar450;
          sVar392 = uVar276 - sVar450;
          sVar394 = uVar278 - sVar453;
          sVar396 = uVar280 - sVar453;
          sVar398 = uVar282 - sVar456;
          sVar400 = uVar284 - sVar456;
          sVar402 = uVar286 - sVar459;
          sVar404 = uVar288 - sVar459;
          sVar251 = uVar250 + sVar471;
          sVar277 = uVar276 + sVar471;
          sVar279 = uVar278 + sVar474;
          sVar281 = uVar280 + sVar474;
          sVar283 = uVar282 + sVar477;
          sVar285 = uVar284 + sVar477;
          sVar287 = uVar286 + sVar480;
          sVar289 = uVar288 + sVar480;
          sVar460 = uVar442 + sVar321;
          sVar470 = uVar449 + sVar321;
          sVar472 = uVar451 + sVar324;
          sVar473 = uVar452 + sVar324;
          sVar475 = uVar454 + sVar327;
          sVar476 = uVar455 + sVar327;
          sVar478 = uVar457 + sVar330;
          sVar479 = uVar458 + sVar330;
          bVar2 = (0 < sVar352) * (sVar352 < 0x100) * (char)sVar352 - (0xff < sVar352);
          cVar3 = (0 < sVar356) * (sVar356 < 0x100) * (char)sVar356 - (0xff < sVar356);
          uVar198 = CONCAT13(cVar3,CONCAT12((0 < sVar354) * (sVar354 < 0x100) * (char)sVar354 -
                                            (0xff < sVar354),
                                            CONCAT11(bVar2,(0 < sVar332) * (sVar332 < 0x100) *
                                                           (char)sVar332 - (0xff < sVar332))));
          cVar4 = (0 < sVar360) * (sVar360 < 0x100) * (char)sVar360 - (0xff < sVar360);
          uVar200 = CONCAT15(cVar4,CONCAT14((0 < sVar358) * (sVar358 < 0x100) * (char)sVar358 -
                                            (0xff < sVar358),uVar198));
          cVar5 = (0 < sVar364) * (sVar364 < 0x100) * (char)sVar364 - (0xff < sVar364);
          uVar202 = CONCAT17(cVar5,CONCAT16((0 < sVar362) * (sVar362 < 0x100) * (char)sVar362 -
                                            (0xff < sVar362),uVar200));
          cVar6 = (0 < sVar470) * (sVar470 < 0x100) * (char)sVar470 - (0xff < sVar470);
          auVar334._0_10_ =
               CONCAT19(cVar6,CONCAT18((0 < sVar460) * (sVar460 < 0x100) * (char)sVar460 -
                                       (0xff < sVar460),uVar202));
          auVar334[10] = (0 < sVar472) * (sVar472 < 0x100) * (char)sVar472 - (0xff < sVar472);
          cVar7 = (0 < sVar473) * (sVar473 < 0x100) * (char)sVar473 - (0xff < sVar473);
          auVar334[0xb] = cVar7;
          auVar340[0xc] = (0 < sVar475) * (sVar475 < 0x100) * (char)sVar475 - (0xff < sVar475);
          auVar340._0_12_ = auVar334;
          cVar8 = (0 < sVar476) * (sVar476 < 0x100) * (char)sVar476 - (0xff < sVar476);
          auVar340[0xd] = cVar8;
          auVar346[0xe] = (0 < sVar478) * (sVar478 < 0x100) * (char)sVar478 - (0xff < sVar478);
          auVar346._0_14_ = auVar340;
          cVar9 = (0 < sVar479) * (sVar479 < 0x100) * (char)sVar479 - (0xff < sVar479);
          auVar346[0xf] = cVar9;
          sVar332 = uVar442 - sVar246;
          sVar352 = uVar449 - sVar246;
          sVar354 = uVar451 - sVar247;
          sVar356 = uVar452 - sVar247;
          sVar358 = uVar454 - sVar248;
          sVar360 = uVar455 - sVar248;
          sVar362 = uVar457 - sVar249;
          sVar364 = uVar458 - sVar249;
          bVar10 = (0 < sVar392) * (sVar392 < 0x100) * (char)sVar392 - (0xff < sVar392);
          cVar11 = (0 < sVar396) * (sVar396 < 0x100) * (char)sVar396 - (0xff < sVar396);
          uVar291 = CONCAT13(cVar11,CONCAT12((0 < sVar394) * (sVar394 < 0x100) * (char)sVar394 -
                                             (0xff < sVar394),
                                             CONCAT11(bVar10,(0 < sVar366) * (sVar366 < 0x100) *
                                                             (char)sVar366 - (0xff < sVar366))));
          cVar12 = (0 < sVar400) * (sVar400 < 0x100) * (char)sVar400 - (0xff < sVar400);
          uVar292 = CONCAT15(cVar12,CONCAT14((0 < sVar398) * (sVar398 < 0x100) * (char)sVar398 -
                                             (0xff < sVar398),uVar291));
          cVar13 = (0 < sVar404) * (sVar404 < 0x100) * (char)sVar404 - (0xff < sVar404);
          uVar293 = CONCAT17(cVar13,CONCAT16((0 < sVar402) * (sVar402 < 0x100) * (char)sVar402 -
                                             (0xff < sVar402),uVar292));
          cVar14 = (0 < sVar352) * (sVar352 < 0x100) * (char)sVar352 - (0xff < sVar352);
          auVar371._0_10_ =
               CONCAT19(cVar14,CONCAT18((0 < sVar332) * (sVar332 < 0x100) * (char)sVar332 -
                                        (0xff < sVar332),uVar293));
          auVar371[10] = (0 < sVar354) * (sVar354 < 0x100) * (char)sVar354 - (0xff < sVar354);
          cVar15 = (0 < sVar356) * (sVar356 < 0x100) * (char)sVar356 - (0xff < sVar356);
          auVar371[0xb] = cVar15;
          auVar378[0xc] = (0 < sVar358) * (sVar358 < 0x100) * (char)sVar358 - (0xff < sVar358);
          auVar378._0_12_ = auVar371;
          cVar16 = (0 < sVar360) * (sVar360 < 0x100) * (char)sVar360 - (0xff < sVar360);
          auVar378[0xd] = cVar16;
          auVar385[0xe] = (0 < sVar362) * (sVar362 < 0x100) * (char)sVar362 - (0xff < sVar362);
          auVar385._0_14_ = auVar378;
          cVar17 = (0 < sVar364) * (sVar364 < 0x100) * (char)sVar364 - (0xff < sVar364);
          auVar385[0xf] = cVar17;
          sVar332 = uVar442 + sVar503;
          sVar352 = uVar449 + sVar503;
          sVar354 = uVar451 + sVar504;
          sVar356 = uVar452 + sVar504;
          sVar358 = uVar454 + sVar505;
          sVar360 = uVar455 + sVar505;
          sVar362 = uVar457 + sVar506;
          sVar364 = uVar458 + sVar506;
          bVar18 = (0 < sVar277) * (sVar277 < 0x100) * (char)sVar277 - (0xff < sVar277);
          cVar19 = (0 < sVar281) * (sVar281 < 0x100) * (char)sVar281 - (0xff < sVar281);
          uVar175 = CONCAT13(cVar19,CONCAT12((0 < sVar279) * (sVar279 < 0x100) * (char)sVar279 -
                                             (0xff < sVar279),
                                             CONCAT11(bVar18,(0 < sVar251) * (sVar251 < 0x100) *
                                                             (char)sVar251 - (0xff < sVar251))));
          cVar20 = (0 < sVar285) * (sVar285 < 0x100) * (char)sVar285 - (0xff < sVar285);
          uVar177 = CONCAT15(cVar20,CONCAT14((0 < sVar283) * (sVar283 < 0x100) * (char)sVar283 -
                                             (0xff < sVar283),uVar175));
          cVar21 = (0 < sVar289) * (sVar289 < 0x100) * (char)sVar289 - (0xff < sVar289);
          uVar179 = CONCAT17(cVar21,CONCAT16((0 < sVar287) * (sVar287 < 0x100) * (char)sVar287 -
                                             (0xff < sVar287),uVar177));
          cVar22 = (0 < sVar352) * (sVar352 < 0x100) * (char)sVar352 - (0xff < sVar352);
          auVar255._0_10_ =
               CONCAT19(cVar22,CONCAT18((0 < sVar332) * (sVar332 < 0x100) * (char)sVar332 -
                                        (0xff < sVar332),uVar179));
          auVar255[10] = (0 < sVar354) * (sVar354 < 0x100) * (char)sVar354 - (0xff < sVar354);
          cVar23 = (0 < sVar356) * (sVar356 < 0x100) * (char)sVar356 - (0xff < sVar356);
          auVar255[0xb] = cVar23;
          auVar262[0xc] = (0 < sVar358) * (sVar358 < 0x100) * (char)sVar358 - (0xff < sVar358);
          auVar262._0_12_ = auVar255;
          cVar24 = (0 < sVar360) * (sVar360 < 0x100) * (char)sVar360 - (0xff < sVar360);
          auVar262[0xd] = cVar24;
          auVar269[0xe] = (0 < sVar362) * (sVar362 < 0x100) * (char)sVar362 - (0xff < sVar362);
          auVar269._0_14_ = auVar262;
          cVar25 = (0 < sVar364) * (sVar364 < 0x100) * (char)sVar364 - (0xff < sVar364);
          auVar269[0xf] = cVar25;
          auVar502 = psubusb(*(undefined1 (*) [16])(Y + lVar167 + (ulong)Y_stride),auVar222);
          auVar146[0xd] = 0;
          auVar146._0_13_ = auVar502._0_13_;
          auVar146[0xe] = auVar502[7];
          auVar149[0xc] = auVar502[6];
          auVar149._0_12_ = auVar502._0_12_;
          auVar149._13_2_ = auVar146._13_2_;
          auVar154[0xb] = 0;
          auVar154._0_11_ = auVar502._0_11_;
          auVar154._12_3_ = auVar149._12_3_;
          auVar157[10] = auVar502[5];
          auVar157._0_10_ = auVar502._0_10_;
          auVar157._11_4_ = auVar154._11_4_;
          auVar160[9] = 0;
          auVar160._0_9_ = auVar502._0_9_;
          auVar160._10_5_ = auVar157._10_5_;
          auVar163[8] = auVar502[4];
          auVar163._0_8_ = auVar502._0_8_;
          auVar163._9_6_ = auVar160._9_6_;
          Var139 = CONCAT91(SUB169(ZEXT716(auVar163._8_7_) << 0x40,7),auVar502[3]);
          auVar418._10_6_ = 0;
          auVar418._0_10_ = Var139;
          auVar138._1_11_ = SUB1611(auVar418 << 0x30,5);
          auVar138[0] = auVar502[2];
          auVar314._12_4_ = 0;
          auVar314._0_12_ = auVar138;
          auVar137._1_13_ = SUB1613(auVar314 << 0x20,3);
          auVar137[0] = auVar502[1];
          uVar250 = (ushort)((ushort)auVar502[0] * local_78) >> 7;
          uVar276 = (ushort)(auVar137._0_2_ * sStack_76) >> 7;
          uVar278 = (ushort)(auVar138._0_2_ * local_78) >> 7;
          uVar280 = (ushort)((short)Var139 * sStack_76) >> 7;
          uVar282 = (ushort)(auVar163._8_2_ * local_78) >> 7;
          uVar284 = (ushort)(auVar157._10_2_ * sStack_76) >> 7;
          uVar286 = (ushort)(auVar149._12_2_ * local_78) >> 7;
          uVar288 = (ushort)((ushort)auVar502[7] * sStack_76) >> 7;
          uVar442 = (ushort)((ushort)auVar502[8] * local_78) >> 7;
          uVar449 = (ushort)((ushort)auVar502[9] * sStack_76) >> 7;
          uVar451 = (ushort)((ushort)auVar502[10] * local_78) >> 7;
          uVar452 = (ushort)((ushort)auVar502[0xb] * sStack_76) >> 7;
          uVar454 = (ushort)((ushort)auVar502[0xc] * local_78) >> 7;
          uVar455 = (ushort)((ushort)auVar502[0xd] * sStack_76) >> 7;
          uVar457 = (ushort)((ushort)auVar502[0xe] * local_78) >> 7;
          uVar458 = (ushort)((ushort)auVar502[0xf] * sStack_76) >> 7;
          sVar507 = sVar522 + uVar250;
          sVar522 = sVar522 + uVar276;
          sVar523 = sVar524 + uVar278;
          sVar524 = sVar524 + uVar280;
          sVar525 = sVar526 + uVar282;
          sVar526 = sVar526 + uVar284;
          sVar527 = sVar528 + uVar286;
          sVar528 = sVar528 + uVar288;
          sVar475 = uVar250 - sVar450;
          sVar450 = uVar276 - sVar450;
          sVar476 = uVar278 - sVar453;
          sVar453 = uVar280 - sVar453;
          sVar478 = uVar282 - sVar456;
          sVar456 = uVar284 - sVar456;
          sVar479 = uVar286 - sVar459;
          sVar459 = uVar288 - sVar459;
          sVar283 = uVar250 + sVar471;
          sVar471 = uVar276 + sVar471;
          sVar285 = uVar278 + sVar474;
          sVar474 = uVar280 + sVar474;
          sVar287 = uVar282 + sVar477;
          sVar477 = uVar284 + sVar477;
          sVar289 = uVar286 + sVar480;
          sVar480 = uVar288 + sVar480;
          sVar251 = sVar321 + uVar442;
          sVar321 = sVar321 + uVar449;
          sVar277 = sVar324 + uVar451;
          sVar324 = sVar324 + uVar452;
          sVar279 = sVar327 + uVar454;
          sVar327 = sVar327 + uVar455;
          sVar281 = sVar330 + uVar457;
          sVar330 = sVar330 + uVar458;
          bVar26 = (0 < sVar522) * (sVar522 < 0x100) * (char)sVar522 - (0xff < sVar522);
          cVar27 = (0 < sVar524) * (sVar524 < 0x100) * (char)sVar524 - (0xff < sVar524);
          cVar28 = (0 < sVar526) * (sVar526 < 0x100) * (char)sVar526 - (0xff < sVar526);
          cVar29 = (0 < sVar528) * (sVar528 < 0x100) * (char)sVar528 - (0xff < sVar528);
          cVar30 = (0 < sVar251) * (sVar251 < 0x100) * (char)sVar251 - (0xff < sVar251);
          cVar31 = (0 < sVar321) * (sVar321 < 0x100) * (char)sVar321 - (0xff < sVar321);
          cVar32 = (0 < sVar277) * (sVar277 < 0x100) * (char)sVar277 - (0xff < sVar277);
          cVar33 = (0 < sVar324) * (sVar324 < 0x100) * (char)sVar324 - (0xff < sVar324);
          cVar34 = (0 < sVar279) * (sVar279 < 0x100) * (char)sVar279 - (0xff < sVar279);
          cVar35 = (0 < sVar327) * (sVar327 < 0x100) * (char)sVar327 - (0xff < sVar327);
          cVar36 = (0 < sVar281) * (sVar281 < 0x100) * (char)sVar281 - (0xff < sVar281);
          cVar37 = (0 < sVar330) * (sVar330 < 0x100) * (char)sVar330 - (0xff < sVar330);
          sVar460 = uVar442 - sVar246;
          sVar246 = uVar449 - sVar246;
          sVar470 = uVar451 - sVar247;
          sVar247 = uVar452 - sVar247;
          sVar472 = uVar454 - sVar248;
          sVar248 = uVar455 - sVar248;
          sVar473 = uVar457 - sVar249;
          sVar249 = uVar458 - sVar249;
          bVar38 = (0 < sVar450) * (sVar450 < 0x100) * (char)sVar450 - (0xff < sVar450);
          cVar39 = (0 < sVar453) * (sVar453 < 0x100) * (char)sVar453 - (0xff < sVar453);
          cVar40 = (0 < sVar456) * (sVar456 < 0x100) * (char)sVar456 - (0xff < sVar456);
          cVar41 = (0 < sVar459) * (sVar459 < 0x100) * (char)sVar459 - (0xff < sVar459);
          cVar42 = (0 < sVar246) * (sVar246 < 0x100) * (char)sVar246 - (0xff < sVar246);
          cVar43 = (0 < sVar247) * (sVar247 < 0x100) * (char)sVar247 - (0xff < sVar247);
          cVar44 = (0 < sVar248) * (sVar248 < 0x100) * (char)sVar248 - (0xff < sVar248);
          cVar45 = (0 < sVar249) * (sVar249 < 0x100) * (char)sVar249 - (0xff < sVar249);
          sVar522 = uVar442 + sVar503;
          sVar503 = uVar449 + sVar503;
          sVar450 = uVar451 + sVar504;
          sVar504 = uVar452 + sVar504;
          sVar246 = uVar454 + sVar505;
          sVar505 = uVar455 + sVar505;
          sVar247 = uVar457 + sVar506;
          sVar506 = uVar458 + sVar506;
          bVar46 = (0 < sVar471) * (sVar471 < 0x100) * (char)sVar471 - (0xff < sVar471);
          cVar47 = (0 < sVar474) * (sVar474 < 0x100) * (char)sVar474 - (0xff < sVar474);
          uVar461 = CONCAT13(cVar47,CONCAT12((0 < sVar285) * (sVar285 < 0x100) * (char)sVar285 -
                                             (0xff < sVar285),
                                             CONCAT11(bVar46,(0 < sVar283) * (sVar283 < 0x100) *
                                                             (char)sVar283 - (0xff < sVar283))));
          cVar48 = (0 < sVar477) * (sVar477 < 0x100) * (char)sVar477 - (0xff < sVar477);
          uVar462 = CONCAT15(cVar48,CONCAT14((0 < sVar287) * (sVar287 < 0x100) * (char)sVar287 -
                                             (0xff < sVar287),uVar461));
          cVar49 = (0 < sVar480) * (sVar480 < 0x100) * (char)sVar480 - (0xff < sVar480);
          uVar463 = CONCAT17(cVar49,CONCAT16((0 < sVar289) * (sVar289 < 0x100) * (char)sVar289 -
                                             (0xff < sVar289),uVar462));
          cVar50 = (0 < sVar503) * (sVar503 < 0x100) * (char)sVar503 - (0xff < sVar503);
          auVar464._0_10_ =
               CONCAT19(cVar50,CONCAT18((0 < sVar522) * (sVar522 < 0x100) * (char)sVar522 -
                                        (0xff < sVar522),uVar463));
          auVar464[10] = (0 < sVar450) * (sVar450 < 0x100) * (char)sVar450 - (0xff < sVar450);
          cVar51 = (0 < sVar504) * (sVar504 < 0x100) * (char)sVar504 - (0xff < sVar504);
          auVar464[0xb] = cVar51;
          auVar466[0xc] = (0 < sVar246) * (sVar246 < 0x100) * (char)sVar246 - (0xff < sVar246);
          auVar466._0_12_ = auVar464;
          cVar52 = (0 < sVar505) * (sVar505 < 0x100) * (char)sVar505 - (0xff < sVar505);
          auVar466[0xd] = cVar52;
          auVar468[0xe] = (0 < sVar247) * (sVar247 < 0x100) * (char)sVar247 - (0xff < sVar247);
          auVar468._0_14_ = auVar466;
          cVar53 = (0 < sVar506) * (sVar506 < 0x100) * (char)sVar506 - (0xff < sVar506);
          auVar468[0xf] = cVar53;
          auVar517[1] = auVar490[8];
          auVar517[0] = cVar30;
          auVar517[2] = cVar31;
          auVar517[3] = auVar490[9];
          auVar517[4] = cVar32;
          auVar517[5] = auVar490[10];
          auVar517[6] = cVar33;
          auVar517[7] = auVar490[0xb];
          auVar517[8] = cVar34;
          auVar517[9] = auVar490[0xc];
          auVar517[10] = cVar35;
          auVar517[0xb] = auVar490[0xd];
          auVar517[0xc] = cVar36;
          auVar517[0xd] = auVar490[0xe];
          auVar517[0xe] = cVar37;
          auVar517[0xf] = auVar490[0xf];
          auVar314 = psraw(auVar517,8);
          local_d8[8] = auVar193[8];
          local_d8[9] = auVar193[9];
          local_d8[10] = auVar193[10];
          local_d8[0xb] = auVar193[0xb];
          local_d8[0xc] = auVar193[0xc];
          local_d8[0xd] = auVar193[0xd];
          local_d8[0xe] = auVar193[0xe];
          local_d8[0xf] = auVar193[0xf];
          auVar224[1] = local_d8[8];
          auVar224[0] = auVar312[0xc];
          auVar224[2] = auVar312[0xd];
          auVar224[3] = local_d8[9];
          auVar224[4] = auVar312[0xc];
          auVar224[5] = local_d8[10];
          auVar224[6] = auVar312[0xd];
          auVar224[7] = local_d8[0xb];
          auVar224[0xc] = auVar312[0xe];
          auVar224[8] = auVar224[0xc];
          auVar224[9] = local_d8[0xc];
          auVar224[10] = auVar312[0xf];
          auVar224[0xb] = local_d8[0xd];
          auVar224[0xd] = local_d8[0xe];
          auVar224[0xe] = auVar312[0xf];
          auVar224[0xf] = local_d8[0xf];
          auVar193 = psraw(auVar224,8);
          auVar225._0_2_ = auVar193._0_2_ * local_88;
          auVar225._2_2_ = auVar193._2_2_ * sStack_86;
          auVar225._4_2_ = auVar193._4_2_ * local_88;
          auVar225._6_2_ = auVar193._6_2_ * sStack_86;
          auVar225._8_2_ = auVar193._8_2_ * local_88;
          auVar225._10_2_ = auVar193._10_2_ * sStack_86;
          auVar225._12_2_ = auVar193._12_2_ * local_88;
          auVar225._14_2_ = auVar193._14_2_ * sStack_86;
          auVar312 = psraw(auVar225,6);
          auVar315._0_2_ = local_98 * auVar314._0_2_ + local_a8 * auVar193._0_2_;
          auVar315._2_2_ = sStack_96 * auVar314._2_2_ + sStack_a6 * auVar193._2_2_;
          auVar315._4_2_ = local_98 * auVar314._4_2_ + local_a8 * auVar193._4_2_;
          auVar315._6_2_ = sStack_96 * auVar314._6_2_ + sStack_a6 * auVar193._6_2_;
          auVar315._8_2_ = local_98 * auVar314._8_2_ + local_a8 * auVar193._8_2_;
          auVar315._10_2_ = sStack_96 * auVar314._10_2_ + sStack_a6 * auVar193._10_2_;
          auVar315._12_2_ = local_98 * auVar314._12_2_ + local_a8 * auVar193._12_2_;
          auVar315._14_2_ = sStack_96 * auVar314._14_2_ + sStack_a6 * auVar193._14_2_;
          auVar193 = psraw(auVar315,7);
          auVar518._0_2_ = auVar314._0_2_ * local_b8;
          auVar518._2_2_ = auVar314._2_2_ * sStack_b6;
          auVar518._4_2_ = auVar314._4_2_ * local_b8;
          auVar518._6_2_ = auVar314._6_2_ * sStack_b6;
          auVar518._8_2_ = auVar314._8_2_ * local_b8;
          auVar518._10_2_ = auVar314._10_2_ * sStack_b6;
          auVar518._12_2_ = auVar314._12_2_ * local_b8;
          auVar518._14_2_ = auVar314._14_2_ * sStack_b6;
          auVar314 = psraw(auVar518,6);
          sVar281 = auVar312._6_2_;
          sVar279 = auVar312._4_2_;
          sVar249 = auVar312._2_2_;
          sVar248 = auVar312._0_2_;
          sVar247 = auVar193._6_2_;
          sVar506 = auVar193._4_2_;
          sVar503 = auVar193._2_2_;
          sVar474 = auVar193._0_2_;
          sVar251 = auVar312._8_2_;
          sVar283 = auVar312._10_2_;
          sVar287 = auVar312._12_2_;
          sVar524 = auVar312._14_2_;
          sVar277 = auVar193._8_2_;
          sVar285 = auVar193._10_2_;
          sVar289 = auVar193._12_2_;
          sVar321 = auVar193._14_2_;
          auVar193 = psubusb(*(undefined1 (*) [16])(Y + lVar167 + uVar170 + 0x10),auVar222);
          auVar147[0xd] = 0;
          auVar147._0_13_ = auVar193._0_13_;
          auVar147[0xe] = auVar193[7];
          auVar150[0xc] = auVar193[6];
          auVar150._0_12_ = auVar193._0_12_;
          auVar150._13_2_ = auVar147._13_2_;
          auVar155[0xb] = 0;
          auVar155._0_11_ = auVar193._0_11_;
          auVar155._12_3_ = auVar150._12_3_;
          auVar158[10] = auVar193[5];
          auVar158._0_10_ = auVar193._0_10_;
          auVar158._11_4_ = auVar155._11_4_;
          auVar161[9] = 0;
          auVar161._0_9_ = auVar193._0_9_;
          auVar161._10_5_ = auVar158._10_5_;
          auVar164[8] = auVar193[4];
          auVar164._0_8_ = auVar193._0_8_;
          auVar164._9_6_ = auVar161._9_6_;
          Var139 = CONCAT91(SUB169(ZEXT716(auVar164._8_7_) << 0x40,7),auVar193[3]);
          auVar502._10_6_ = 0;
          auVar502._0_10_ = Var139;
          auVar141._1_11_ = SUB1611(auVar502 << 0x30,5);
          auVar141[0] = auVar193[2];
          auVar490._12_4_ = 0;
          auVar490._0_12_ = auVar141;
          auVar140._1_13_ = SUB1613(auVar490 << 0x20,3);
          auVar140[0] = auVar193[1];
          uVar442 = (ushort)((ushort)auVar193[0] * local_78) >> 7;
          uVar449 = (ushort)(auVar140._0_2_ * sStack_76) >> 7;
          uVar451 = (ushort)(auVar141._0_2_ * local_78) >> 7;
          uVar452 = (ushort)((short)Var139 * sStack_76) >> 7;
          uVar454 = (ushort)(auVar164._8_2_ * local_78) >> 7;
          uVar455 = (ushort)(auVar158._10_2_ * sStack_76) >> 7;
          uVar457 = (ushort)(auVar150._12_2_ * local_78) >> 7;
          uVar458 = (ushort)((ushort)auVar193[7] * sStack_76) >> 7;
          uVar250 = (ushort)((ushort)auVar193[8] * local_78) >> 7;
          uVar276 = (ushort)((ushort)auVar193[9] * sStack_76) >> 7;
          uVar278 = (ushort)((ushort)auVar193[10] * local_78) >> 7;
          uVar280 = (ushort)((ushort)auVar193[0xb] * sStack_76) >> 7;
          uVar282 = (ushort)((ushort)auVar193[0xc] * local_78) >> 7;
          uVar284 = (ushort)((ushort)auVar193[0xd] * sStack_76) >> 7;
          uVar286 = (ushort)((ushort)auVar193[0xe] * local_78) >> 7;
          uVar288 = (ushort)((ushort)auVar193[0xf] * sStack_76) >> 7;
          sVar526 = uVar442 + sVar248;
          sVar528 = uVar449 + sVar248;
          sVar324 = uVar451 + sVar249;
          sVar327 = uVar452 + sVar249;
          sVar330 = uVar454 + sVar279;
          sVar332 = uVar455 + sVar279;
          sVar352 = uVar457 + sVar281;
          sVar354 = uVar458 + sVar281;
          sVar522 = uVar442 - sVar474;
          sVar471 = uVar449 - sVar474;
          sVar477 = uVar451 - sVar503;
          sVar480 = uVar452 - sVar503;
          sVar504 = uVar454 - sVar506;
          sVar505 = uVar455 - sVar506;
          sVar450 = uVar457 - sVar247;
          sVar246 = uVar458 - sVar247;
          sVar356 = uVar250 + sVar251;
          sVar358 = uVar276 + sVar251;
          sVar360 = uVar278 + sVar283;
          sVar362 = uVar280 + sVar283;
          sVar364 = uVar282 + sVar287;
          sVar366 = uVar284 + sVar287;
          sVar392 = uVar286 + sVar524;
          sVar394 = uVar288 + sVar524;
          bVar54 = (0 < sVar528) * (sVar528 < 0x100) * (char)sVar528 - (0xff < sVar528);
          cVar55 = (0 < sVar327) * (sVar327 < 0x100) * (char)sVar327 - (0xff < sVar327);
          uVar252 = CONCAT13(cVar55,CONCAT12((0 < sVar324) * (sVar324 < 0x100) * (char)sVar324 -
                                             (0xff < sVar324),
                                             CONCAT11(bVar54,(0 < sVar526) * (sVar526 < 0x100) *
                                                             (char)sVar526 - (0xff < sVar526))));
          cVar56 = (0 < sVar332) * (sVar332 < 0x100) * (char)sVar332 - (0xff < sVar332);
          uVar253 = CONCAT15(cVar56,CONCAT14((0 < sVar330) * (sVar330 < 0x100) * (char)sVar330 -
                                             (0xff < sVar330),uVar252));
          cVar57 = (0 < sVar354) * (sVar354 < 0x100) * (char)sVar354 - (0xff < sVar354);
          uVar254 = CONCAT17(cVar57,CONCAT16((0 < sVar352) * (sVar352 < 0x100) * (char)sVar352 -
                                             (0xff < sVar352),uVar253));
          cVar58 = (0 < sVar358) * (sVar358 < 0x100) * (char)sVar358 - (0xff < sVar358);
          auVar426._0_10_ =
               CONCAT19(cVar58,CONCAT18((0 < sVar356) * (sVar356 < 0x100) * (char)sVar356 -
                                        (0xff < sVar356),uVar254));
          auVar426[10] = (0 < sVar360) * (sVar360 < 0x100) * (char)sVar360 - (0xff < sVar360);
          cVar59 = (0 < sVar362) * (sVar362 < 0x100) * (char)sVar362 - (0xff < sVar362);
          auVar426[0xb] = cVar59;
          auVar429[0xc] = (0 < sVar364) * (sVar364 < 0x100) * (char)sVar364 - (0xff < sVar364);
          auVar429._0_12_ = auVar426;
          cVar60 = (0 < sVar366) * (sVar366 < 0x100) * (char)sVar366 - (0xff < sVar366);
          auVar429[0xd] = cVar60;
          auVar432[0xe] = (0 < sVar392) * (sVar392 < 0x100) * (char)sVar392 - (0xff < sVar392);
          auVar432._0_14_ = auVar429;
          cVar61 = (0 < sVar394) * (sVar394 < 0x100) * (char)sVar394 - (0xff < sVar394);
          auVar432[0xf] = cVar61;
          sVar526 = uVar250 - sVar277;
          sVar528 = uVar276 - sVar277;
          sVar324 = uVar278 - sVar285;
          sVar327 = uVar280 - sVar285;
          sVar330 = uVar282 - sVar289;
          sVar332 = uVar284 - sVar289;
          sVar352 = uVar286 - sVar321;
          sVar354 = uVar288 - sVar321;
          bVar62 = (0 < sVar471) * (sVar471 < 0x100) * (char)sVar471 - (0xff < sVar471);
          cVar63 = (0 < sVar480) * (sVar480 < 0x100) * (char)sVar480 - (0xff < sVar480);
          uVar368 = CONCAT13(cVar63,CONCAT12((0 < sVar477) * (sVar477 < 0x100) * (char)sVar477 -
                                             (0xff < sVar477),
                                             CONCAT11(bVar62,(0 < sVar522) * (sVar522 < 0x100) *
                                                             (char)sVar522 - (0xff < sVar522))));
          cVar64 = (0 < sVar505) * (sVar505 < 0x100) * (char)sVar505 - (0xff < sVar505);
          uVar369 = CONCAT15(cVar64,CONCAT14((0 < sVar504) * (sVar504 < 0x100) * (char)sVar504 -
                                             (0xff < sVar504),uVar368));
          cVar65 = (0 < sVar246) * (sVar246 < 0x100) * (char)sVar246 - (0xff < sVar246);
          uVar370 = CONCAT17(cVar65,CONCAT16((0 < sVar450) * (sVar450 < 0x100) * (char)sVar450 -
                                             (0xff < sVar450),uVar369));
          cVar66 = (0 < sVar528) * (sVar528 < 0x100) * (char)sVar528 - (0xff < sVar528);
          auVar409._0_10_ =
               CONCAT19(cVar66,CONCAT18((0 < sVar526) * (sVar526 < 0x100) * (char)sVar526 -
                                        (0xff < sVar526),uVar370));
          auVar409[10] = (0 < sVar324) * (sVar324 < 0x100) * (char)sVar324 - (0xff < sVar324);
          cVar67 = (0 < sVar327) * (sVar327 < 0x100) * (char)sVar327 - (0xff < sVar327);
          auVar409[0xb] = cVar67;
          auVar413[0xc] = (0 < sVar330) * (sVar330 < 0x100) * (char)sVar330 - (0xff < sVar330);
          auVar413._0_12_ = auVar409;
          cVar68 = (0 < sVar332) * (sVar332 < 0x100) * (char)sVar332 - (0xff < sVar332);
          auVar413[0xd] = cVar68;
          auVar419[0xe] = (0 < sVar352) * (sVar352 < 0x100) * (char)sVar352 - (0xff < sVar352);
          auVar419._0_14_ = auVar413;
          cVar69 = (0 < sVar354) * (sVar354 < 0x100) * (char)sVar354 - (0xff < sVar354);
          auVar419[0xf] = cVar69;
          sVar362 = auVar314._6_2_;
          sVar358 = auVar314._4_2_;
          sVar354 = auVar314._2_2_;
          sVar330 = auVar314._0_2_;
          sVar364 = auVar314._8_2_;
          sVar366 = auVar314._10_2_;
          sVar392 = auVar314._12_2_;
          sVar394 = auVar314._14_2_;
          sVar526 = uVar442 + sVar330;
          sVar528 = uVar449 + sVar330;
          sVar324 = uVar451 + sVar354;
          sVar327 = uVar452 + sVar354;
          sVar332 = uVar454 + sVar358;
          sVar352 = uVar455 + sVar358;
          sVar356 = uVar457 + sVar362;
          sVar360 = uVar458 + sVar362;
          sVar522 = uVar250 + sVar364;
          sVar471 = uVar276 + sVar364;
          sVar477 = uVar278 + sVar366;
          sVar480 = uVar280 + sVar366;
          sVar504 = uVar282 + sVar392;
          sVar505 = uVar284 + sVar392;
          sVar450 = uVar286 + sVar394;
          sVar246 = uVar288 + sVar394;
          bVar70 = (0 < sVar528) * (sVar528 < 0x100) * (char)sVar528 - (0xff < sVar528);
          cVar71 = (0 < sVar327) * (sVar327 < 0x100) * (char)sVar327 - (0xff < sVar327);
          uVar406 = CONCAT13(cVar71,CONCAT12((0 < sVar324) * (sVar324 < 0x100) * (char)sVar324 -
                                             (0xff < sVar324),
                                             CONCAT11(bVar70,(0 < sVar526) * (sVar526 < 0x100) *
                                                             (char)sVar526 - (0xff < sVar526))));
          cVar72 = (0 < sVar352) * (sVar352 < 0x100) * (char)sVar352 - (0xff < sVar352);
          uVar407 = CONCAT15(cVar72,CONCAT14((0 < sVar332) * (sVar332 < 0x100) * (char)sVar332 -
                                             (0xff < sVar332),uVar406));
          cVar73 = (0 < sVar360) * (sVar360 < 0x100) * (char)sVar360 - (0xff < sVar360);
          uVar408 = CONCAT17(cVar73,CONCAT16((0 < sVar356) * (sVar356 < 0x100) * (char)sVar356 -
                                             (0xff < sVar356),uVar407));
          cVar74 = (0 < sVar471) * (sVar471 < 0x100) * (char)sVar471 - (0xff < sVar471);
          auVar482._0_10_ =
               CONCAT19(cVar74,CONCAT18((0 < sVar522) * (sVar522 < 0x100) * (char)sVar522 -
                                        (0xff < sVar522),uVar408));
          auVar482[10] = (0 < sVar477) * (sVar477 < 0x100) * (char)sVar477 - (0xff < sVar477);
          cVar75 = (0 < sVar480) * (sVar480 < 0x100) * (char)sVar480 - (0xff < sVar480);
          auVar482[0xb] = cVar75;
          auVar486[0xc] = (0 < sVar504) * (sVar504 < 0x100) * (char)sVar504 - (0xff < sVar504);
          auVar486._0_12_ = auVar482;
          cVar76 = (0 < sVar505) * (sVar505 < 0x100) * (char)sVar505 - (0xff < sVar505);
          auVar486[0xd] = cVar76;
          auVar491[0xe] = (0 < sVar450) * (sVar450 < 0x100) * (char)sVar450 - (0xff < sVar450);
          auVar491._0_14_ = auVar486;
          cVar77 = (0 < sVar246) * (sVar246 < 0x100) * (char)sVar246 - (0xff < sVar246);
          auVar491[0xf] = cVar77;
          auVar222 = psubusb(*(undefined1 (*) [16])(Y + lVar167 + (ulong)Y_stride + 0x10),auVar222);
          auVar148[0xd] = 0;
          auVar148._0_13_ = auVar222._0_13_;
          auVar148[0xe] = auVar222[7];
          auVar153[0xc] = auVar222[6];
          auVar153._0_12_ = auVar222._0_12_;
          auVar153._13_2_ = auVar148._13_2_;
          auVar156[0xb] = 0;
          auVar156._0_11_ = auVar222._0_11_;
          auVar156._12_3_ = auVar153._12_3_;
          auVar159[10] = auVar222[5];
          auVar159._0_10_ = auVar222._0_10_;
          auVar159._11_4_ = auVar156._11_4_;
          auVar162[9] = 0;
          auVar162._0_9_ = auVar222._0_9_;
          auVar162._10_5_ = auVar159._10_5_;
          auVar165[8] = auVar222[4];
          auVar165._0_8_ = auVar222._0_8_;
          auVar165._9_6_ = auVar162._9_6_;
          Var139 = CONCAT91(SUB169(ZEXT716(auVar165._8_7_) << 0x40,7),auVar222[3]);
          auVar152._10_6_ = 0;
          auVar152._0_10_ = Var139;
          auVar143._1_11_ = SUB1611(auVar152 << 0x30,5);
          auVar143[0] = auVar222[2];
          auVar151._12_4_ = 0;
          auVar151._0_12_ = auVar143;
          auVar142._1_13_ = SUB1613(auVar151 << 0x20,3);
          auVar142[0] = auVar222[1];
          uVar250 = (ushort)((ushort)auVar222[0] * local_78) >> 7;
          uVar276 = (ushort)(auVar142._0_2_ * sStack_76) >> 7;
          uVar278 = (ushort)(auVar143._0_2_ * local_78) >> 7;
          uVar280 = (ushort)((short)Var139 * sStack_76) >> 7;
          uVar282 = (ushort)(auVar165._8_2_ * local_78) >> 7;
          uVar284 = (ushort)(auVar159._10_2_ * sStack_76) >> 7;
          uVar286 = (ushort)(auVar153._12_2_ * local_78) >> 7;
          uVar288 = (ushort)((ushort)auVar222[7] * sStack_76) >> 7;
          sVar522 = uVar250 - sVar474;
          sVar474 = uVar276 - sVar474;
          sVar471 = uVar278 - sVar503;
          sVar503 = uVar280 - sVar503;
          sVar477 = uVar282 - sVar506;
          sVar506 = uVar284 - sVar506;
          sVar480 = uVar286 - sVar247;
          sVar247 = uVar288 - sVar247;
          sVar526 = sVar248 + uVar250;
          sVar248 = sVar248 + uVar276;
          sVar528 = sVar249 + uVar278;
          sVar249 = sVar249 + uVar280;
          sVar324 = sVar279 + uVar282;
          sVar279 = sVar279 + uVar284;
          sVar327 = sVar281 + uVar286;
          sVar281 = sVar281 + uVar288;
          sVar332 = uVar250 + sVar330;
          sVar330 = uVar276 + sVar330;
          sVar352 = uVar278 + sVar354;
          sVar354 = uVar280 + sVar354;
          sVar356 = uVar282 + sVar358;
          sVar358 = uVar284 + sVar358;
          sVar360 = uVar286 + sVar362;
          sVar362 = uVar288 + sVar362;
          uVar250 = (ushort)((ushort)auVar222[8] * local_78) >> 7;
          uVar276 = (ushort)((ushort)auVar222[9] * sStack_76) >> 7;
          uVar278 = (ushort)((ushort)auVar222[10] * local_78) >> 7;
          uVar280 = (ushort)((ushort)auVar222[0xb] * sStack_76) >> 7;
          uVar282 = (ushort)((ushort)auVar222[0xc] * local_78) >> 7;
          uVar284 = (ushort)((ushort)auVar222[0xd] * sStack_76) >> 7;
          uVar286 = (ushort)((ushort)auVar222[0xe] * local_78) >> 7;
          uVar288 = (ushort)((ushort)auVar222[0xf] * sStack_76) >> 7;
          sVar504 = sVar251 + uVar250;
          sVar251 = sVar251 + uVar276;
          sVar505 = sVar283 + uVar278;
          sVar283 = sVar283 + uVar280;
          sVar450 = sVar287 + uVar282;
          sVar287 = sVar287 + uVar284;
          sVar246 = sVar524 + uVar286;
          sVar524 = sVar524 + uVar288;
          local_d8[1] = (0 < sVar248) * (sVar248 < 0x100) * (char)sVar248 - (0xff < sVar248);
          local_d8[3] = (0 < sVar249) * (sVar249 < 0x100) * (char)sVar249 - (0xff < sVar249);
          local_d8[5] = (0 < sVar279) * (sVar279 < 0x100) * (char)sVar279 - (0xff < sVar279);
          local_d8[7] = (0 < sVar281) * (sVar281 < 0x100) * (char)sVar281 - (0xff < sVar281);
          local_d8[9] = (0 < sVar251) * (sVar251 < 0x100) * (char)sVar251 - (0xff < sVar251);
          local_d8[0xb] = (0 < sVar283) * (sVar283 < 0x100) * (char)sVar283 - (0xff < sVar283);
          local_d8[0xd] = (0 < sVar287) * (sVar287 < 0x100) * (char)sVar287 - (0xff < sVar287);
          local_d8[0xf] = (0 < sVar524) * (sVar524 < 0x100) * (char)sVar524 - (0xff < sVar524);
          local_d8[0] = (0 < sVar526) * (sVar526 < 0x100) * (char)sVar526 - (0xff < sVar526);
          local_d8[2] = (0 < sVar528) * (sVar528 < 0x100) * (char)sVar528 - (0xff < sVar528);
          local_d8[4] = (0 < sVar324) * (sVar324 < 0x100) * (char)sVar324 - (0xff < sVar324);
          local_d8[6] = (0 < sVar327) * (sVar327 < 0x100) * (char)sVar327 - (0xff < sVar327);
          local_d8[8] = (0 < sVar504) * (sVar504 < 0x100) * (char)sVar504 - (0xff < sVar504);
          local_d8[10] = (0 < sVar505) * (sVar505 < 0x100) * (char)sVar505 - (0xff < sVar505);
          local_d8[0xc] = (0 < sVar450) * (sVar450 < 0x100) * (char)sVar450 - (0xff < sVar450);
          local_d8[0xe] = (0 < sVar246) * (sVar246 < 0x100) * (char)sVar246 - (0xff < sVar246);
          sVar504 = uVar250 - sVar277;
          sVar277 = uVar276 - sVar277;
          sVar505 = uVar278 - sVar285;
          sVar285 = uVar280 - sVar285;
          sVar450 = uVar282 - sVar289;
          sVar289 = uVar284 - sVar289;
          sVar246 = uVar286 - sVar321;
          sVar321 = uVar288 - sVar321;
          bVar78 = (0 < sVar474) * (sVar474 < 0x100) * (char)sVar474 - (0xff < sVar474);
          cVar79 = (0 < sVar503) * (sVar503 < 0x100) * (char)sVar503 - (0xff < sVar503);
          uVar174 = CONCAT13(cVar79,CONCAT12((0 < sVar471) * (sVar471 < 0x100) * (char)sVar471 -
                                             (0xff < sVar471),
                                             CONCAT11(bVar78,(0 < sVar522) * (sVar522 < 0x100) *
                                                             (char)sVar522 - (0xff < sVar522))));
          cVar80 = (0 < sVar506) * (sVar506 < 0x100) * (char)sVar506 - (0xff < sVar506);
          uVar176 = CONCAT15(cVar80,CONCAT14((0 < sVar477) * (sVar477 < 0x100) * (char)sVar477 -
                                             (0xff < sVar477),uVar174));
          cVar81 = (0 < sVar247) * (sVar247 < 0x100) * (char)sVar247 - (0xff < sVar247);
          uVar178 = CONCAT17(cVar81,CONCAT16((0 < sVar480) * (sVar480 < 0x100) * (char)sVar480 -
                                             (0xff < sVar480),uVar176));
          cVar82 = (0 < sVar277) * (sVar277 < 0x100) * (char)sVar277 - (0xff < sVar277);
          auVar180._0_10_ =
               CONCAT19(cVar82,CONCAT18((0 < sVar504) * (sVar504 < 0x100) * (char)sVar504 -
                                        (0xff < sVar504),uVar178));
          auVar180[10] = (0 < sVar505) * (sVar505 < 0x100) * (char)sVar505 - (0xff < sVar505);
          cVar83 = (0 < sVar285) * (sVar285 < 0x100) * (char)sVar285 - (0xff < sVar285);
          auVar180[0xb] = cVar83;
          auVar184[0xc] = (0 < sVar450) * (sVar450 < 0x100) * (char)sVar450 - (0xff < sVar450);
          auVar184._0_12_ = auVar180;
          cVar84 = (0 < sVar289) * (sVar289 < 0x100) * (char)sVar289 - (0xff < sVar289);
          auVar184[0xd] = cVar84;
          auVar194[0xe] = (0 < sVar246) * (sVar246 < 0x100) * (char)sVar246 - (0xff < sVar246);
          auVar194._0_14_ = auVar184;
          cVar85 = (0 < sVar321) * (sVar321 < 0x100) * (char)sVar321 - (0xff < sVar321);
          auVar194[0xf] = cVar85;
          sVar522 = uVar250 + sVar364;
          sVar364 = uVar276 + sVar364;
          sVar471 = uVar278 + sVar366;
          sVar366 = uVar280 + sVar366;
          sVar474 = uVar282 + sVar392;
          sVar392 = uVar284 + sVar392;
          sVar477 = uVar286 + sVar394;
          sVar394 = uVar288 + sVar394;
          bVar86 = (0 < sVar330) * (sVar330 < 0x100) * (char)sVar330 - (0xff < sVar330);
          cVar87 = (0 < sVar354) * (sVar354 < 0x100) * (char)sVar354 - (0xff < sVar354);
          uVar443 = CONCAT13(cVar87,CONCAT12((0 < sVar352) * (sVar352 < 0x100) * (char)sVar352 -
                                             (0xff < sVar352),
                                             CONCAT11(bVar86,(0 < sVar332) * (sVar332 < 0x100) *
                                                             (char)sVar332 - (0xff < sVar332))));
          cVar88 = (0 < sVar358) * (sVar358 < 0x100) * (char)sVar358 - (0xff < sVar358);
          uVar444 = CONCAT15(cVar88,CONCAT14((0 < sVar356) * (sVar356 < 0x100) * (char)sVar356 -
                                             (0xff < sVar356),uVar443));
          cVar89 = (0 < sVar362) * (sVar362 < 0x100) * (char)sVar362 - (0xff < sVar362);
          uVar445 = CONCAT17(cVar89,CONCAT16((0 < sVar360) * (sVar360 < 0x100) * (char)sVar360 -
                                             (0xff < sVar360),uVar444));
          cVar90 = (0 < sVar364) * (sVar364 < 0x100) * (char)sVar364 - (0xff < sVar364);
          auVar446._0_10_ =
               CONCAT19(cVar90,CONCAT18((0 < sVar522) * (sVar522 < 0x100) * (char)sVar522 -
                                        (0xff < sVar522),uVar445));
          auVar446[10] = (0 < sVar471) * (sVar471 < 0x100) * (char)sVar471 - (0xff < sVar471);
          cVar91 = (0 < sVar366) * (sVar366 < 0x100) * (char)sVar366 - (0xff < sVar366);
          auVar446[0xb] = cVar91;
          auVar447[0xc] = (0 < sVar474) * (sVar474 < 0x100) * (char)sVar474 - (0xff < sVar474);
          auVar447._0_12_ = auVar446;
          cVar92 = (0 < sVar392) * (sVar392 < 0x100) * (char)sVar392 - (0xff < sVar392);
          auVar447[0xd] = cVar92;
          auVar448[0xe] = (0 < sVar477) * (sVar477 < 0x100) * (char)sVar477 - (0xff < sVar477);
          auVar448._0_14_ = auVar447;
          cVar93 = (0 < sVar394) * (sVar394 < 0x100) * (char)sVar394 - (0xff < sVar394);
          auVar448[0xf] = cVar93;
          auVar193 = auVar346 & _DAT_0010a580;
          auVar222 = auVar432 & _DAT_0010a580;
          sVar522 = auVar193._0_2_;
          sVar471 = auVar193._2_2_;
          bVar94 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[2] - (0xff < sVar471);
          sVar471 = auVar193._4_2_;
          sVar474 = auVar193._6_2_;
          cVar95 = (0 < sVar474) * (sVar474 < 0x100) * auVar193[6] - (0xff < sVar474);
          uVar231 = CONCAT13(cVar95,CONCAT12((0 < sVar471) * (sVar471 < 0x100) * auVar193[4] -
                                             (0xff < sVar471),
                                             CONCAT11(bVar94,(0 < sVar522) * (sVar522 < 0x100) *
                                                             auVar193[0] - (0xff < sVar522))));
          sVar522 = auVar193._8_2_;
          sVar471 = auVar193._10_2_;
          cVar96 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[10] - (0xff < sVar471);
          uVar232 = CONCAT15(cVar96,CONCAT14((0 < sVar522) * (sVar522 < 0x100) * auVar193[8] -
                                             (0xff < sVar522),uVar231));
          sVar522 = auVar193._12_2_;
          sVar471 = auVar193._14_2_;
          cVar97 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[0xe] - (0xff < sVar471);
          uVar233 = CONCAT17(cVar97,CONCAT16((0 < sVar522) * (sVar522 < 0x100) * auVar193[0xc] -
                                             (0xff < sVar522),uVar232));
          sVar522 = auVar222._0_2_;
          sVar471 = auVar222._2_2_;
          cVar98 = (0 < sVar471) * (sVar471 < 0x100) * auVar222[2] - (0xff < sVar471);
          auVar294._0_10_ =
               CONCAT19(cVar98,CONCAT18((0 < sVar522) * (sVar522 < 0x100) * auVar222[0] -
                                        (0xff < sVar522),uVar233));
          sVar522 = auVar222._4_2_;
          auVar294[10] = (0 < sVar522) * (sVar522 < 0x100) * auVar222[4] - (0xff < sVar522);
          sVar522 = auVar222._6_2_;
          cVar99 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[6] - (0xff < sVar522);
          auVar294[0xb] = cVar99;
          sVar522 = auVar222._8_2_;
          auVar299[0xc] = (0 < sVar522) * (sVar522 < 0x100) * auVar222[8] - (0xff < sVar522);
          auVar299._0_12_ = auVar294;
          sVar522 = auVar222._10_2_;
          cVar100 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[10] - (0xff < sVar522);
          auVar299[0xd] = cVar100;
          sVar522 = auVar222._12_2_;
          auVar316[0xe] = (0 < sVar522) * (sVar522 < 0x100) * auVar222[0xc] - (0xff < sVar522);
          auVar316._0_14_ = auVar299;
          sVar522 = auVar222._14_2_;
          cVar101 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[0xe] - (0xff < sVar522);
          auVar316[0xf] = cVar101;
          auVar193 = auVar385 & _DAT_0010a580;
          auVar222 = auVar419 & _DAT_0010a580;
          sVar522 = auVar193._0_2_;
          sVar471 = auVar193._2_2_;
          bVar102 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[2] - (0xff < sVar471);
          sVar471 = auVar193._4_2_;
          sVar474 = auVar193._6_2_;
          cVar103 = (0 < sVar474) * (sVar474 < 0x100) * auVar193[6] - (0xff < sVar474);
          uVar199 = CONCAT13(cVar103,CONCAT12((0 < sVar471) * (sVar471 < 0x100) * auVar193[4] -
                                              (0xff < sVar471),
                                              CONCAT11(bVar102,(0 < sVar522) * (sVar522 < 0x100) *
                                                               auVar193[0] - (0xff < sVar522))));
          sVar522 = auVar193._8_2_;
          sVar471 = auVar193._10_2_;
          cVar104 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[10] - (0xff < sVar471);
          uVar201 = CONCAT15(cVar104,CONCAT14((0 < sVar522) * (sVar522 < 0x100) * auVar193[8] -
                                              (0xff < sVar522),uVar199));
          sVar522 = auVar193._12_2_;
          sVar471 = auVar193._14_2_;
          cVar105 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[0xe] - (0xff < sVar471);
          uVar203 = CONCAT17(cVar105,CONCAT16((0 < sVar522) * (sVar522 < 0x100) * auVar193[0xc] -
                                              (0xff < sVar522),uVar201));
          sVar522 = auVar222._0_2_;
          sVar471 = auVar222._2_2_;
          cVar106 = (0 < sVar471) * (sVar471 < 0x100) * auVar222[2] - (0xff < sVar471);
          auVar234._0_10_ =
               CONCAT19(cVar106,CONCAT18((0 < sVar522) * (sVar522 < 0x100) * auVar222[0] -
                                         (0xff < sVar522),uVar203));
          sVar522 = auVar222._4_2_;
          auVar234[10] = (0 < sVar522) * (sVar522 < 0x100) * auVar222[4] - (0xff < sVar522);
          sVar522 = auVar222._6_2_;
          cVar107 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[6] - (0xff < sVar522);
          auVar234[0xb] = cVar107;
          sVar522 = auVar222._8_2_;
          auVar238[0xc] = (0 < sVar522) * (sVar522 < 0x100) * auVar222[8] - (0xff < sVar522);
          auVar238._0_12_ = auVar234;
          sVar522 = auVar222._10_2_;
          cVar108 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[10] - (0xff < sVar522);
          auVar238[0xd] = cVar108;
          sVar522 = auVar222._12_2_;
          auVar242[0xe] = (0 < sVar522) * (sVar522 < 0x100) * auVar222[0xc] - (0xff < sVar522);
          auVar242._0_14_ = auVar238;
          sVar522 = auVar222._14_2_;
          cVar109 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[0xe] - (0xff < sVar522);
          auVar242[0xf] = cVar109;
          auVar193 = auVar269 & _DAT_0010a580;
          auVar222 = auVar491 & _DAT_0010a580;
          sVar522 = auVar193._0_2_;
          sVar471 = auVar193._2_2_;
          bVar110 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[2] - (0xff < sVar471);
          sVar471 = auVar193._4_2_;
          sVar474 = auVar193._6_2_;
          cVar111 = (0 < sVar474) * (sVar474 < 0x100) * auVar193[6] - (0xff < sVar474);
          uVar508 = CONCAT13(cVar111,CONCAT12((0 < sVar471) * (sVar471 < 0x100) * auVar193[4] -
                                              (0xff < sVar471),
                                              CONCAT11(bVar110,(0 < sVar522) * (sVar522 < 0x100) *
                                                               auVar193[0] - (0xff < sVar522))));
          sVar522 = auVar193._8_2_;
          sVar471 = auVar193._10_2_;
          cVar112 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[10] - (0xff < sVar471);
          uVar509 = CONCAT15(cVar112,CONCAT14((0 < sVar522) * (sVar522 < 0x100) * auVar193[8] -
                                              (0xff < sVar522),uVar508));
          sVar522 = auVar193._12_2_;
          sVar471 = auVar193._14_2_;
          cVar113 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[0xe] - (0xff < sVar471);
          uVar510 = CONCAT17(cVar113,CONCAT16((0 < sVar522) * (sVar522 < 0x100) * auVar193[0xc] -
                                              (0xff < sVar522),uVar509));
          sVar522 = auVar222._0_2_;
          sVar471 = auVar222._2_2_;
          cVar114 = (0 < sVar471) * (sVar471 < 0x100) * auVar222[2] - (0xff < sVar471);
          auVar511._0_10_ =
               CONCAT19(cVar114,CONCAT18((0 < sVar522) * (sVar522 < 0x100) * auVar222[0] -
                                         (0xff < sVar522),uVar510));
          sVar522 = auVar222._4_2_;
          auVar511[10] = (0 < sVar522) * (sVar522 < 0x100) * auVar222[4] - (0xff < sVar522);
          sVar522 = auVar222._6_2_;
          cVar115 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[6] - (0xff < sVar522);
          auVar511[0xb] = cVar115;
          sVar522 = auVar222._8_2_;
          auVar514[0xc] = (0 < sVar522) * (sVar522 < 0x100) * auVar222[8] - (0xff < sVar522);
          auVar514._0_12_ = auVar511;
          sVar522 = auVar222._10_2_;
          cVar116 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[10] - (0xff < sVar522);
          auVar514[0xd] = cVar116;
          sVar522 = auVar222._12_2_;
          auVar519[0xe] = (0 < sVar522) * (sVar522 < 0x100) * auVar222[0xc] - (0xff < sVar522);
          auVar519._0_14_ = auVar514;
          sVar522 = auVar222._14_2_;
          cVar117 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[0xe] - (0xff < sVar522);
          auVar519[0xf] = cVar117;
          uVar250 = (ushort)bVar2;
          uVar276 = (ushort)((uint)uVar198 >> 0x18);
          uVar278 = (ushort)((uint6)uVar200 >> 0x28);
          uVar280 = (ushort)((ulong)uVar202 >> 0x38);
          uVar282 = (ushort)((unkuint10)auVar334._0_10_ >> 0x48);
          uVar284 = auVar334._10_2_ >> 8;
          uVar286 = auVar340._12_2_ >> 8;
          uVar288 = auVar346._14_2_ >> 8;
          uVar442 = (ushort)bVar54;
          uVar449 = (ushort)((uint)uVar252 >> 0x18);
          uVar451 = (ushort)((uint6)uVar253 >> 0x28);
          uVar452 = (ushort)((ulong)uVar254 >> 0x38);
          uVar454 = (ushort)((unkuint10)auVar426._0_10_ >> 0x48);
          uVar455 = auVar426._10_2_ >> 8;
          uVar457 = auVar429._12_2_ >> 8;
          uVar458 = auVar432._14_2_ >> 8;
          bVar118 = (uVar276 != 0) * (uVar276 < 0x100) * cVar3 - (0xff < uVar276);
          cVar5 = (uVar280 != 0) * (uVar280 < 0x100) * cVar5 - (0xff < uVar280);
          uVar252 = CONCAT13(cVar5,CONCAT12((uVar278 != 0) * (uVar278 < 0x100) * cVar4 -
                                            (0xff < uVar278),
                                            CONCAT11(bVar118,(uVar250 != 0) * (uVar250 < 0x100) *
                                                             bVar2 - (0xff < uVar250))));
          cVar4 = (uVar284 != 0) * (uVar284 < 0x100) * cVar7 - (0xff < uVar284);
          uVar253 = CONCAT15(cVar4,CONCAT14((uVar282 != 0) * (uVar282 < 0x100) * cVar6 -
                                            (0xff < uVar282),uVar252));
          cVar6 = (uVar288 != 0) * (uVar288 < 0x100) * cVar9 - (0xff < uVar288);
          uVar254 = CONCAT17(cVar6,CONCAT16((uVar286 != 0) * (uVar286 < 0x100) * cVar8 -
                                            (0xff < uVar286),uVar253));
          cVar7 = (uVar449 != 0) * (uVar449 < 0x100) * cVar55 - (0xff < uVar449);
          auVar335._0_10_ =
               CONCAT19(cVar7,CONCAT18((uVar442 != 0) * (uVar442 < 0x100) * bVar54 -
                                       (0xff < uVar442),uVar254));
          auVar335[10] = (uVar451 != 0) * (uVar451 < 0x100) * cVar56 - (0xff < uVar451);
          cVar8 = (uVar452 != 0) * (uVar452 < 0x100) * cVar57 - (0xff < uVar452);
          auVar335[0xb] = cVar8;
          auVar341[0xc] = (uVar454 != 0) * (uVar454 < 0x100) * cVar58 - (0xff < uVar454);
          auVar341._0_12_ = auVar335;
          cVar9 = (uVar455 != 0) * (uVar455 < 0x100) * cVar59 - (0xff < uVar455);
          auVar341[0xd] = cVar9;
          auVar347[0xe] = (uVar457 != 0) * (uVar457 < 0x100) * cVar60 - (0xff < uVar457);
          auVar347._0_14_ = auVar341;
          cVar3 = (uVar458 != 0) * (uVar458 < 0x100) * cVar61 - (0xff < uVar458);
          auVar347[0xf] = cVar3;
          uVar250 = (ushort)bVar10;
          uVar276 = (ushort)((uint)uVar291 >> 0x18);
          uVar278 = (ushort)((uint6)uVar292 >> 0x28);
          uVar280 = (ushort)((ulong)uVar293 >> 0x38);
          uVar282 = (ushort)((unkuint10)auVar371._0_10_ >> 0x48);
          uVar284 = auVar371._10_2_ >> 8;
          uVar286 = auVar378._12_2_ >> 8;
          uVar288 = auVar385._14_2_ >> 8;
          uVar442 = (ushort)bVar62;
          uVar449 = (ushort)((uint)uVar368 >> 0x18);
          uVar451 = (ushort)((uint6)uVar369 >> 0x28);
          uVar452 = (ushort)((ulong)uVar370 >> 0x38);
          uVar454 = (ushort)((unkuint10)auVar409._0_10_ >> 0x48);
          uVar455 = auVar409._10_2_ >> 8;
          uVar457 = auVar413._12_2_ >> 8;
          uVar458 = auVar419._14_2_ >> 8;
          bVar2 = (uVar276 != 0) * (uVar276 < 0x100) * cVar11 - (0xff < uVar276);
          cVar11 = (uVar280 != 0) * (uVar280 < 0x100) * cVar13 - (0xff < uVar280);
          uVar291 = CONCAT13(cVar11,CONCAT12((uVar278 != 0) * (uVar278 < 0x100) * cVar12 -
                                             (0xff < uVar278),
                                             CONCAT11(bVar2,(uVar250 != 0) * (uVar250 < 0x100) *
                                                            bVar10 - (0xff < uVar250))));
          cVar12 = (uVar284 != 0) * (uVar284 < 0x100) * cVar15 - (0xff < uVar284);
          uVar292 = CONCAT15(cVar12,CONCAT14((uVar282 != 0) * (uVar282 < 0x100) * cVar14 -
                                             (0xff < uVar282),uVar291));
          cVar13 = (uVar288 != 0) * (uVar288 < 0x100) * cVar17 - (0xff < uVar288);
          uVar293 = CONCAT17(cVar13,CONCAT16((uVar286 != 0) * (uVar286 < 0x100) * cVar16 -
                                             (0xff < uVar286),uVar292));
          cVar17 = (uVar449 != 0) * (uVar449 < 0x100) * cVar63 - (0xff < uVar449);
          auVar372._0_10_ =
               CONCAT19(cVar17,CONCAT18((uVar442 != 0) * (uVar442 < 0x100) * bVar62 -
                                        (0xff < uVar442),uVar293));
          auVar372[10] = (uVar451 != 0) * (uVar451 < 0x100) * cVar64 - (0xff < uVar451);
          cVar14 = (uVar452 != 0) * (uVar452 < 0x100) * cVar65 - (0xff < uVar452);
          auVar372[0xb] = cVar14;
          auVar379[0xc] = (uVar454 != 0) * (uVar454 < 0x100) * cVar66 - (0xff < uVar454);
          auVar379._0_12_ = auVar372;
          cVar15 = (uVar455 != 0) * (uVar455 < 0x100) * cVar67 - (0xff < uVar455);
          auVar379[0xd] = cVar15;
          auVar386[0xe] = (uVar457 != 0) * (uVar457 < 0x100) * cVar68 - (0xff < uVar457);
          auVar386._0_14_ = auVar379;
          cVar16 = (uVar458 != 0) * (uVar458 < 0x100) * cVar69 - (0xff < uVar458);
          auVar386[0xf] = cVar16;
          uVar250 = (ushort)bVar18;
          uVar276 = (ushort)((uint)uVar175 >> 0x18);
          uVar278 = (ushort)((uint6)uVar177 >> 0x28);
          uVar280 = (ushort)((ulong)uVar179 >> 0x38);
          uVar282 = (ushort)((unkuint10)auVar255._0_10_ >> 0x48);
          uVar284 = auVar255._10_2_ >> 8;
          uVar286 = auVar262._12_2_ >> 8;
          uVar288 = auVar269._14_2_ >> 8;
          uVar442 = (ushort)bVar70;
          uVar449 = (ushort)((uint)uVar406 >> 0x18);
          uVar451 = (ushort)((uint6)uVar407 >> 0x28);
          uVar452 = (ushort)((ulong)uVar408 >> 0x38);
          uVar454 = (ushort)((unkuint10)auVar482._0_10_ >> 0x48);
          uVar455 = auVar482._10_2_ >> 8;
          uVar457 = auVar486._12_2_ >> 8;
          uVar458 = auVar491._14_2_ >> 8;
          bVar10 = (uVar276 != 0) * (uVar276 < 0x100) * cVar19 - (0xff < uVar276);
          cVar19 = (uVar280 != 0) * (uVar280 < 0x100) * cVar21 - (0xff < uVar280);
          uVar198 = CONCAT13(cVar19,CONCAT12((uVar278 != 0) * (uVar278 < 0x100) * cVar20 -
                                             (0xff < uVar278),
                                             CONCAT11(bVar10,(uVar250 != 0) * (uVar250 < 0x100) *
                                                             bVar18 - (0xff < uVar250))));
          cVar20 = (uVar284 != 0) * (uVar284 < 0x100) * cVar23 - (0xff < uVar284);
          uVar200 = CONCAT15(cVar20,CONCAT14((uVar282 != 0) * (uVar282 < 0x100) * cVar22 -
                                             (0xff < uVar282),uVar198));
          cVar21 = (uVar288 != 0) * (uVar288 < 0x100) * cVar25 - (0xff < uVar288);
          uVar202 = CONCAT17(cVar21,CONCAT16((uVar286 != 0) * (uVar286 < 0x100) * cVar24 -
                                             (0xff < uVar286),uVar200));
          cVar22 = (uVar449 != 0) * (uVar449 < 0x100) * cVar71 - (0xff < uVar449);
          auVar256._0_10_ =
               CONCAT19(cVar22,CONCAT18((uVar442 != 0) * (uVar442 < 0x100) * bVar70 -
                                        (0xff < uVar442),uVar202));
          auVar256[10] = (uVar451 != 0) * (uVar451 < 0x100) * cVar72 - (0xff < uVar451);
          cVar23 = (uVar452 != 0) * (uVar452 < 0x100) * cVar73 - (0xff < uVar452);
          auVar256[0xb] = cVar23;
          auVar263[0xc] = (uVar454 != 0) * (uVar454 < 0x100) * cVar74 - (0xff < uVar454);
          auVar263._0_12_ = auVar256;
          cVar24 = (uVar455 != 0) * (uVar455 < 0x100) * cVar75 - (0xff < uVar455);
          auVar263[0xd] = cVar24;
          auVar270[0xe] = (uVar457 != 0) * (uVar457 < 0x100) * cVar76 - (0xff < uVar457);
          auVar270._0_14_ = auVar263;
          cVar25 = (uVar458 != 0) * (uVar458 < 0x100) * cVar77 - (0xff < uVar458);
          auVar270[0xf] = cVar25;
          auVar222 = auVar316 & _DAT_0010a580;
          auVar193 = auVar242 & _DAT_0010a580;
          sVar522 = auVar222._0_2_;
          sVar471 = auVar222._2_2_;
          bVar18 = (0 < sVar471) * (sVar471 < 0x100) * auVar222[2] - (0xff < sVar471);
          sVar471 = auVar222._4_2_;
          sVar474 = auVar222._6_2_;
          cVar61 = (0 < sVar474) * (sVar474 < 0x100) * auVar222[6] - (0xff < sVar474);
          uVar175 = CONCAT13(cVar61,CONCAT12((0 < sVar471) * (sVar471 < 0x100) * auVar222[4] -
                                             (0xff < sVar471),
                                             CONCAT11(bVar18,(0 < sVar522) * (sVar522 < 0x100) *
                                                             auVar222[0] - (0xff < sVar522))));
          sVar522 = auVar222._8_2_;
          sVar471 = auVar222._10_2_;
          cVar60 = (0 < sVar471) * (sVar471 < 0x100) * auVar222[10] - (0xff < sVar471);
          uVar177 = CONCAT15(cVar60,CONCAT14((0 < sVar522) * (sVar522 < 0x100) * auVar222[8] -
                                             (0xff < sVar522),uVar175));
          sVar522 = auVar222._12_2_;
          sVar471 = auVar222._14_2_;
          cVar59 = (0 < sVar471) * (sVar471 < 0x100) * auVar222[0xe] - (0xff < sVar471);
          uVar179 = CONCAT17(cVar59,CONCAT16((0 < sVar522) * (sVar522 < 0x100) * auVar222[0xc] -
                                             (0xff < sVar522),uVar177));
          sVar522 = auVar193._0_2_;
          sVar471 = auVar193._2_2_;
          cVar58 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[2] - (0xff < sVar471);
          auVar204._0_10_ =
               CONCAT19(cVar58,CONCAT18((0 < sVar522) * (sVar522 < 0x100) * auVar193[0] -
                                        (0xff < sVar522),uVar179));
          sVar522 = auVar193._4_2_;
          auVar204[10] = (0 < sVar522) * (sVar522 < 0x100) * auVar193[4] - (0xff < sVar522);
          sVar522 = auVar193._6_2_;
          cVar55 = (0 < sVar522) * (sVar522 < 0x100) * auVar193[6] - (0xff < sVar522);
          auVar204[0xb] = cVar55;
          sVar522 = auVar193._8_2_;
          auVar209[0xc] = (0 < sVar522) * (sVar522 < 0x100) * auVar193[8] - (0xff < sVar522);
          auVar209._0_12_ = auVar204;
          sVar522 = auVar193._10_2_;
          cVar57 = (0 < sVar522) * (sVar522 < 0x100) * auVar193[10] - (0xff < sVar522);
          auVar209[0xd] = cVar57;
          sVar522 = auVar193._12_2_;
          auVar226[0xe] = (0 < sVar522) * (sVar522 < 0x100) * auVar193[0xc] - (0xff < sVar522);
          auVar226._0_14_ = auVar209;
          sVar522 = auVar193._14_2_;
          cVar56 = (0 < sVar522) * (sVar522 < 0x100) * auVar193[0xe] - (0xff < sVar522);
          auVar226[0xf] = cVar56;
          auVar222 = auVar519 & _DAT_0010a580;
          auVar193 = auVar347 & _DAT_0010a580;
          sVar522 = auVar222._0_2_;
          sVar471 = auVar222._2_2_;
          bVar54 = (0 < sVar471) * (sVar471 < 0x100) * auVar222[2] - (0xff < sVar471);
          sVar471 = auVar222._4_2_;
          sVar474 = auVar222._6_2_;
          cVar63 = (0 < sVar474) * (sVar474 < 0x100) * auVar222[6] - (0xff < sVar474);
          uVar368 = CONCAT13(cVar63,CONCAT12((0 < sVar471) * (sVar471 < 0x100) * auVar222[4] -
                                             (0xff < sVar471),
                                             CONCAT11(bVar54,(0 < sVar522) * (sVar522 < 0x100) *
                                                             auVar222[0] - (0xff < sVar522))));
          sVar522 = auVar222._8_2_;
          sVar471 = auVar222._10_2_;
          cVar69 = (0 < sVar471) * (sVar471 < 0x100) * auVar222[10] - (0xff < sVar471);
          uVar369 = CONCAT15(cVar69,CONCAT14((0 < sVar522) * (sVar522 < 0x100) * auVar222[8] -
                                             (0xff < sVar522),uVar368));
          sVar522 = auVar222._12_2_;
          sVar471 = auVar222._14_2_;
          cVar68 = (0 < sVar471) * (sVar471 < 0x100) * auVar222[0xe] - (0xff < sVar471);
          uVar370 = CONCAT17(cVar68,CONCAT16((0 < sVar522) * (sVar522 < 0x100) * auVar222[0xc] -
                                             (0xff < sVar522),uVar369));
          sVar522 = auVar193._0_2_;
          sVar471 = auVar193._2_2_;
          cVar67 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[2] - (0xff < sVar471);
          auVar410._0_10_ =
               CONCAT19(cVar67,CONCAT18((0 < sVar522) * (sVar522 < 0x100) * auVar193[0] -
                                        (0xff < sVar522),uVar370));
          sVar522 = auVar193._4_2_;
          auVar410[10] = (0 < sVar522) * (sVar522 < 0x100) * auVar193[4] - (0xff < sVar522);
          sVar522 = auVar193._6_2_;
          cVar65 = (0 < sVar522) * (sVar522 < 0x100) * auVar193[6] - (0xff < sVar522);
          auVar410[0xb] = cVar65;
          sVar522 = auVar193._8_2_;
          auVar414[0xc] = (0 < sVar522) * (sVar522 < 0x100) * auVar193[8] - (0xff < sVar522);
          auVar414._0_12_ = auVar410;
          sVar522 = auVar193._10_2_;
          cVar64 = (0 < sVar522) * (sVar522 < 0x100) * auVar193[10] - (0xff < sVar522);
          auVar414[0xd] = cVar64;
          sVar522 = auVar193._12_2_;
          auVar420[0xe] = (0 < sVar522) * (sVar522 < 0x100) * auVar193[0xc] - (0xff < sVar522);
          auVar420._0_14_ = auVar414;
          sVar522 = auVar193._14_2_;
          cVar66 = (0 < sVar522) * (sVar522 < 0x100) * auVar193[0xe] - (0xff < sVar522);
          auVar420[0xf] = cVar66;
          auVar193 = auVar386 & _DAT_0010a580;
          auVar222 = auVar270 & _DAT_0010a580;
          sVar522 = auVar193._0_2_;
          sVar471 = auVar193._2_2_;
          bVar62 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[2] - (0xff < sVar471);
          sVar471 = auVar193._4_2_;
          sVar474 = auVar193._6_2_;
          cVar77 = (0 < sVar474) * (sVar474 < 0x100) * auVar193[6] - (0xff < sVar474);
          uVar423 = CONCAT13(cVar77,CONCAT12((0 < sVar471) * (sVar471 < 0x100) * auVar193[4] -
                                             (0xff < sVar471),
                                             CONCAT11(bVar62,(0 < sVar522) * (sVar522 < 0x100) *
                                                             auVar193[0] - (0xff < sVar522))));
          sVar522 = auVar193._8_2_;
          sVar471 = auVar193._10_2_;
          cVar76 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[10] - (0xff < sVar471);
          uVar424 = CONCAT15(cVar76,CONCAT14((0 < sVar522) * (sVar522 < 0x100) * auVar193[8] -
                                             (0xff < sVar522),uVar423));
          sVar522 = auVar193._12_2_;
          sVar471 = auVar193._14_2_;
          cVar71 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[0xe] - (0xff < sVar471);
          uVar425 = CONCAT17(cVar71,CONCAT16((0 < sVar522) * (sVar522 < 0x100) * auVar193[0xc] -
                                             (0xff < sVar522),uVar424));
          sVar522 = auVar222._0_2_;
          sVar471 = auVar222._2_2_;
          cVar75 = (0 < sVar471) * (sVar471 < 0x100) * auVar222[2] - (0xff < sVar471);
          auVar483._0_10_ =
               CONCAT19(cVar75,CONCAT18((0 < sVar522) * (sVar522 < 0x100) * auVar222[0] -
                                        (0xff < sVar522),uVar425));
          sVar522 = auVar222._4_2_;
          auVar483[10] = (0 < sVar522) * (sVar522 < 0x100) * auVar222[4] - (0xff < sVar522);
          sVar522 = auVar222._6_2_;
          cVar74 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[6] - (0xff < sVar522);
          auVar483[0xb] = cVar74;
          sVar522 = auVar222._8_2_;
          auVar487[0xc] = (0 < sVar522) * (sVar522 < 0x100) * auVar222[8] - (0xff < sVar522);
          auVar487._0_12_ = auVar483;
          sVar522 = auVar222._10_2_;
          cVar73 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[10] - (0xff < sVar522);
          auVar487[0xd] = cVar73;
          sVar522 = auVar222._12_2_;
          auVar492[0xe] = (0 < sVar522) * (sVar522 < 0x100) * auVar222[0xc] - (0xff < sVar522);
          auVar492._0_14_ = auVar487;
          sVar522 = auVar222._14_2_;
          cVar72 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[0xe] - (0xff < sVar522);
          auVar492[0xf] = cVar72;
          uVar442 = (ushort)bVar94;
          uVar449 = (ushort)((uint)uVar231 >> 0x18);
          uVar451 = (ushort)((uint6)uVar232 >> 0x28);
          uVar452 = (ushort)((ulong)uVar233 >> 0x38);
          uVar454 = (ushort)((unkuint10)auVar294._0_10_ >> 0x48);
          uVar455 = auVar294._10_2_ >> 8;
          uVar457 = auVar299._12_2_ >> 8;
          uVar458 = auVar316._14_2_ >> 8;
          uVar250 = (ushort)bVar102;
          uVar276 = (ushort)((uint)uVar199 >> 0x18);
          uVar278 = (ushort)((uint6)uVar201 >> 0x28);
          uVar280 = (ushort)((ulong)uVar203 >> 0x38);
          uVar282 = (ushort)((unkuint10)auVar234._0_10_ >> 0x48);
          uVar284 = auVar234._10_2_ >> 8;
          uVar286 = auVar238._12_2_ >> 8;
          uVar288 = auVar242._14_2_ >> 8;
          bVar70 = (uVar449 != 0) * (uVar449 < 0x100) * cVar95 - (0xff < uVar449);
          cVar95 = (uVar452 != 0) * (uVar452 < 0x100) * cVar97 - (0xff < uVar452);
          uVar199 = CONCAT13(cVar95,CONCAT12((uVar451 != 0) * (uVar451 < 0x100) * cVar96 -
                                             (0xff < uVar451),
                                             CONCAT11(bVar70,(uVar442 != 0) * (uVar442 < 0x100) *
                                                             bVar94 - (0xff < uVar442))));
          cVar96 = (uVar455 != 0) * (uVar455 < 0x100) * cVar99 - (0xff < uVar455);
          uVar201 = CONCAT15(cVar96,CONCAT14((uVar454 != 0) * (uVar454 < 0x100) * cVar98 -
                                             (0xff < uVar454),uVar199));
          cVar97 = (uVar458 != 0) * (uVar458 < 0x100) * cVar101 - (0xff < uVar458);
          uVar203 = CONCAT17(cVar97,CONCAT16((uVar457 != 0) * (uVar457 < 0x100) * cVar100 -
                                             (0xff < uVar457),uVar201));
          cVar98 = (uVar276 != 0) * (uVar276 < 0x100) * cVar103 - (0xff < uVar276);
          auVar295._0_10_ =
               CONCAT19(cVar98,CONCAT18((uVar250 != 0) * (uVar250 < 0x100) * bVar102 -
                                        (0xff < uVar250),uVar203));
          auVar295[10] = (uVar278 != 0) * (uVar278 < 0x100) * cVar104 - (0xff < uVar278);
          cVar99 = (uVar280 != 0) * (uVar280 < 0x100) * cVar105 - (0xff < uVar280);
          auVar295[0xb] = cVar99;
          auVar300[0xc] = (uVar282 != 0) * (uVar282 < 0x100) * cVar106 - (0xff < uVar282);
          auVar300._0_12_ = auVar295;
          cVar100 = (uVar284 != 0) * (uVar284 < 0x100) * cVar107 - (0xff < uVar284);
          auVar300[0xd] = cVar100;
          auVar317[0xe] = (uVar286 != 0) * (uVar286 < 0x100) * cVar108 - (0xff < uVar286);
          auVar317._0_14_ = auVar300;
          cVar101 = (uVar288 != 0) * (uVar288 < 0x100) * cVar109 - (0xff < uVar288);
          auVar317[0xf] = cVar101;
          uVar442 = (ushort)bVar110;
          uVar449 = (ushort)((uint)uVar508 >> 0x18);
          uVar451 = (ushort)((uint6)uVar509 >> 0x28);
          uVar452 = (ushort)((ulong)uVar510 >> 0x38);
          uVar454 = (ushort)((unkuint10)auVar511._0_10_ >> 0x48);
          uVar455 = auVar511._10_2_ >> 8;
          uVar457 = auVar514._12_2_ >> 8;
          uVar458 = auVar519._14_2_ >> 8;
          uVar250 = (ushort)bVar118;
          uVar276 = (ushort)((uint)uVar252 >> 0x18);
          uVar278 = (ushort)((uint6)uVar253 >> 0x28);
          uVar280 = (ushort)((ulong)uVar254 >> 0x38);
          uVar282 = (ushort)((unkuint10)auVar335._0_10_ >> 0x48);
          uVar284 = auVar335._10_2_ >> 8;
          uVar286 = auVar341._12_2_ >> 8;
          uVar288 = auVar347._14_2_ >> 8;
          bVar94 = (uVar449 != 0) * (uVar449 < 0x100) * cVar111 - (0xff < uVar449);
          cVar103 = (uVar452 != 0) * (uVar452 < 0x100) * cVar113 - (0xff < uVar452);
          uVar508 = CONCAT13(cVar103,CONCAT12((uVar451 != 0) * (uVar451 < 0x100) * cVar112 -
                                              (0xff < uVar451),
                                              CONCAT11(bVar94,(uVar442 != 0) * (uVar442 < 0x100) *
                                                              bVar110 - (0xff < uVar442))));
          cVar108 = (uVar455 != 0) * (uVar455 < 0x100) * cVar115 - (0xff < uVar455);
          uVar509 = CONCAT15(cVar108,CONCAT14((uVar454 != 0) * (uVar454 < 0x100) * cVar114 -
                                              (0xff < uVar454),uVar508));
          cVar109 = (uVar458 != 0) * (uVar458 < 0x100) * cVar117 - (0xff < uVar458);
          uVar510 = CONCAT17(cVar109,CONCAT16((uVar457 != 0) * (uVar457 < 0x100) * cVar116 -
                                              (0xff < uVar457),uVar509));
          cVar107 = (uVar276 != 0) * (uVar276 < 0x100) * cVar5 - (0xff < uVar276);
          auVar512._0_10_ =
               CONCAT19(cVar107,CONCAT18((uVar250 != 0) * (uVar250 < 0x100) * bVar118 -
                                         (0xff < uVar250),uVar510));
          auVar512[10] = (uVar278 != 0) * (uVar278 < 0x100) * cVar4 - (0xff < uVar278);
          cVar4 = (uVar280 != 0) * (uVar280 < 0x100) * cVar6 - (0xff < uVar280);
          auVar512[0xb] = cVar4;
          auVar515[0xc] = (uVar282 != 0) * (uVar282 < 0x100) * cVar7 - (0xff < uVar282);
          auVar515._0_12_ = auVar512;
          cVar5 = (uVar284 != 0) * (uVar284 < 0x100) * cVar8 - (0xff < uVar284);
          auVar515[0xd] = cVar5;
          auVar520[0xe] = (uVar286 != 0) * (uVar286 < 0x100) * cVar9 - (0xff < uVar286);
          auVar520._0_14_ = auVar515;
          cVar6 = (uVar288 != 0) * (uVar288 < 0x100) * cVar3 - (0xff < uVar288);
          auVar520[0xf] = cVar6;
          uVar442 = (ushort)bVar2;
          uVar449 = (ushort)((uint)uVar291 >> 0x18);
          uVar451 = (ushort)((uint6)uVar292 >> 0x28);
          uVar452 = (ushort)((ulong)uVar293 >> 0x38);
          uVar454 = (ushort)((unkuint10)auVar372._0_10_ >> 0x48);
          uVar455 = auVar372._10_2_ >> 8;
          uVar457 = auVar379._12_2_ >> 8;
          uVar458 = auVar386._14_2_ >> 8;
          uVar250 = (ushort)bVar10;
          uVar276 = (ushort)((uint)uVar198 >> 0x18);
          uVar278 = (ushort)((uint6)uVar200 >> 0x28);
          uVar280 = (ushort)((ulong)uVar202 >> 0x38);
          uVar282 = (ushort)((unkuint10)auVar256._0_10_ >> 0x48);
          uVar284 = auVar256._10_2_ >> 8;
          uVar286 = auVar263._12_2_ >> 8;
          uVar288 = auVar270._14_2_ >> 8;
          bVar102 = (uVar449 != 0) * (uVar449 < 0x100) * cVar11 - (0xff < uVar449);
          cVar7 = (uVar452 != 0) * (uVar452 < 0x100) * cVar13 - (0xff < uVar452);
          uVar231 = CONCAT13(cVar7,CONCAT12((uVar451 != 0) * (uVar451 < 0x100) * cVar12 -
                                            (0xff < uVar451),
                                            CONCAT11(bVar102,(uVar442 != 0) * (uVar442 < 0x100) *
                                                             bVar2 - (0xff < uVar442))));
          cVar8 = (uVar455 != 0) * (uVar455 < 0x100) * cVar14 - (0xff < uVar455);
          uVar232 = CONCAT15(cVar8,CONCAT14((uVar454 != 0) * (uVar454 < 0x100) * cVar17 -
                                            (0xff < uVar454),uVar231));
          cVar9 = (uVar458 != 0) * (uVar458 < 0x100) * cVar16 - (0xff < uVar458);
          uVar233 = CONCAT17(cVar9,CONCAT16((uVar457 != 0) * (uVar457 < 0x100) * cVar15 -
                                            (0xff < uVar457),uVar232));
          cVar3 = (uVar276 != 0) * (uVar276 < 0x100) * cVar19 - (0xff < uVar276);
          auVar373._0_10_ =
               CONCAT19(cVar3,CONCAT18((uVar250 != 0) * (uVar250 < 0x100) * bVar10 -
                                       (0xff < uVar250),uVar233));
          auVar373[10] = (uVar278 != 0) * (uVar278 < 0x100) * cVar20 - (0xff < uVar278);
          cVar17 = (uVar280 != 0) * (uVar280 < 0x100) * cVar21 - (0xff < uVar280);
          auVar373[0xb] = cVar17;
          auVar380[0xc] = (uVar282 != 0) * (uVar282 < 0x100) * cVar22 - (0xff < uVar282);
          auVar380._0_12_ = auVar373;
          cVar16 = (uVar284 != 0) * (uVar284 < 0x100) * cVar23 - (0xff < uVar284);
          auVar380[0xd] = cVar16;
          auVar387[0xe] = (uVar286 != 0) * (uVar286 < 0x100) * cVar24 - (0xff < uVar286);
          auVar387._0_14_ = auVar380;
          cVar15 = (uVar288 != 0) * (uVar288 < 0x100) * cVar25 - (0xff < uVar288);
          auVar387[0xf] = cVar15;
          auVar193 = auVar226 & _DAT_0010a580;
          auVar222 = auVar420 & _DAT_0010a580;
          sVar522 = auVar193._0_2_;
          sVar471 = auVar193._2_2_;
          bVar2 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[2] - (0xff < sVar471);
          sVar471 = auVar193._4_2_;
          sVar474 = auVar193._6_2_;
          cVar21 = (0 < sVar474) * (sVar474 < 0x100) * auVar193[6] - (0xff < sVar474);
          uVar198 = CONCAT13(cVar21,CONCAT12((0 < sVar471) * (sVar471 < 0x100) * auVar193[4] -
                                             (0xff < sVar471),
                                             CONCAT11(bVar2,(0 < sVar522) * (sVar522 < 0x100) *
                                                            auVar193[0] - (0xff < sVar522))));
          sVar522 = auVar193._8_2_;
          sVar471 = auVar193._10_2_;
          cVar20 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[10] - (0xff < sVar471);
          uVar200 = CONCAT15(cVar20,CONCAT14((0 < sVar522) * (sVar522 < 0x100) * auVar193[8] -
                                             (0xff < sVar522),uVar198));
          sVar522 = auVar193._12_2_;
          sVar471 = auVar193._14_2_;
          cVar19 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[0xe] - (0xff < sVar471);
          uVar202 = CONCAT17(cVar19,CONCAT16((0 < sVar522) * (sVar522 < 0x100) * auVar193[0xc] -
                                             (0xff < sVar522),uVar200));
          sVar522 = auVar222._0_2_;
          sVar471 = auVar222._2_2_;
          cVar11 = (0 < sVar471) * (sVar471 < 0x100) * auVar222[2] - (0xff < sVar471);
          auVar257._0_10_ =
               CONCAT19(cVar11,CONCAT18((0 < sVar522) * (sVar522 < 0x100) * auVar222[0] -
                                        (0xff < sVar522),uVar202));
          sVar522 = auVar222._4_2_;
          auVar257[10] = (0 < sVar522) * (sVar522 < 0x100) * auVar222[4] - (0xff < sVar522);
          sVar522 = auVar222._6_2_;
          cVar14 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[6] - (0xff < sVar522);
          auVar257[0xb] = cVar14;
          sVar522 = auVar222._8_2_;
          auVar264[0xc] = (0 < sVar522) * (sVar522 < 0x100) * auVar222[8] - (0xff < sVar522);
          auVar264._0_12_ = auVar257;
          sVar522 = auVar222._10_2_;
          cVar12 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[10] - (0xff < sVar522);
          auVar264[0xd] = cVar12;
          sVar522 = auVar222._12_2_;
          auVar271[0xe] = (0 < sVar522) * (sVar522 < 0x100) * auVar222[0xc] - (0xff < sVar522);
          auVar271._0_14_ = auVar264;
          sVar522 = auVar222._14_2_;
          cVar13 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[0xe] - (0xff < sVar522);
          auVar271[0xf] = cVar13;
          auVar193 = auVar492 & _DAT_0010a580;
          auVar222 = auVar317 & _DAT_0010a580;
          sVar522 = auVar193._0_2_;
          sVar471 = auVar193._2_2_;
          bVar10 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[2] - (0xff < sVar471);
          sVar471 = auVar193._4_2_;
          sVar474 = auVar193._6_2_;
          cVar22 = (0 < sVar474) * (sVar474 < 0x100) * auVar193[6] - (0xff < sVar474);
          uVar406 = CONCAT13(cVar22,CONCAT12((0 < sVar471) * (sVar471 < 0x100) * auVar193[4] -
                                             (0xff < sVar471),
                                             CONCAT11(bVar10,(0 < sVar522) * (sVar522 < 0x100) *
                                                             auVar193[0] - (0xff < sVar522))));
          sVar522 = auVar193._8_2_;
          sVar471 = auVar193._10_2_;
          cVar23 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[10] - (0xff < sVar471);
          uVar407 = CONCAT15(cVar23,CONCAT14((0 < sVar522) * (sVar522 < 0x100) * auVar193[8] -
                                             (0xff < sVar522),uVar406));
          sVar522 = auVar193._12_2_;
          sVar471 = auVar193._14_2_;
          cVar24 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[0xe] - (0xff < sVar471);
          uVar408 = CONCAT17(cVar24,CONCAT16((0 < sVar522) * (sVar522 < 0x100) * auVar193[0xc] -
                                             (0xff < sVar522),uVar407));
          sVar522 = auVar222._0_2_;
          sVar471 = auVar222._2_2_;
          cVar25 = (0 < sVar471) * (sVar471 < 0x100) * auVar222[2] - (0xff < sVar471);
          auVar427._0_10_ =
               CONCAT19(cVar25,CONCAT18((0 < sVar522) * (sVar522 < 0x100) * auVar222[0] -
                                        (0xff < sVar522),uVar408));
          sVar522 = auVar222._4_2_;
          auVar427[10] = (0 < sVar522) * (sVar522 < 0x100) * auVar222[4] - (0xff < sVar522);
          sVar522 = auVar222._6_2_;
          cVar106 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[6] - (0xff < sVar522);
          auVar427[0xb] = cVar106;
          sVar522 = auVar222._8_2_;
          auVar430[0xc] = (0 < sVar522) * (sVar522 < 0x100) * auVar222[8] - (0xff < sVar522);
          auVar430._0_12_ = auVar427;
          sVar522 = auVar222._10_2_;
          cVar105 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[10] - (0xff < sVar522);
          auVar430[0xd] = cVar105;
          sVar522 = auVar222._12_2_;
          auVar433[0xe] = (0 < sVar522) * (sVar522 < 0x100) * auVar222[0xc] - (0xff < sVar522);
          auVar433._0_14_ = auVar430;
          sVar522 = auVar222._14_2_;
          cVar104 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[0xe] - (0xff < sVar522);
          auVar433[0xf] = cVar104;
          auVar193 = auVar520 & _DAT_0010a580;
          auVar222 = auVar387 & _DAT_0010a580;
          sVar522 = auVar193._0_2_;
          sVar471 = auVar193._2_2_;
          bVar110 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[2] - (0xff < sVar471);
          sVar471 = auVar193._4_2_;
          sVar474 = auVar193._6_2_;
          cVar114 = (0 < sVar474) * (sVar474 < 0x100) * auVar193[6] - (0xff < sVar474);
          uVar252 = CONCAT13(cVar114,CONCAT12((0 < sVar471) * (sVar471 < 0x100) * auVar193[4] -
                                              (0xff < sVar471),
                                              CONCAT11(bVar110,(0 < sVar522) * (sVar522 < 0x100) *
                                                               auVar193[0] - (0xff < sVar522))));
          sVar522 = auVar193._8_2_;
          sVar471 = auVar193._10_2_;
          cVar112 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[10] - (0xff < sVar471);
          uVar253 = CONCAT15(cVar112,CONCAT14((0 < sVar522) * (sVar522 < 0x100) * auVar193[8] -
                                              (0xff < sVar522),uVar252));
          sVar522 = auVar193._12_2_;
          sVar471 = auVar193._14_2_;
          cVar113 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[0xe] - (0xff < sVar471);
          uVar254 = CONCAT17(cVar113,CONCAT16((0 < sVar522) * (sVar522 < 0x100) * auVar193[0xc] -
                                              (0xff < sVar522),uVar253));
          sVar522 = auVar222._0_2_;
          sVar471 = auVar222._2_2_;
          cVar111 = (0 < sVar471) * (sVar471 < 0x100) * auVar222[2] - (0xff < sVar471);
          auVar336._0_10_ =
               CONCAT19(cVar111,CONCAT18((0 < sVar522) * (sVar522 < 0x100) * auVar222[0] -
                                         (0xff < sVar522),uVar254));
          sVar522 = auVar222._4_2_;
          auVar336[10] = (0 < sVar522) * (sVar522 < 0x100) * auVar222[4] - (0xff < sVar522);
          sVar522 = auVar222._6_2_;
          cVar115 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[6] - (0xff < sVar522);
          auVar336[0xb] = cVar115;
          sVar522 = auVar222._8_2_;
          auVar342[0xc] = (0 < sVar522) * (sVar522 < 0x100) * auVar222[8] - (0xff < sVar522);
          auVar342._0_12_ = auVar336;
          sVar522 = auVar222._10_2_;
          cVar116 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[10] - (0xff < sVar522);
          auVar342[0xd] = cVar116;
          sVar522 = auVar222._12_2_;
          auVar348[0xe] = (0 < sVar522) * (sVar522 < 0x100) * auVar222[0xc] - (0xff < sVar522);
          auVar348._0_14_ = auVar342;
          sVar522 = auVar222._14_2_;
          cVar117 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[0xe] - (0xff < sVar522);
          auVar348[0xf] = cVar117;
          uVar250 = (ushort)bVar18;
          uVar276 = (ushort)((uint)uVar175 >> 0x18);
          uVar278 = (ushort)((uint6)uVar177 >> 0x28);
          uVar280 = (ushort)((ulong)uVar179 >> 0x38);
          uVar282 = (ushort)((unkuint10)auVar204._0_10_ >> 0x48);
          uVar284 = auVar204._10_2_ >> 8;
          uVar286 = auVar209._12_2_ >> 8;
          uVar288 = auVar226._14_2_ >> 8;
          uVar442 = (ushort)bVar54;
          uVar449 = (ushort)((uint)uVar368 >> 0x18);
          uVar451 = (ushort)((uint6)uVar369 >> 0x28);
          uVar452 = (ushort)((ulong)uVar370 >> 0x38);
          uVar454 = (ushort)((unkuint10)auVar410._0_10_ >> 0x48);
          uVar455 = auVar410._10_2_ >> 8;
          uVar457 = auVar414._12_2_ >> 8;
          uVar458 = auVar420._14_2_ >> 8;
          bVar118 = (uVar276 != 0) * (uVar276 < 0x100) * cVar61 - (0xff < uVar276);
          cVar59 = (uVar280 != 0) * (uVar280 < 0x100) * cVar59 - (0xff < uVar280);
          uVar175 = CONCAT13(cVar59,CONCAT12((uVar278 != 0) * (uVar278 < 0x100) * cVar60 -
                                             (0xff < uVar278),
                                             CONCAT11(bVar118,(uVar250 != 0) * (uVar250 < 0x100) *
                                                              bVar18 - (0xff < uVar250))));
          cVar55 = (uVar284 != 0) * (uVar284 < 0x100) * cVar55 - (0xff < uVar284);
          uVar177 = CONCAT15(cVar55,CONCAT14((uVar282 != 0) * (uVar282 < 0x100) * cVar58 -
                                             (0xff < uVar282),uVar175));
          cVar56 = (uVar288 != 0) * (uVar288 < 0x100) * cVar56 - (0xff < uVar288);
          uVar179 = CONCAT17(cVar56,CONCAT16((uVar286 != 0) * (uVar286 < 0x100) * cVar57 -
                                             (0xff < uVar286),uVar177));
          cVar57 = (uVar449 != 0) * (uVar449 < 0x100) * cVar63 - (0xff < uVar449);
          auVar205._0_10_ =
               CONCAT19(cVar57,CONCAT18((uVar442 != 0) * (uVar442 < 0x100) * bVar54 -
                                        (0xff < uVar442),uVar179));
          auVar205[10] = (uVar451 != 0) * (uVar451 < 0x100) * cVar69 - (0xff < uVar451);
          cVar58 = (uVar452 != 0) * (uVar452 < 0x100) * cVar68 - (0xff < uVar452);
          auVar205[0xb] = cVar58;
          auVar210[0xc] = (uVar454 != 0) * (uVar454 < 0x100) * cVar67 - (0xff < uVar454);
          auVar210._0_12_ = auVar205;
          cVar60 = (uVar455 != 0) * (uVar455 < 0x100) * cVar65 - (0xff < uVar455);
          auVar210[0xd] = cVar60;
          auVar227[0xe] = (uVar457 != 0) * (uVar457 < 0x100) * cVar64 - (0xff < uVar457);
          auVar227._0_14_ = auVar210;
          cVar61 = (uVar458 != 0) * (uVar458 < 0x100) * cVar66 - (0xff < uVar458);
          auVar227[0xf] = cVar61;
          uVar442 = (ushort)bVar62;
          uVar449 = (ushort)((uint)uVar423 >> 0x18);
          uVar451 = (ushort)((uint6)uVar424 >> 0x28);
          uVar452 = (ushort)((ulong)uVar425 >> 0x38);
          uVar454 = (ushort)((unkuint10)auVar483._0_10_ >> 0x48);
          uVar455 = auVar483._10_2_ >> 8;
          uVar457 = auVar487._12_2_ >> 8;
          uVar458 = auVar492._14_2_ >> 8;
          uVar250 = (ushort)bVar70;
          uVar276 = (ushort)((uint)uVar199 >> 0x18);
          uVar278 = (ushort)((uint6)uVar201 >> 0x28);
          uVar280 = (ushort)((ulong)uVar203 >> 0x38);
          uVar282 = (ushort)((unkuint10)auVar295._0_10_ >> 0x48);
          uVar284 = auVar295._10_2_ >> 8;
          uVar286 = auVar300._12_2_ >> 8;
          uVar288 = auVar317._14_2_ >> 8;
          bVar18 = (uVar449 != 0) * (uVar449 < 0x100) * cVar77 - (0xff < uVar449);
          cVar63 = (uVar452 != 0) * (uVar452 < 0x100) * cVar71 - (0xff < uVar452);
          uVar368 = CONCAT13(cVar63,CONCAT12((uVar451 != 0) * (uVar451 < 0x100) * cVar76 -
                                             (0xff < uVar451),
                                             CONCAT11(bVar18,(uVar442 != 0) * (uVar442 < 0x100) *
                                                             bVar62 - (0xff < uVar442))));
          cVar66 = (uVar455 != 0) * (uVar455 < 0x100) * cVar74 - (0xff < uVar455);
          uVar369 = CONCAT15(cVar66,CONCAT14((uVar454 != 0) * (uVar454 < 0x100) * cVar75 -
                                             (0xff < uVar454),uVar368));
          cVar64 = (uVar458 != 0) * (uVar458 < 0x100) * cVar72 - (0xff < uVar458);
          uVar370 = CONCAT17(cVar64,CONCAT16((uVar457 != 0) * (uVar457 < 0x100) * cVar73 -
                                             (0xff < uVar457),uVar369));
          cVar65 = (uVar276 != 0) * (uVar276 < 0x100) * cVar95 - (0xff < uVar276);
          auVar484._0_10_ =
               CONCAT19(cVar65,CONCAT18((uVar250 != 0) * (uVar250 < 0x100) * bVar70 -
                                        (0xff < uVar250),uVar370));
          auVar484[10] = (uVar278 != 0) * (uVar278 < 0x100) * cVar96 - (0xff < uVar278);
          cVar67 = (uVar280 != 0) * (uVar280 < 0x100) * cVar97 - (0xff < uVar280);
          auVar484[0xb] = cVar67;
          auVar488[0xc] = (uVar282 != 0) * (uVar282 < 0x100) * cVar98 - (0xff < uVar282);
          auVar488._0_12_ = auVar484;
          cVar68 = (uVar284 != 0) * (uVar284 < 0x100) * cVar99 - (0xff < uVar284);
          auVar488[0xd] = cVar68;
          auVar493[0xe] = (uVar286 != 0) * (uVar286 < 0x100) * cVar100 - (0xff < uVar286);
          auVar493._0_14_ = auVar488;
          cVar69 = (uVar288 != 0) * (uVar288 < 0x100) * cVar101 - (0xff < uVar288);
          auVar493[0xf] = cVar69;
          uVar442 = (ushort)bVar94;
          uVar449 = (ushort)((uint)uVar508 >> 0x18);
          uVar451 = (ushort)((uint6)uVar509 >> 0x28);
          uVar452 = (ushort)((ulong)uVar510 >> 0x38);
          uVar454 = (ushort)((unkuint10)auVar512._0_10_ >> 0x48);
          uVar455 = auVar512._10_2_ >> 8;
          uVar457 = auVar515._12_2_ >> 8;
          uVar458 = auVar520._14_2_ >> 8;
          uVar250 = (ushort)bVar102;
          uVar276 = (ushort)((uint)uVar231 >> 0x18);
          uVar278 = (ushort)((uint6)uVar232 >> 0x28);
          uVar280 = (ushort)((ulong)uVar233 >> 0x38);
          uVar282 = (ushort)((unkuint10)auVar373._0_10_ >> 0x48);
          uVar284 = auVar373._10_2_ >> 8;
          uVar286 = auVar380._12_2_ >> 8;
          uVar288 = auVar387._14_2_ >> 8;
          bVar54 = (uVar449 != 0) * (uVar449 < 0x100) * cVar103 - (0xff < uVar449);
          cVar73 = (uVar452 != 0) * (uVar452 < 0x100) * cVar109 - (0xff < uVar452);
          uVar423 = CONCAT13(cVar73,CONCAT12((uVar451 != 0) * (uVar451 < 0x100) * cVar108 -
                                             (0xff < uVar451),
                                             CONCAT11(bVar54,(uVar442 != 0) * (uVar442 < 0x100) *
                                                             bVar94 - (0xff < uVar442))));
          cVar72 = (uVar455 != 0) * (uVar455 < 0x100) * cVar4 - (0xff < uVar455);
          uVar424 = CONCAT15(cVar72,CONCAT14((uVar454 != 0) * (uVar454 < 0x100) * cVar107 -
                                             (0xff < uVar454),uVar423));
          cVar71 = (uVar458 != 0) * (uVar458 < 0x100) * cVar6 - (0xff < uVar458);
          uVar425 = CONCAT17(cVar71,CONCAT16((uVar457 != 0) * (uVar457 < 0x100) * cVar5 -
                                             (0xff < uVar457),uVar424));
          cVar7 = (uVar276 != 0) * (uVar276 < 0x100) * cVar7 - (0xff < uVar276);
          auVar513._0_10_ =
               CONCAT19(cVar7,CONCAT18((uVar250 != 0) * (uVar250 < 0x100) * bVar102 -
                                       (0xff < uVar250),uVar425));
          auVar513[10] = (uVar278 != 0) * (uVar278 < 0x100) * cVar8 - (0xff < uVar278);
          cVar6 = (uVar280 != 0) * (uVar280 < 0x100) * cVar9 - (0xff < uVar280);
          auVar513[0xb] = cVar6;
          auVar516[0xc] = (uVar282 != 0) * (uVar282 < 0x100) * cVar3 - (0xff < uVar282);
          auVar516._0_12_ = auVar513;
          cVar5 = (uVar284 != 0) * (uVar284 < 0x100) * cVar17 - (0xff < uVar284);
          auVar516[0xd] = cVar5;
          auVar521[0xe] = (uVar286 != 0) * (uVar286 < 0x100) * cVar16 - (0xff < uVar286);
          auVar521._0_14_ = auVar516;
          cVar4 = (uVar288 != 0) * (uVar288 < 0x100) * cVar15 - (0xff < uVar288);
          auVar521[0xf] = cVar4;
          auVar193 = auVar271 & _DAT_0010a580;
          auVar222 = auVar433 & _DAT_0010a580;
          sVar522 = auVar193._0_2_;
          sVar471 = auVar193._2_2_;
          bVar62 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[2] - (0xff < sVar471);
          sVar471 = auVar193._4_2_;
          sVar474 = auVar193._6_2_;
          cVar74 = (0 < sVar474) * (sVar474 < 0x100) * auVar193[6] - (0xff < sVar474);
          uVar231 = CONCAT13(cVar74,CONCAT12((0 < sVar471) * (sVar471 < 0x100) * auVar193[4] -
                                             (0xff < sVar471),
                                             CONCAT11(bVar62,(0 < sVar522) * (sVar522 < 0x100) *
                                                             auVar193[0] - (0xff < sVar522))));
          sVar522 = auVar193._8_2_;
          sVar471 = auVar193._10_2_;
          cVar15 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[10] - (0xff < sVar471);
          uVar232 = CONCAT15(cVar15,CONCAT14((0 < sVar522) * (sVar522 < 0x100) * auVar193[8] -
                                             (0xff < sVar522),uVar231));
          sVar522 = auVar193._12_2_;
          sVar471 = auVar193._14_2_;
          cVar16 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[0xe] - (0xff < sVar471);
          uVar233 = CONCAT17(cVar16,CONCAT16((0 < sVar522) * (sVar522 < 0x100) * auVar193[0xc] -
                                             (0xff < sVar522),uVar232));
          sVar522 = auVar222._0_2_;
          sVar471 = auVar222._2_2_;
          cVar17 = (0 < sVar471) * (sVar471 < 0x100) * auVar222[2] - (0xff < sVar471);
          auVar296._0_10_ =
               CONCAT19(cVar17,CONCAT18((0 < sVar522) * (sVar522 < 0x100) * auVar222[0] -
                                        (0xff < sVar522),uVar233));
          sVar522 = auVar222._4_2_;
          auVar296[10] = (0 < sVar522) * (sVar522 < 0x100) * auVar222[4] - (0xff < sVar522);
          sVar522 = auVar222._6_2_;
          cVar3 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[6] - (0xff < sVar522);
          auVar296[0xb] = cVar3;
          sVar522 = auVar222._8_2_;
          auVar301[0xc] = (0 < sVar522) * (sVar522 < 0x100) * auVar222[8] - (0xff < sVar522);
          auVar301._0_12_ = auVar296;
          sVar522 = auVar222._10_2_;
          cVar9 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[10] - (0xff < sVar522);
          auVar301[0xd] = cVar9;
          sVar522 = auVar222._12_2_;
          auVar318[0xe] = (0 < sVar522) * (sVar522 < 0x100) * auVar222[0xc] - (0xff < sVar522);
          auVar318._0_14_ = auVar301;
          sVar522 = auVar222._14_2_;
          cVar8 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[0xe] - (0xff < sVar522);
          auVar318[0xf] = cVar8;
          auVar193 = auVar348 & _DAT_0010a580;
          auVar222 = auVar227 & _DAT_0010a580;
          sVar522 = auVar193._0_2_;
          sVar471 = auVar193._2_2_;
          bVar70 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[2] - (0xff < sVar471);
          sVar471 = auVar193._4_2_;
          sVar474 = auVar193._6_2_;
          cVar75 = (0 < sVar474) * (sVar474 < 0x100) * auVar193[6] - (0xff < sVar474);
          uVar291 = CONCAT13(cVar75,CONCAT12((0 < sVar471) * (sVar471 < 0x100) * auVar193[4] -
                                             (0xff < sVar471),
                                             CONCAT11(bVar70,(0 < sVar522) * (sVar522 < 0x100) *
                                                             auVar193[0] - (0xff < sVar522))));
          sVar522 = auVar193._8_2_;
          sVar471 = auVar193._10_2_;
          cVar76 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[10] - (0xff < sVar471);
          uVar292 = CONCAT15(cVar76,CONCAT14((0 < sVar522) * (sVar522 < 0x100) * auVar193[8] -
                                             (0xff < sVar522),uVar291));
          sVar522 = auVar193._12_2_;
          sVar471 = auVar193._14_2_;
          cVar77 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[0xe] - (0xff < sVar471);
          uVar293 = CONCAT17(cVar77,CONCAT16((0 < sVar522) * (sVar522 < 0x100) * auVar193[0xc] -
                                             (0xff < sVar522),uVar292));
          sVar522 = auVar222._0_2_;
          sVar471 = auVar222._2_2_;
          cVar95 = (0 < sVar471) * (sVar471 < 0x100) * auVar222[2] - (0xff < sVar471);
          auVar374._0_10_ =
               CONCAT19(cVar95,CONCAT18((0 < sVar522) * (sVar522 < 0x100) * auVar222[0] -
                                        (0xff < sVar522),uVar293));
          sVar522 = auVar222._4_2_;
          auVar374[10] = (0 < sVar522) * (sVar522 < 0x100) * auVar222[4] - (0xff < sVar522);
          sVar522 = auVar222._6_2_;
          cVar96 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[6] - (0xff < sVar522);
          auVar374[0xb] = cVar96;
          sVar522 = auVar222._8_2_;
          auVar381[0xc] = (0 < sVar522) * (sVar522 < 0x100) * auVar222[8] - (0xff < sVar522);
          auVar381._0_12_ = auVar374;
          sVar522 = auVar222._10_2_;
          cVar97 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[10] - (0xff < sVar522);
          auVar381[0xd] = cVar97;
          sVar522 = auVar222._12_2_;
          auVar388[0xe] = (0 < sVar522) * (sVar522 < 0x100) * auVar222[0xc] - (0xff < sVar522);
          auVar388._0_14_ = auVar381;
          sVar522 = auVar222._14_2_;
          cVar98 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[0xe] - (0xff < sVar522);
          auVar388[0xf] = cVar98;
          auVar222 = auVar493 & _DAT_0010a580;
          auVar193 = auVar521 & _DAT_0010a580;
          sVar522 = auVar222._0_2_;
          sVar471 = auVar222._2_2_;
          bVar94 = (0 < sVar471) * (sVar471 < 0x100) * auVar222[2] - (0xff < sVar471);
          sVar471 = auVar222._4_2_;
          sVar474 = auVar222._6_2_;
          cVar108 = (0 < sVar474) * (sVar474 < 0x100) * auVar222[6] - (0xff < sVar474);
          uVar199 = CONCAT13(cVar108,CONCAT12((0 < sVar471) * (sVar471 < 0x100) * auVar222[4] -
                                              (0xff < sVar471),
                                              CONCAT11(bVar94,(0 < sVar522) * (sVar522 < 0x100) *
                                                              auVar222[0] - (0xff < sVar522))));
          sVar522 = auVar222._8_2_;
          sVar471 = auVar222._10_2_;
          cVar109 = (0 < sVar471) * (sVar471 < 0x100) * auVar222[10] - (0xff < sVar471);
          uVar201 = CONCAT15(cVar109,CONCAT14((0 < sVar522) * (sVar522 < 0x100) * auVar222[8] -
                                              (0xff < sVar522),uVar199));
          sVar522 = auVar222._12_2_;
          sVar471 = auVar222._14_2_;
          cVar103 = (0 < sVar471) * (sVar471 < 0x100) * auVar222[0xe] - (0xff < sVar471);
          uVar203 = CONCAT17(cVar103,CONCAT16((0 < sVar522) * (sVar522 < 0x100) * auVar222[0xc] -
                                              (0xff < sVar522),uVar201));
          sVar522 = auVar193._0_2_;
          sVar471 = auVar193._2_2_;
          cVar107 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[2] - (0xff < sVar471);
          auVar235._0_10_ =
               CONCAT19(cVar107,CONCAT18((0 < sVar522) * (sVar522 < 0x100) * auVar193[0] -
                                         (0xff < sVar522),uVar203));
          sVar522 = auVar193._4_2_;
          auVar235[10] = (0 < sVar522) * (sVar522 < 0x100) * auVar193[4] - (0xff < sVar522);
          sVar522 = auVar193._6_2_;
          cVar101 = (0 < sVar522) * (sVar522 < 0x100) * auVar193[6] - (0xff < sVar522);
          auVar235[0xb] = cVar101;
          sVar522 = auVar193._8_2_;
          auVar239[0xc] = (0 < sVar522) * (sVar522 < 0x100) * auVar193[8] - (0xff < sVar522);
          auVar239._0_12_ = auVar235;
          sVar522 = auVar193._10_2_;
          cVar100 = (0 < sVar522) * (sVar522 < 0x100) * auVar193[10] - (0xff < sVar522);
          auVar239[0xd] = cVar100;
          sVar522 = auVar193._12_2_;
          auVar243[0xe] = (0 < sVar522) * (sVar522 < 0x100) * auVar193[0xc] - (0xff < sVar522);
          auVar243._0_14_ = auVar239;
          sVar522 = auVar193._14_2_;
          cVar99 = (0 < sVar522) * (sVar522 < 0x100) * auVar193[0xe] - (0xff < sVar522);
          auVar243[0xf] = cVar99;
          uVar250 = (ushort)bVar2;
          uVar276 = (ushort)((uint)uVar198 >> 0x18);
          uVar278 = (ushort)((uint6)uVar200 >> 0x28);
          uVar280 = (ushort)((ulong)uVar202 >> 0x38);
          uVar282 = (ushort)((unkuint10)auVar257._0_10_ >> 0x48);
          uVar284 = auVar257._10_2_ >> 8;
          uVar286 = auVar264._12_2_ >> 8;
          uVar288 = auVar271._14_2_ >> 8;
          uVar442 = (ushort)bVar10;
          uVar449 = (ushort)((uint)uVar406 >> 0x18);
          uVar451 = (ushort)((uint6)uVar407 >> 0x28);
          uVar452 = (ushort)((ulong)uVar408 >> 0x38);
          uVar454 = (ushort)((unkuint10)auVar427._0_10_ >> 0x48);
          uVar455 = auVar427._10_2_ >> 8;
          uVar457 = auVar430._12_2_ >> 8;
          uVar458 = auVar433._14_2_ >> 8;
          bVar102 = (uVar276 != 0) * (uVar276 < 0x100) * cVar21 - (0xff < uVar276);
          cVar19 = (uVar280 != 0) * (uVar280 < 0x100) * cVar19 - (0xff < uVar280);
          uVar198 = CONCAT13(cVar19,CONCAT12((uVar278 != 0) * (uVar278 < 0x100) * cVar20 -
                                             (0xff < uVar278),
                                             CONCAT11(bVar102,(uVar250 != 0) * (uVar250 < 0x100) *
                                                              bVar2 - (0xff < uVar250))));
          cVar14 = (uVar284 != 0) * (uVar284 < 0x100) * cVar14 - (0xff < uVar284);
          uVar200 = CONCAT15(cVar14,CONCAT14((uVar282 != 0) * (uVar282 < 0x100) * cVar11 -
                                             (0xff < uVar282),uVar198));
          cVar13 = (uVar288 != 0) * (uVar288 < 0x100) * cVar13 - (0xff < uVar288);
          uVar202 = CONCAT17(cVar13,CONCAT16((uVar286 != 0) * (uVar286 < 0x100) * cVar12 -
                                             (0xff < uVar286),uVar200));
          cVar12 = (uVar449 != 0) * (uVar449 < 0x100) * cVar22 - (0xff < uVar449);
          auVar258._0_10_ =
               CONCAT19(cVar12,CONCAT18((uVar442 != 0) * (uVar442 < 0x100) * bVar10 -
                                        (0xff < uVar442),uVar202));
          auVar258[10] = (uVar451 != 0) * (uVar451 < 0x100) * cVar23 - (0xff < uVar451);
          cVar11 = (uVar452 != 0) * (uVar452 < 0x100) * cVar24 - (0xff < uVar452);
          auVar258[0xb] = cVar11;
          auVar265[0xc] = (uVar454 != 0) * (uVar454 < 0x100) * cVar25 - (0xff < uVar454);
          auVar265._0_12_ = auVar258;
          cVar20 = (uVar455 != 0) * (uVar455 < 0x100) * cVar106 - (0xff < uVar455);
          auVar265[0xd] = cVar20;
          auVar272[0xe] = (uVar457 != 0) * (uVar457 < 0x100) * cVar105 - (0xff < uVar457);
          auVar272._0_14_ = auVar265;
          cVar21 = (uVar458 != 0) * (uVar458 < 0x100) * cVar104 - (0xff < uVar458);
          auVar272[0xf] = cVar21;
          uVar442 = (ushort)bVar110;
          uVar449 = (ushort)((uint)uVar252 >> 0x18);
          uVar451 = (ushort)((uint6)uVar253 >> 0x28);
          uVar452 = (ushort)((ulong)uVar254 >> 0x38);
          uVar454 = (ushort)((unkuint10)auVar336._0_10_ >> 0x48);
          uVar455 = auVar336._10_2_ >> 8;
          uVar457 = auVar342._12_2_ >> 8;
          uVar458 = auVar348._14_2_ >> 8;
          uVar250 = (ushort)bVar118;
          uVar276 = (ushort)((uint)uVar175 >> 0x18);
          uVar278 = (ushort)((uint6)uVar177 >> 0x28);
          uVar280 = (ushort)((ulong)uVar179 >> 0x38);
          uVar282 = (ushort)((unkuint10)auVar205._0_10_ >> 0x48);
          uVar284 = auVar205._10_2_ >> 8;
          uVar286 = auVar210._12_2_ >> 8;
          uVar288 = auVar227._14_2_ >> 8;
          bVar2 = (uVar449 != 0) * (uVar449 < 0x100) * cVar114 - (0xff < uVar449);
          cVar104 = (uVar452 != 0) * (uVar452 < 0x100) * cVar113 - (0xff < uVar452);
          uVar175 = CONCAT13(cVar104,CONCAT12((uVar451 != 0) * (uVar451 < 0x100) * cVar112 -
                                              (0xff < uVar451),
                                              CONCAT11(bVar2,(uVar442 != 0) * (uVar442 < 0x100) *
                                                             bVar110 - (0xff < uVar442))));
          cVar105 = (uVar455 != 0) * (uVar455 < 0x100) * cVar115 - (0xff < uVar455);
          uVar177 = CONCAT15(cVar105,CONCAT14((uVar454 != 0) * (uVar454 < 0x100) * cVar111 -
                                              (0xff < uVar454),uVar175));
          cVar106 = (uVar458 != 0) * (uVar458 < 0x100) * cVar117 - (0xff < uVar458);
          uVar179 = CONCAT17(cVar106,CONCAT16((uVar457 != 0) * (uVar457 < 0x100) * cVar116 -
                                              (0xff < uVar457),uVar177));
          cVar22 = (uVar276 != 0) * (uVar276 < 0x100) * cVar59 - (0xff < uVar276);
          auVar337._0_10_ =
               CONCAT19(cVar22,CONCAT18((uVar250 != 0) * (uVar250 < 0x100) * bVar118 -
                                        (0xff < uVar250),uVar179));
          auVar337[10] = (uVar278 != 0) * (uVar278 < 0x100) * cVar55 - (0xff < uVar278);
          cVar25 = (uVar280 != 0) * (uVar280 < 0x100) * cVar56 - (0xff < uVar280);
          auVar337[0xb] = cVar25;
          auVar343[0xc] = (uVar282 != 0) * (uVar282 < 0x100) * cVar57 - (0xff < uVar282);
          auVar343._0_12_ = auVar337;
          cVar24 = (uVar284 != 0) * (uVar284 < 0x100) * cVar58 - (0xff < uVar284);
          auVar343[0xd] = cVar24;
          auVar349[0xe] = (uVar286 != 0) * (uVar286 < 0x100) * cVar60 - (0xff < uVar286);
          auVar349._0_14_ = auVar343;
          cVar23 = (uVar288 != 0) * (uVar288 < 0x100) * cVar61 - (0xff < uVar288);
          auVar349[0xf] = cVar23;
          uVar250 = (ushort)bVar18;
          uVar276 = (ushort)((uint)uVar368 >> 0x18);
          uVar278 = (ushort)((uint6)uVar369 >> 0x28);
          uVar280 = (ushort)((ulong)uVar370 >> 0x38);
          uVar282 = (ushort)((unkuint10)auVar484._0_10_ >> 0x48);
          uVar284 = auVar484._10_2_ >> 8;
          uVar286 = auVar488._12_2_ >> 8;
          uVar288 = auVar493._14_2_ >> 8;
          uVar442 = (ushort)bVar54;
          uVar449 = (ushort)((uint)uVar423 >> 0x18);
          uVar451 = (ushort)((uint6)uVar424 >> 0x28);
          uVar452 = (ushort)((ulong)uVar425 >> 0x38);
          uVar454 = (ushort)((unkuint10)auVar513._0_10_ >> 0x48);
          uVar455 = auVar513._10_2_ >> 8;
          uVar457 = auVar516._12_2_ >> 8;
          uVar458 = auVar521._14_2_ >> 8;
          bVar10 = (uVar276 != 0) * (uVar276 < 0x100) * cVar63 - (0xff < uVar276);
          cVar55 = (uVar280 != 0) * (uVar280 < 0x100) * cVar64 - (0xff < uVar280);
          uVar252 = CONCAT13(cVar55,CONCAT12((uVar278 != 0) * (uVar278 < 0x100) * cVar66 -
                                             (0xff < uVar278),
                                             CONCAT11(bVar10,(uVar250 != 0) * (uVar250 < 0x100) *
                                                             bVar18 - (0xff < uVar250))));
          cVar56 = (uVar284 != 0) * (uVar284 < 0x100) * cVar67 - (0xff < uVar284);
          uVar253 = CONCAT15(cVar56,CONCAT14((uVar282 != 0) * (uVar282 < 0x100) * cVar65 -
                                             (0xff < uVar282),uVar252));
          cVar57 = (uVar288 != 0) * (uVar288 < 0x100) * cVar69 - (0xff < uVar288);
          uVar254 = CONCAT17(cVar57,CONCAT16((uVar286 != 0) * (uVar286 < 0x100) * cVar68 -
                                             (0xff < uVar286),uVar253));
          cVar58 = (uVar449 != 0) * (uVar449 < 0x100) * cVar73 - (0xff < uVar449);
          auVar485._0_10_ =
               CONCAT19(cVar58,CONCAT18((uVar442 != 0) * (uVar442 < 0x100) * bVar54 -
                                        (0xff < uVar442),uVar254));
          auVar485[10] = (uVar451 != 0) * (uVar451 < 0x100) * cVar72 - (0xff < uVar451);
          cVar59 = (uVar452 != 0) * (uVar452 < 0x100) * cVar71 - (0xff < uVar452);
          auVar485[0xb] = cVar59;
          auVar489[0xc] = (uVar454 != 0) * (uVar454 < 0x100) * cVar7 - (0xff < uVar454);
          auVar489._0_12_ = auVar485;
          cVar6 = (uVar455 != 0) * (uVar455 < 0x100) * cVar6 - (0xff < uVar455);
          auVar489[0xd] = cVar6;
          auVar494[0xe] = (uVar457 != 0) * (uVar457 < 0x100) * cVar5 - (0xff < uVar457);
          auVar494._0_14_ = auVar489;
          cVar4 = (uVar458 != 0) * (uVar458 < 0x100) * cVar4 - (0xff < uVar458);
          auVar494[0xf] = cVar4;
          auVar222 = auVar318 & _DAT_0010a580;
          auVar193 = auVar388 & _DAT_0010a580;
          sVar522 = auVar222._0_2_;
          sVar477 = auVar222._2_2_;
          sVar504 = auVar222._4_2_;
          sVar450 = auVar222._6_2_;
          sVar248 = auVar222._8_2_;
          sVar277 = auVar222._10_2_;
          sVar283 = auVar222._12_2_;
          sVar289 = auVar222._14_2_;
          sVar526 = auVar193._0_2_;
          sVar327 = auVar193._2_2_;
          sVar352 = auVar193._4_2_;
          sVar358 = auVar193._6_2_;
          sVar364 = auVar193._8_2_;
          sVar394 = auVar193._10_2_;
          sVar400 = auVar193._12_2_;
          sVar453 = auVar193._14_2_;
          auVar312 = auVar243 & _DAT_0010a580;
          auVar314 = auVar272 & _DAT_0010a580;
          sVar471 = auVar312._0_2_;
          sVar480 = auVar312._2_2_;
          sVar505 = auVar312._4_2_;
          sVar246 = auVar312._6_2_;
          sVar249 = auVar312._8_2_;
          sVar279 = auVar312._10_2_;
          sVar285 = auVar312._12_2_;
          sVar524 = auVar312._14_2_;
          sVar528 = auVar314._0_2_;
          sVar330 = auVar314._2_2_;
          sVar354 = auVar314._4_2_;
          sVar360 = auVar314._6_2_;
          sVar366 = auVar314._8_2_;
          sVar396 = auVar314._10_2_;
          sVar402 = auVar314._12_2_;
          sVar456 = auVar314._14_2_;
          auVar418 = auVar349 & _DAT_0010a580;
          auVar490 = auVar494 & _DAT_0010a580;
          sVar474 = auVar418._0_2_;
          sVar503 = auVar418._2_2_;
          sVar506 = auVar418._4_2_;
          sVar247 = auVar418._6_2_;
          sVar251 = auVar418._8_2_;
          sVar281 = auVar418._10_2_;
          sVar287 = auVar418._12_2_;
          sVar321 = auVar418._14_2_;
          sVar324 = auVar490._0_2_;
          sVar332 = auVar490._2_2_;
          sVar356 = auVar490._4_2_;
          sVar362 = auVar490._6_2_;
          sVar392 = auVar490._8_2_;
          sVar398 = auVar490._10_2_;
          sVar404 = auVar490._12_2_;
          sVar459 = auVar490._14_2_;
          uVar290 = (ushort)bVar62;
          uVar322 = (ushort)((uint)uVar231 >> 0x18);
          uVar323 = (ushort)((uint6)uVar232 >> 0x28);
          uVar325 = (ushort)((ulong)uVar233 >> 0x38);
          uVar326 = (ushort)((unkuint10)auVar296._0_10_ >> 0x48);
          uVar328 = auVar296._10_2_ >> 8;
          uVar329 = auVar301._12_2_ >> 8;
          uVar331 = auVar318._14_2_ >> 8;
          uVar367 = (ushort)bVar70;
          uVar393 = (ushort)((uint)uVar291 >> 0x18);
          uVar395 = (ushort)((uint6)uVar292 >> 0x28);
          uVar397 = (ushort)((ulong)uVar293 >> 0x38);
          uVar399 = (ushort)((unkuint10)auVar374._0_10_ >> 0x48);
          uVar401 = auVar374._10_2_ >> 8;
          uVar403 = auVar381._12_2_ >> 8;
          uVar405 = auVar388._14_2_ >> 8;
          uVar250 = (ushort)bVar94;
          uVar276 = (ushort)((uint)uVar199 >> 0x18);
          uVar278 = (ushort)((uint6)uVar201 >> 0x28);
          uVar280 = (ushort)((ulong)uVar203 >> 0x38);
          uVar282 = (ushort)((unkuint10)auVar235._0_10_ >> 0x48);
          uVar284 = auVar235._10_2_ >> 8;
          uVar286 = auVar239._12_2_ >> 8;
          uVar288 = auVar243._14_2_ >> 8;
          uVar442 = (ushort)bVar102;
          uVar449 = (ushort)((uint)uVar198 >> 0x18);
          uVar451 = (ushort)((uint6)uVar200 >> 0x28);
          uVar452 = (ushort)((ulong)uVar202 >> 0x38);
          uVar454 = (ushort)((unkuint10)auVar258._0_10_ >> 0x48);
          uVar455 = auVar258._10_2_ >> 8;
          uVar457 = auVar265._12_2_ >> 8;
          uVar458 = auVar272._14_2_ >> 8;
          uVar333 = (ushort)bVar2;
          uVar353 = (ushort)((uint)uVar175 >> 0x18);
          uVar355 = (ushort)((uint6)uVar177 >> 0x28);
          uVar357 = (ushort)((ulong)uVar179 >> 0x38);
          uVar359 = (ushort)((unkuint10)auVar337._0_10_ >> 0x48);
          uVar361 = auVar337._10_2_ >> 8;
          uVar363 = auVar343._12_2_ >> 8;
          uVar365 = auVar349._14_2_ >> 8;
          uVar481 = (ushort)bVar10;
          uVar495 = (ushort)((uint)uVar252 >> 0x18);
          uVar496 = (ushort)((uint6)uVar253 >> 0x28);
          uVar497 = (ushort)((ulong)uVar254 >> 0x38);
          uVar498 = (ushort)((unkuint10)auVar485._0_10_ >> 0x48);
          uVar499 = auVar485._10_2_ >> 8;
          uVar500 = auVar489._12_2_ >> 8;
          uVar501 = auVar494._14_2_ >> 8;
          puVar1 = puVar169 + uVar172;
          *puVar1 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[0] - (0xff < sVar522);
          puVar1[1] = (0 < sVar477) * (sVar477 < 0x100) * auVar222[2] - (0xff < sVar477);
          puVar1[2] = (0 < sVar504) * (sVar504 < 0x100) * auVar222[4] - (0xff < sVar504);
          puVar1[3] = (0 < sVar450) * (sVar450 < 0x100) * auVar222[6] - (0xff < sVar450);
          puVar1[4] = (0 < sVar248) * (sVar248 < 0x100) * auVar222[8] - (0xff < sVar248);
          puVar1[5] = (0 < sVar277) * (sVar277 < 0x100) * auVar222[10] - (0xff < sVar277);
          puVar1[6] = (0 < sVar283) * (sVar283 < 0x100) * auVar222[0xc] - (0xff < sVar283);
          puVar1[7] = (0 < sVar289) * (sVar289 < 0x100) * auVar222[0xe] - (0xff < sVar289);
          puVar1[8] = (0 < sVar526) * (sVar526 < 0x100) * auVar193[0] - (0xff < sVar526);
          puVar1[9] = (0 < sVar327) * (sVar327 < 0x100) * auVar193[2] - (0xff < sVar327);
          puVar1[10] = (0 < sVar352) * (sVar352 < 0x100) * auVar193[4] - (0xff < sVar352);
          puVar1[0xb] = (0 < sVar358) * (sVar358 < 0x100) * auVar193[6] - (0xff < sVar358);
          puVar1[0xc] = (0 < sVar364) * (sVar364 < 0x100) * auVar193[8] - (0xff < sVar364);
          puVar1[0xd] = (0 < sVar394) * (sVar394 < 0x100) * auVar193[10] - (0xff < sVar394);
          puVar1[0xe] = (0 < sVar400) * (sVar400 < 0x100) * auVar193[0xc] - (0xff < sVar400);
          puVar1[0xf] = (0 < sVar453) * (sVar453 < 0x100) * auVar193[0xe] - (0xff < sVar453);
          puVar1 = puVar169 + (ulong)uVar172 + 0x10;
          *puVar1 = (0 < sVar471) * (sVar471 < 0x100) * auVar312[0] - (0xff < sVar471);
          puVar1[1] = (0 < sVar480) * (sVar480 < 0x100) * auVar312[2] - (0xff < sVar480);
          puVar1[2] = (0 < sVar505) * (sVar505 < 0x100) * auVar312[4] - (0xff < sVar505);
          puVar1[3] = (0 < sVar246) * (sVar246 < 0x100) * auVar312[6] - (0xff < sVar246);
          puVar1[4] = (0 < sVar249) * (sVar249 < 0x100) * auVar312[8] - (0xff < sVar249);
          puVar1[5] = (0 < sVar279) * (sVar279 < 0x100) * auVar312[10] - (0xff < sVar279);
          puVar1[6] = (0 < sVar285) * (sVar285 < 0x100) * auVar312[0xc] - (0xff < sVar285);
          puVar1[7] = (0 < sVar524) * (sVar524 < 0x100) * auVar312[0xe] - (0xff < sVar524);
          puVar1[8] = (0 < sVar528) * (sVar528 < 0x100) * auVar314[0] - (0xff < sVar528);
          puVar1[9] = (0 < sVar330) * (sVar330 < 0x100) * auVar314[2] - (0xff < sVar330);
          puVar1[10] = (0 < sVar354) * (sVar354 < 0x100) * auVar314[4] - (0xff < sVar354);
          puVar1[0xb] = (0 < sVar360) * (sVar360 < 0x100) * auVar314[6] - (0xff < sVar360);
          puVar1[0xc] = (0 < sVar366) * (sVar366 < 0x100) * auVar314[8] - (0xff < sVar366);
          puVar1[0xd] = (0 < sVar396) * (sVar396 < 0x100) * auVar314[10] - (0xff < sVar396);
          puVar1[0xe] = (0 < sVar402) * (sVar402 < 0x100) * auVar314[0xc] - (0xff < sVar402);
          puVar1[0xf] = (0 < sVar456) * (sVar456 < 0x100) * auVar314[0xe] - (0xff < sVar456);
          puVar1 = puVar169 + (ulong)uVar172 + 0x20;
          *puVar1 = (0 < sVar474) * (sVar474 < 0x100) * auVar418[0] - (0xff < sVar474);
          puVar1[1] = (0 < sVar503) * (sVar503 < 0x100) * auVar418[2] - (0xff < sVar503);
          puVar1[2] = (0 < sVar506) * (sVar506 < 0x100) * auVar418[4] - (0xff < sVar506);
          puVar1[3] = (0 < sVar247) * (sVar247 < 0x100) * auVar418[6] - (0xff < sVar247);
          puVar1[4] = (0 < sVar251) * (sVar251 < 0x100) * auVar418[8] - (0xff < sVar251);
          puVar1[5] = (0 < sVar281) * (sVar281 < 0x100) * auVar418[10] - (0xff < sVar281);
          puVar1[6] = (0 < sVar287) * (sVar287 < 0x100) * auVar418[0xc] - (0xff < sVar287);
          puVar1[7] = (0 < sVar321) * (sVar321 < 0x100) * auVar418[0xe] - (0xff < sVar321);
          puVar1[8] = (0 < sVar324) * (sVar324 < 0x100) * auVar490[0] - (0xff < sVar324);
          puVar1[9] = (0 < sVar332) * (sVar332 < 0x100) * auVar490[2] - (0xff < sVar332);
          puVar1[10] = (0 < sVar356) * (sVar356 < 0x100) * auVar490[4] - (0xff < sVar356);
          puVar1[0xb] = (0 < sVar362) * (sVar362 < 0x100) * auVar490[6] - (0xff < sVar362);
          puVar1[0xc] = (0 < sVar392) * (sVar392 < 0x100) * auVar490[8] - (0xff < sVar392);
          puVar1[0xd] = (0 < sVar398) * (sVar398 < 0x100) * auVar490[10] - (0xff < sVar398);
          puVar1[0xe] = (0 < sVar404) * (sVar404 < 0x100) * auVar490[0xc] - (0xff < sVar404);
          puVar1[0xf] = (0 < sVar459) * (sVar459 < 0x100) * auVar490[0xe] - (0xff < sVar459);
          puVar1 = puVar169 + (ulong)uVar172 + 0x30;
          *puVar1 = (uVar290 != 0) * (uVar290 < 0x100) * bVar62 - (0xff < uVar290);
          puVar1[1] = (uVar322 != 0) * (uVar322 < 0x100) * cVar74 - (0xff < uVar322);
          puVar1[2] = (uVar323 != 0) * (uVar323 < 0x100) * cVar15 - (0xff < uVar323);
          puVar1[3] = (uVar325 != 0) * (uVar325 < 0x100) * cVar16 - (0xff < uVar325);
          puVar1[4] = (uVar326 != 0) * (uVar326 < 0x100) * cVar17 - (0xff < uVar326);
          puVar1[5] = (uVar328 != 0) * (uVar328 < 0x100) * cVar3 - (0xff < uVar328);
          puVar1[6] = (uVar329 != 0) * (uVar329 < 0x100) * cVar9 - (0xff < uVar329);
          puVar1[7] = (uVar331 != 0) * (uVar331 < 0x100) * cVar8 - (0xff < uVar331);
          puVar1[8] = (uVar367 != 0) * (uVar367 < 0x100) * bVar70 - (0xff < uVar367);
          puVar1[9] = (uVar393 != 0) * (uVar393 < 0x100) * cVar75 - (0xff < uVar393);
          puVar1[10] = (uVar395 != 0) * (uVar395 < 0x100) * cVar76 - (0xff < uVar395);
          puVar1[0xb] = (uVar397 != 0) * (uVar397 < 0x100) * cVar77 - (0xff < uVar397);
          puVar1[0xc] = (uVar399 != 0) * (uVar399 < 0x100) * cVar95 - (0xff < uVar399);
          puVar1[0xd] = (uVar401 != 0) * (uVar401 < 0x100) * cVar96 - (0xff < uVar401);
          puVar1[0xe] = (uVar403 != 0) * (uVar403 < 0x100) * cVar97 - (0xff < uVar403);
          puVar1[0xf] = (uVar405 != 0) * (uVar405 < 0x100) * cVar98 - (0xff < uVar405);
          puVar1 = puVar169 + (ulong)uVar172 + 0x40;
          *puVar1 = (uVar250 != 0) * (uVar250 < 0x100) * bVar94 - (0xff < uVar250);
          puVar1[1] = (uVar276 != 0) * (uVar276 < 0x100) * cVar108 - (0xff < uVar276);
          puVar1[2] = (uVar278 != 0) * (uVar278 < 0x100) * cVar109 - (0xff < uVar278);
          puVar1[3] = (uVar280 != 0) * (uVar280 < 0x100) * cVar103 - (0xff < uVar280);
          puVar1[4] = (uVar282 != 0) * (uVar282 < 0x100) * cVar107 - (0xff < uVar282);
          puVar1[5] = (uVar284 != 0) * (uVar284 < 0x100) * cVar101 - (0xff < uVar284);
          puVar1[6] = (uVar286 != 0) * (uVar286 < 0x100) * cVar100 - (0xff < uVar286);
          puVar1[7] = (uVar288 != 0) * (uVar288 < 0x100) * cVar99 - (0xff < uVar288);
          puVar1[8] = (uVar442 != 0) * (uVar442 < 0x100) * bVar102 - (0xff < uVar442);
          puVar1[9] = (uVar449 != 0) * (uVar449 < 0x100) * cVar19 - (0xff < uVar449);
          puVar1[10] = (uVar451 != 0) * (uVar451 < 0x100) * cVar14 - (0xff < uVar451);
          puVar1[0xb] = (uVar452 != 0) * (uVar452 < 0x100) * cVar13 - (0xff < uVar452);
          puVar1[0xc] = (uVar454 != 0) * (uVar454 < 0x100) * cVar12 - (0xff < uVar454);
          puVar1[0xd] = (uVar455 != 0) * (uVar455 < 0x100) * cVar11 - (0xff < uVar455);
          puVar1[0xe] = (uVar457 != 0) * (uVar457 < 0x100) * cVar20 - (0xff < uVar457);
          puVar1[0xf] = (uVar458 != 0) * (uVar458 < 0x100) * cVar21 - (0xff < uVar458);
          puVar1 = puVar169 + (ulong)uVar172 + 0x50;
          *puVar1 = (uVar333 != 0) * (uVar333 < 0x100) * bVar2 - (0xff < uVar333);
          puVar1[1] = (uVar353 != 0) * (uVar353 < 0x100) * cVar104 - (0xff < uVar353);
          puVar1[2] = (uVar355 != 0) * (uVar355 < 0x100) * cVar105 - (0xff < uVar355);
          puVar1[3] = (uVar357 != 0) * (uVar357 < 0x100) * cVar106 - (0xff < uVar357);
          puVar1[4] = (uVar359 != 0) * (uVar359 < 0x100) * cVar22 - (0xff < uVar359);
          puVar1[5] = (uVar361 != 0) * (uVar361 < 0x100) * cVar25 - (0xff < uVar361);
          puVar1[6] = (uVar363 != 0) * (uVar363 < 0x100) * cVar24 - (0xff < uVar363);
          puVar1[7] = (uVar365 != 0) * (uVar365 < 0x100) * cVar23 - (0xff < uVar365);
          puVar1[8] = (uVar481 != 0) * (uVar481 < 0x100) * bVar10 - (0xff < uVar481);
          puVar1[9] = (uVar495 != 0) * (uVar495 < 0x100) * cVar55 - (0xff < uVar495);
          puVar1[10] = (uVar496 != 0) * (uVar496 < 0x100) * cVar56 - (0xff < uVar496);
          puVar1[0xb] = (uVar497 != 0) * (uVar497 < 0x100) * cVar57 - (0xff < uVar497);
          puVar1[0xc] = (uVar498 != 0) * (uVar498 < 0x100) * cVar58 - (0xff < uVar498);
          puVar1[0xd] = (uVar499 != 0) * (uVar499 < 0x100) * cVar59 - (0xff < uVar499);
          puVar1[0xe] = (uVar500 != 0) * (uVar500 < 0x100) * cVar6 - (0xff < uVar500);
          puVar1[0xf] = (uVar501 != 0) * (uVar501 < 0x100) * cVar4 - (0xff < uVar501);
          uVar199 = CONCAT13(cVar27,CONCAT12((0 < sVar523) * (sVar523 < 0x100) * (char)sVar523 -
                                             (0xff < sVar523),
                                             CONCAT11(bVar26,(0 < sVar507) * (sVar507 < 0x100) *
                                                             (char)sVar507 - (0xff < sVar507))));
          uVar201 = CONCAT15(cVar28,CONCAT14((0 < sVar525) * (sVar525 < 0x100) * (char)sVar525 -
                                             (0xff < sVar525),uVar199));
          uVar203 = CONCAT17(cVar29,CONCAT16((0 < sVar527) * (sVar527 < 0x100) * (char)sVar527 -
                                             (0xff < sVar527),uVar201));
          Var130 = CONCAT19(cVar31,CONCAT18(cVar30,uVar203));
          auVar131[10] = cVar32;
          auVar131._0_10_ = Var130;
          auVar131[0xb] = cVar33;
          auVar132[0xc] = cVar34;
          auVar132._0_12_ = auVar131;
          auVar132[0xd] = cVar35;
          auVar312[0xe] = cVar36;
          auVar312._0_14_ = auVar132;
          auVar312[0xf] = cVar37;
          auVar222 = auVar312 & auVar441;
          auVar193 = local_d8 & auVar441;
          sVar522 = auVar222._0_2_;
          sVar471 = auVar222._2_2_;
          bVar2 = (0 < sVar471) * (sVar471 < 0x100) * auVar222[2] - (0xff < sVar471);
          sVar471 = auVar222._4_2_;
          sVar474 = auVar222._6_2_;
          cVar9 = (0 < sVar474) * (sVar474 < 0x100) * auVar222[6] - (0xff < sVar474);
          uVar198 = CONCAT13(cVar9,CONCAT12((0 < sVar471) * (sVar471 < 0x100) * auVar222[4] -
                                            (0xff < sVar471),
                                            CONCAT11(bVar2,(0 < sVar522) * (sVar522 < 0x100) *
                                                           auVar222[0] - (0xff < sVar522))));
          sVar522 = auVar222._8_2_;
          sVar471 = auVar222._10_2_;
          cVar3 = (0 < sVar471) * (sVar471 < 0x100) * auVar222[10] - (0xff < sVar471);
          uVar200 = CONCAT15(cVar3,CONCAT14((0 < sVar522) * (sVar522 < 0x100) * auVar222[8] -
                                            (0xff < sVar522),uVar198));
          sVar522 = auVar222._12_2_;
          sVar471 = auVar222._14_2_;
          cVar7 = (0 < sVar471) * (sVar471 < 0x100) * auVar222[0xe] - (0xff < sVar471);
          uVar202 = CONCAT17(cVar7,CONCAT16((0 < sVar522) * (sVar522 < 0x100) * auVar222[0xc] -
                                            (0xff < sVar522),uVar200));
          sVar522 = auVar193._0_2_;
          sVar471 = auVar193._2_2_;
          cVar8 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[2] - (0xff < sVar471);
          auVar206._0_10_ =
               CONCAT19(cVar8,CONCAT18((0 < sVar522) * (sVar522 < 0x100) * auVar193[0] -
                                       (0xff < sVar522),uVar202));
          sVar522 = auVar193._4_2_;
          auVar206[10] = (0 < sVar522) * (sVar522 < 0x100) * auVar193[4] - (0xff < sVar522);
          sVar522 = auVar193._6_2_;
          cVar6 = (0 < sVar522) * (sVar522 < 0x100) * auVar193[6] - (0xff < sVar522);
          auVar206[0xb] = cVar6;
          sVar522 = auVar193._8_2_;
          auVar211[0xc] = (0 < sVar522) * (sVar522 < 0x100) * auVar193[8] - (0xff < sVar522);
          auVar211._0_12_ = auVar206;
          sVar522 = auVar193._10_2_;
          cVar5 = (0 < sVar522) * (sVar522 < 0x100) * auVar193[10] - (0xff < sVar522);
          auVar211[0xd] = cVar5;
          sVar522 = auVar193._12_2_;
          auVar228[0xe] = (0 < sVar522) * (sVar522 < 0x100) * auVar193[0xc] - (0xff < sVar522);
          auVar228._0_14_ = auVar211;
          sVar522 = auVar193._14_2_;
          cVar4 = (0 < sVar522) * (sVar522 < 0x100) * auVar193[0xe] - (0xff < sVar522);
          auVar228[0xf] = cVar4;
          uVar175 = CONCAT13(cVar39,CONCAT12((0 < sVar476) * (sVar476 < 0x100) * (char)sVar476 -
                                             (0xff < sVar476),
                                             CONCAT11(bVar38,(0 < sVar475) * (sVar475 < 0x100) *
                                                             (char)sVar475 - (0xff < sVar475))));
          uVar177 = CONCAT15(cVar40,CONCAT14((0 < sVar478) * (sVar478 < 0x100) * (char)sVar478 -
                                             (0xff < sVar478),uVar175));
          uVar179 = CONCAT17(cVar41,CONCAT16((0 < sVar479) * (sVar479 < 0x100) * (char)sVar479 -
                                             (0xff < sVar479),uVar177));
          Var127 = CONCAT19(cVar42,CONCAT18((0 < sVar460) * (sVar460 < 0x100) * (char)sVar460 -
                                            (0xff < sVar460),uVar179));
          auVar128[10] = (0 < sVar470) * (sVar470 < 0x100) * (char)sVar470 - (0xff < sVar470);
          auVar128._0_10_ = Var127;
          auVar128[0xb] = cVar43;
          auVar129[0xc] = (0 < sVar472) * (sVar472 < 0x100) * (char)sVar472 - (0xff < sVar472);
          auVar129._0_12_ = auVar128;
          auVar129[0xd] = cVar44;
          auVar193[0xe] = (0 < sVar473) * (sVar473 < 0x100) * (char)sVar473 - (0xff < sVar473);
          auVar193._0_14_ = auVar129;
          auVar193[0xf] = cVar45;
          auVar222 = auVar193 & auVar441;
          auVar314 = auVar194 & auVar441;
          sVar522 = auVar222._0_2_;
          sVar471 = auVar222._2_2_;
          bVar10 = (0 < sVar471) * (sVar471 < 0x100) * auVar222[2] - (0xff < sVar471);
          sVar471 = auVar222._4_2_;
          sVar474 = auVar222._6_2_;
          cVar17 = (0 < sVar474) * (sVar474 < 0x100) * auVar222[6] - (0xff < sVar474);
          uVar231 = CONCAT13(cVar17,CONCAT12((0 < sVar471) * (sVar471 < 0x100) * auVar222[4] -
                                             (0xff < sVar471),
                                             CONCAT11(bVar10,(0 < sVar522) * (sVar522 < 0x100) *
                                                             auVar222[0] - (0xff < sVar522))));
          sVar522 = auVar222._8_2_;
          sVar471 = auVar222._10_2_;
          cVar16 = (0 < sVar471) * (sVar471 < 0x100) * auVar222[10] - (0xff < sVar471);
          uVar232 = CONCAT15(cVar16,CONCAT14((0 < sVar522) * (sVar522 < 0x100) * auVar222[8] -
                                             (0xff < sVar522),uVar231));
          sVar522 = auVar222._12_2_;
          sVar471 = auVar222._14_2_;
          cVar15 = (0 < sVar471) * (sVar471 < 0x100) * auVar222[0xe] - (0xff < sVar471);
          uVar233 = CONCAT17(cVar15,CONCAT16((0 < sVar522) * (sVar522 < 0x100) * auVar222[0xc] -
                                             (0xff < sVar522),uVar232));
          sVar522 = auVar314._0_2_;
          sVar471 = auVar314._2_2_;
          cVar14 = (0 < sVar471) * (sVar471 < 0x100) * auVar314[2] - (0xff < sVar471);
          auVar236._0_10_ =
               CONCAT19(cVar14,CONCAT18((0 < sVar522) * (sVar522 < 0x100) * auVar314[0] -
                                        (0xff < sVar522),uVar233));
          sVar522 = auVar314._4_2_;
          auVar236[10] = (0 < sVar522) * (sVar522 < 0x100) * auVar314[4] - (0xff < sVar522);
          sVar522 = auVar314._6_2_;
          cVar13 = (0 < sVar522) * (sVar522 < 0x100) * auVar314[6] - (0xff < sVar522);
          auVar236[0xb] = cVar13;
          sVar522 = auVar314._8_2_;
          auVar240[0xc] = (0 < sVar522) * (sVar522 < 0x100) * auVar314[8] - (0xff < sVar522);
          auVar240._0_12_ = auVar236;
          sVar522 = auVar314._10_2_;
          cVar12 = (0 < sVar522) * (sVar522 < 0x100) * auVar314[10] - (0xff < sVar522);
          auVar240[0xd] = cVar12;
          sVar522 = auVar314._12_2_;
          auVar244[0xe] = (0 < sVar522) * (sVar522 < 0x100) * auVar314[0xc] - (0xff < sVar522);
          auVar244._0_14_ = auVar240;
          sVar522 = auVar314._14_2_;
          cVar11 = (0 < sVar522) * (sVar522 < 0x100) * auVar314[0xe] - (0xff < sVar522);
          auVar244[0xf] = cVar11;
          auVar222 = auVar468 & auVar441;
          auVar314 = auVar448 & auVar441;
          sVar522 = auVar222._0_2_;
          sVar471 = auVar222._2_2_;
          bVar18 = (0 < sVar471) * (sVar471 < 0x100) * auVar222[2] - (0xff < sVar471);
          sVar471 = auVar222._4_2_;
          sVar474 = auVar222._6_2_;
          cVar25 = (0 < sVar474) * (sVar474 < 0x100) * auVar222[6] - (0xff < sVar474);
          uVar252 = CONCAT13(cVar25,CONCAT12((0 < sVar471) * (sVar471 < 0x100) * auVar222[4] -
                                             (0xff < sVar471),
                                             CONCAT11(bVar18,(0 < sVar522) * (sVar522 < 0x100) *
                                                             auVar222[0] - (0xff < sVar522))));
          sVar522 = auVar222._8_2_;
          sVar471 = auVar222._10_2_;
          cVar24 = (0 < sVar471) * (sVar471 < 0x100) * auVar222[10] - (0xff < sVar471);
          uVar253 = CONCAT15(cVar24,CONCAT14((0 < sVar522) * (sVar522 < 0x100) * auVar222[8] -
                                             (0xff < sVar522),uVar252));
          sVar522 = auVar222._12_2_;
          sVar471 = auVar222._14_2_;
          cVar23 = (0 < sVar471) * (sVar471 < 0x100) * auVar222[0xe] - (0xff < sVar471);
          uVar254 = CONCAT17(cVar23,CONCAT16((0 < sVar522) * (sVar522 < 0x100) * auVar222[0xc] -
                                             (0xff < sVar522),uVar253));
          sVar522 = auVar314._0_2_;
          sVar471 = auVar314._2_2_;
          cVar22 = (0 < sVar471) * (sVar471 < 0x100) * auVar314[2] - (0xff < sVar471);
          auVar259._0_10_ =
               CONCAT19(cVar22,CONCAT18((0 < sVar522) * (sVar522 < 0x100) * auVar314[0] -
                                        (0xff < sVar522),uVar254));
          sVar522 = auVar314._4_2_;
          auVar259[10] = (0 < sVar522) * (sVar522 < 0x100) * auVar314[4] - (0xff < sVar522);
          sVar522 = auVar314._6_2_;
          cVar21 = (0 < sVar522) * (sVar522 < 0x100) * auVar314[6] - (0xff < sVar522);
          auVar259[0xb] = cVar21;
          sVar522 = auVar314._8_2_;
          auVar266[0xc] = (0 < sVar522) * (sVar522 < 0x100) * auVar314[8] - (0xff < sVar522);
          auVar266._0_12_ = auVar259;
          sVar522 = auVar314._10_2_;
          cVar19 = (0 < sVar522) * (sVar522 < 0x100) * auVar314[10] - (0xff < sVar522);
          auVar266[0xd] = cVar19;
          sVar522 = auVar314._12_2_;
          auVar273[0xe] = (0 < sVar522) * (sVar522 < 0x100) * auVar314[0xc] - (0xff < sVar522);
          auVar273._0_14_ = auVar266;
          sVar522 = auVar314._14_2_;
          cVar20 = (0 < sVar522) * (sVar522 < 0x100) * auVar314[0xe] - (0xff < sVar522);
          auVar273[0xf] = cVar20;
          uVar442 = (ushort)bVar26;
          uVar449 = (ushort)((uint)uVar199 >> 0x18);
          uVar451 = (ushort)((uint6)uVar201 >> 0x28);
          uVar452 = (ushort)((ulong)uVar203 >> 0x38);
          uVar454 = (ushort)((unkuint10)Var130 >> 0x48);
          uVar455 = auVar131._10_2_ >> 8;
          uVar457 = auVar132._12_2_ >> 8;
          uVar458 = auVar312._14_2_ >> 8;
          uVar250 = (ushort)local_d8[1];
          uVar276 = SUB42(local_d8._0_4_,2) >> 8;
          uVar278 = SUB62(local_d8._0_6_,4) >> 8;
          uVar280 = SUB82(local_d8._0_8_,6) >> 8;
          uVar282 = SUB102(local_d8._0_10_,8) >> 8;
          uVar284 = local_d8._10_2_ >> 8;
          uVar286 = local_d8._12_2_ >> 8;
          uVar288 = local_d8._14_2_ >> 8;
          bVar54 = (uVar449 != 0) * (uVar449 < 0x100) * cVar27 - (0xff < uVar449);
          cVar34 = (uVar452 != 0) * (uVar452 < 0x100) * cVar29 - (0xff < uVar452);
          uVar368 = CONCAT13(cVar34,CONCAT12((uVar451 != 0) * (uVar451 < 0x100) * cVar28 -
                                             (0xff < uVar451),
                                             CONCAT11(bVar54,(uVar442 != 0) * (uVar442 < 0x100) *
                                                             bVar26 - (0xff < uVar442))));
          cVar36 = (uVar455 != 0) * (uVar455 < 0x100) * cVar33 - (0xff < uVar455);
          uVar369 = CONCAT15(cVar36,CONCAT14((uVar454 != 0) * (uVar454 < 0x100) * cVar31 -
                                             (0xff < uVar454),uVar368));
          cVar37 = (uVar458 != 0) * (uVar458 < 0x100) * cVar37 - (0xff < uVar458);
          uVar370 = CONCAT17(cVar37,CONCAT16((uVar457 != 0) * (uVar457 < 0x100) * cVar35 -
                                             (0xff < uVar457),uVar369));
          cVar35 = (uVar276 != 0) * (uVar276 < 0x100) * local_d8[3] - (0xff < uVar276);
          auVar375._0_10_ =
               CONCAT19(cVar35,CONCAT18((uVar250 != 0) * (uVar250 < 0x100) * local_d8[1] -
                                        (0xff < uVar250),uVar370));
          auVar375[10] = (uVar278 != 0) * (uVar278 < 0x100) * local_d8[5] - (0xff < uVar278);
          cVar33 = (uVar280 != 0) * (uVar280 < 0x100) * local_d8[7] - (0xff < uVar280);
          auVar375[0xb] = cVar33;
          auVar382[0xc] = (uVar282 != 0) * (uVar282 < 0x100) * local_d8[9] - (0xff < uVar282);
          auVar382._0_12_ = auVar375;
          cVar31 = (uVar284 != 0) * (uVar284 < 0x100) * local_d8[0xb] - (0xff < uVar284);
          auVar382[0xd] = cVar31;
          auVar389[0xe] = (uVar286 != 0) * (uVar286 < 0x100) * local_d8[0xd] - (0xff < uVar286);
          auVar389._0_14_ = auVar382;
          cVar27 = (uVar288 != 0) * (uVar288 < 0x100) * local_d8[0xf] - (0xff < uVar288);
          auVar389[0xf] = cVar27;
          uVar442 = (ushort)bVar38;
          uVar449 = (ushort)((uint)uVar175 >> 0x18);
          uVar451 = (ushort)((uint6)uVar177 >> 0x28);
          uVar452 = (ushort)((ulong)uVar179 >> 0x38);
          uVar454 = (ushort)((unkuint10)Var127 >> 0x48);
          uVar455 = auVar128._10_2_ >> 8;
          uVar457 = auVar129._12_2_ >> 8;
          uVar458 = auVar193._14_2_ >> 8;
          uVar250 = (ushort)bVar78;
          uVar276 = (ushort)((uint)uVar174 >> 0x18);
          uVar278 = (ushort)((uint6)uVar176 >> 0x28);
          uVar280 = (ushort)((ulong)uVar178 >> 0x38);
          uVar282 = (ushort)((unkuint10)auVar180._0_10_ >> 0x48);
          uVar284 = auVar180._10_2_ >> 8;
          uVar286 = auVar184._12_2_ >> 8;
          uVar288 = auVar194._14_2_ >> 8;
          bVar26 = (uVar449 != 0) * (uVar449 < 0x100) * cVar39 - (0xff < uVar449);
          cVar39 = (uVar452 != 0) * (uVar452 < 0x100) * cVar41 - (0xff < uVar452);
          uVar423 = CONCAT13(cVar39,CONCAT12((uVar451 != 0) * (uVar451 < 0x100) * cVar40 -
                                             (0xff < uVar451),
                                             CONCAT11(bVar26,(uVar442 != 0) * (uVar442 < 0x100) *
                                                             bVar38 - (0xff < uVar442))));
          cVar41 = (uVar455 != 0) * (uVar455 < 0x100) * cVar43 - (0xff < uVar455);
          uVar424 = CONCAT15(cVar41,CONCAT14((uVar454 != 0) * (uVar454 < 0x100) * cVar42 -
                                             (0xff < uVar454),uVar423));
          cVar45 = (uVar458 != 0) * (uVar458 < 0x100) * cVar45 - (0xff < uVar458);
          uVar425 = CONCAT17(cVar45,CONCAT16((uVar457 != 0) * (uVar457 < 0x100) * cVar44 -
                                             (0xff < uVar457),uVar424));
          cVar32 = (uVar276 != 0) * (uVar276 < 0x100) * cVar79 - (0xff < uVar276);
          auVar435._0_10_ =
               CONCAT19(cVar32,CONCAT18((uVar250 != 0) * (uVar250 < 0x100) * bVar78 -
                                        (0xff < uVar250),uVar425));
          auVar435[10] = (uVar278 != 0) * (uVar278 < 0x100) * cVar80 - (0xff < uVar278);
          cVar28 = (uVar280 != 0) * (uVar280 < 0x100) * cVar81 - (0xff < uVar280);
          auVar435[0xb] = cVar28;
          auVar437[0xc] = (uVar282 != 0) * (uVar282 < 0x100) * cVar82 - (0xff < uVar282);
          auVar437._0_12_ = auVar435;
          cVar29 = (uVar284 != 0) * (uVar284 < 0x100) * cVar83 - (0xff < uVar284);
          auVar437[0xd] = cVar29;
          auVar439[0xe] = (uVar286 != 0) * (uVar286 < 0x100) * cVar84 - (0xff < uVar286);
          auVar439._0_14_ = auVar437;
          cVar30 = (uVar288 != 0) * (uVar288 < 0x100) * cVar85 - (0xff < uVar288);
          auVar439[0xf] = cVar30;
          uVar442 = (ushort)bVar46;
          uVar449 = (ushort)((uint)uVar461 >> 0x18);
          uVar451 = (ushort)((uint6)uVar462 >> 0x28);
          uVar452 = (ushort)((ulong)uVar463 >> 0x38);
          uVar454 = (ushort)((unkuint10)auVar464._0_10_ >> 0x48);
          uVar455 = auVar464._10_2_ >> 8;
          uVar457 = auVar466._12_2_ >> 8;
          uVar458 = auVar468._14_2_ >> 8;
          uVar250 = (ushort)bVar86;
          uVar276 = (ushort)((uint)uVar443 >> 0x18);
          uVar278 = (ushort)((uint6)uVar444 >> 0x28);
          uVar280 = (ushort)((ulong)uVar445 >> 0x38);
          uVar282 = (ushort)((unkuint10)auVar446._0_10_ >> 0x48);
          uVar284 = auVar446._10_2_ >> 8;
          uVar286 = auVar447._12_2_ >> 8;
          uVar288 = auVar448._14_2_ >> 8;
          bVar38 = (uVar449 != 0) * (uVar449 < 0x100) * cVar47 - (0xff < uVar449);
          cVar44 = (uVar452 != 0) * (uVar452 < 0x100) * cVar49 - (0xff < uVar452);
          uVar443 = CONCAT13(cVar44,CONCAT12((uVar451 != 0) * (uVar451 < 0x100) * cVar48 -
                                             (0xff < uVar451),
                                             CONCAT11(bVar38,(uVar442 != 0) * (uVar442 < 0x100) *
                                                             bVar46 - (0xff < uVar442))));
          cVar43 = (uVar455 != 0) * (uVar455 < 0x100) * cVar51 - (0xff < uVar455);
          uVar444 = CONCAT15(cVar43,CONCAT14((uVar454 != 0) * (uVar454 < 0x100) * cVar50 -
                                             (0xff < uVar454),uVar443));
          cVar42 = (uVar458 != 0) * (uVar458 < 0x100) * cVar53 - (0xff < uVar458);
          uVar445 = CONCAT17(cVar42,CONCAT16((uVar457 != 0) * (uVar457 < 0x100) * cVar52 -
                                             (0xff < uVar457),uVar444));
          cVar40 = (uVar276 != 0) * (uVar276 < 0x100) * cVar87 - (0xff < uVar276);
          auVar465._0_10_ =
               CONCAT19(cVar40,CONCAT18((uVar250 != 0) * (uVar250 < 0x100) * bVar86 -
                                        (0xff < uVar250),uVar445));
          auVar465[10] = (uVar278 != 0) * (uVar278 < 0x100) * cVar88 - (0xff < uVar278);
          cVar49 = (uVar280 != 0) * (uVar280 < 0x100) * cVar89 - (0xff < uVar280);
          auVar465[0xb] = cVar49;
          auVar467[0xc] = (uVar282 != 0) * (uVar282 < 0x100) * cVar90 - (0xff < uVar282);
          auVar467._0_12_ = auVar465;
          cVar53 = (uVar284 != 0) * (uVar284 < 0x100) * cVar91 - (0xff < uVar284);
          auVar467[0xd] = cVar53;
          auVar469[0xe] = (uVar286 != 0) * (uVar286 < 0x100) * cVar92 - (0xff < uVar286);
          auVar469._0_14_ = auVar467;
          cVar52 = (uVar288 != 0) * (uVar288 < 0x100) * cVar93 - (0xff < uVar288);
          auVar469[0xf] = cVar52;
          auVar193 = auVar228 & auVar441;
          auVar222 = auVar244 & auVar441;
          sVar522 = auVar193._0_2_;
          sVar471 = auVar193._2_2_;
          bVar46 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[2] - (0xff < sVar471);
          sVar471 = auVar193._4_2_;
          sVar474 = auVar193._6_2_;
          cVar57 = (0 < sVar474) * (sVar474 < 0x100) * auVar193[6] - (0xff < sVar474);
          uVar291 = CONCAT13(cVar57,CONCAT12((0 < sVar471) * (sVar471 < 0x100) * auVar193[4] -
                                             (0xff < sVar471),
                                             CONCAT11(bVar46,(0 < sVar522) * (sVar522 < 0x100) *
                                                             auVar193[0] - (0xff < sVar522))));
          sVar522 = auVar193._8_2_;
          sVar471 = auVar193._10_2_;
          cVar56 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[10] - (0xff < sVar471);
          uVar292 = CONCAT15(cVar56,CONCAT14((0 < sVar522) * (sVar522 < 0x100) * auVar193[8] -
                                             (0xff < sVar522),uVar291));
          sVar522 = auVar193._12_2_;
          sVar471 = auVar193._14_2_;
          cVar55 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[0xe] - (0xff < sVar471);
          uVar293 = CONCAT17(cVar55,CONCAT16((0 < sVar522) * (sVar522 < 0x100) * auVar193[0xc] -
                                             (0xff < sVar522),uVar292));
          sVar522 = auVar222._0_2_;
          sVar471 = auVar222._2_2_;
          cVar51 = (0 < sVar471) * (sVar471 < 0x100) * auVar222[2] - (0xff < sVar471);
          auVar297._0_10_ =
               CONCAT19(cVar51,CONCAT18((0 < sVar522) * (sVar522 < 0x100) * auVar222[0] -
                                        (0xff < sVar522),uVar293));
          sVar522 = auVar222._4_2_;
          auVar297[10] = (0 < sVar522) * (sVar522 < 0x100) * auVar222[4] - (0xff < sVar522);
          sVar522 = auVar222._6_2_;
          cVar47 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[6] - (0xff < sVar522);
          auVar297[0xb] = cVar47;
          sVar522 = auVar222._8_2_;
          auVar302[0xc] = (0 < sVar522) * (sVar522 < 0x100) * auVar222[8] - (0xff < sVar522);
          auVar302._0_12_ = auVar297;
          sVar522 = auVar222._10_2_;
          cVar48 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[10] - (0xff < sVar522);
          auVar302[0xd] = cVar48;
          sVar522 = auVar222._12_2_;
          auVar319[0xe] = (0 < sVar522) * (sVar522 < 0x100) * auVar222[0xc] - (0xff < sVar522);
          auVar319._0_14_ = auVar302;
          sVar522 = auVar222._14_2_;
          cVar50 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[0xe] - (0xff < sVar522);
          auVar319[0xf] = cVar50;
          auVar193 = auVar273 & auVar441;
          auVar222 = auVar389 & auVar441;
          sVar522 = auVar193._0_2_;
          sVar471 = auVar193._2_2_;
          bVar62 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[2] - (0xff < sVar471);
          sVar471 = auVar193._4_2_;
          sVar474 = auVar193._6_2_;
          cVar58 = (0 < sVar474) * (sVar474 < 0x100) * auVar193[6] - (0xff < sVar474);
          uVar406 = CONCAT13(cVar58,CONCAT12((0 < sVar471) * (sVar471 < 0x100) * auVar193[4] -
                                             (0xff < sVar471),
                                             CONCAT11(bVar62,(0 < sVar522) * (sVar522 < 0x100) *
                                                             auVar193[0] - (0xff < sVar522))));
          sVar522 = auVar193._8_2_;
          sVar471 = auVar193._10_2_;
          cVar59 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[10] - (0xff < sVar471);
          uVar407 = CONCAT15(cVar59,CONCAT14((0 < sVar522) * (sVar522 < 0x100) * auVar193[8] -
                                             (0xff < sVar522),uVar406));
          sVar522 = auVar193._12_2_;
          sVar471 = auVar193._14_2_;
          cVar60 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[0xe] - (0xff < sVar471);
          uVar408 = CONCAT17(cVar60,CONCAT16((0 < sVar522) * (sVar522 < 0x100) * auVar193[0xc] -
                                             (0xff < sVar522),uVar407));
          sVar522 = auVar222._0_2_;
          sVar471 = auVar222._2_2_;
          cVar61 = (0 < sVar471) * (sVar471 < 0x100) * auVar222[2] - (0xff < sVar471);
          auVar411._0_10_ =
               CONCAT19(cVar61,CONCAT18((0 < sVar522) * (sVar522 < 0x100) * auVar222[0] -
                                        (0xff < sVar522),uVar408));
          sVar522 = auVar222._4_2_;
          auVar411[10] = (0 < sVar522) * (sVar522 < 0x100) * auVar222[4] - (0xff < sVar522);
          sVar522 = auVar222._6_2_;
          cVar63 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[6] - (0xff < sVar522);
          auVar411[0xb] = cVar63;
          sVar522 = auVar222._8_2_;
          auVar415[0xc] = (0 < sVar522) * (sVar522 < 0x100) * auVar222[8] - (0xff < sVar522);
          auVar415._0_12_ = auVar411;
          sVar522 = auVar222._10_2_;
          cVar69 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[10] - (0xff < sVar522);
          auVar415[0xd] = cVar69;
          sVar522 = auVar222._12_2_;
          auVar421[0xe] = (0 < sVar522) * (sVar522 < 0x100) * auVar222[0xc] - (0xff < sVar522);
          auVar421._0_14_ = auVar415;
          sVar522 = auVar222._14_2_;
          cVar68 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[0xe] - (0xff < sVar522);
          auVar421[0xf] = cVar68;
          auVar222 = auVar439 & auVar441;
          auVar193 = auVar469 & auVar441;
          sVar522 = auVar222._0_2_;
          sVar471 = auVar222._2_2_;
          bVar70 = (0 < sVar471) * (sVar471 < 0x100) * auVar222[2] - (0xff < sVar471);
          sVar471 = auVar222._4_2_;
          sVar474 = auVar222._6_2_;
          cVar72 = (0 < sVar474) * (sVar474 < 0x100) * auVar222[6] - (0xff < sVar474);
          uVar175 = CONCAT13(cVar72,CONCAT12((0 < sVar471) * (sVar471 < 0x100) * auVar222[4] -
                                             (0xff < sVar471),
                                             CONCAT11(bVar70,(0 < sVar522) * (sVar522 < 0x100) *
                                                             auVar222[0] - (0xff < sVar522))));
          sVar522 = auVar222._8_2_;
          sVar471 = auVar222._10_2_;
          cVar71 = (0 < sVar471) * (sVar471 < 0x100) * auVar222[10] - (0xff < sVar471);
          uVar177 = CONCAT15(cVar71,CONCAT14((0 < sVar522) * (sVar522 < 0x100) * auVar222[8] -
                                             (0xff < sVar522),uVar175));
          sVar522 = auVar222._12_2_;
          sVar471 = auVar222._14_2_;
          cVar66 = (0 < sVar471) * (sVar471 < 0x100) * auVar222[0xe] - (0xff < sVar471);
          uVar179 = CONCAT17(cVar66,CONCAT16((0 < sVar522) * (sVar522 < 0x100) * auVar222[0xc] -
                                             (0xff < sVar522),uVar177));
          sVar522 = auVar193._0_2_;
          sVar471 = auVar193._2_2_;
          cVar73 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[2] - (0xff < sVar471);
          auVar181._0_10_ =
               CONCAT19(cVar73,CONCAT18((0 < sVar522) * (sVar522 < 0x100) * auVar193[0] -
                                        (0xff < sVar522),uVar179));
          sVar522 = auVar193._4_2_;
          auVar181[10] = (0 < sVar522) * (sVar522 < 0x100) * auVar193[4] - (0xff < sVar522);
          sVar522 = auVar193._6_2_;
          cVar64 = (0 < sVar522) * (sVar522 < 0x100) * auVar193[6] - (0xff < sVar522);
          auVar181[0xb] = cVar64;
          sVar522 = auVar193._8_2_;
          auVar185[0xc] = (0 < sVar522) * (sVar522 < 0x100) * auVar193[8] - (0xff < sVar522);
          auVar185._0_12_ = auVar181;
          sVar522 = auVar193._10_2_;
          cVar65 = (0 < sVar522) * (sVar522 < 0x100) * auVar193[10] - (0xff < sVar522);
          auVar185[0xd] = cVar65;
          sVar522 = auVar193._12_2_;
          auVar195[0xe] = (0 < sVar522) * (sVar522 < 0x100) * auVar193[0xc] - (0xff < sVar522);
          auVar195._0_14_ = auVar185;
          sVar522 = auVar193._14_2_;
          cVar67 = (0 < sVar522) * (sVar522 < 0x100) * auVar193[0xe] - (0xff < sVar522);
          auVar195[0xf] = cVar67;
          uVar250 = (ushort)bVar2;
          uVar276 = (ushort)((uint)uVar198 >> 0x18);
          uVar278 = (ushort)((uint6)uVar200 >> 0x28);
          uVar280 = (ushort)((ulong)uVar202 >> 0x38);
          uVar282 = (ushort)((unkuint10)auVar206._0_10_ >> 0x48);
          uVar284 = auVar206._10_2_ >> 8;
          uVar286 = auVar211._12_2_ >> 8;
          uVar288 = auVar228._14_2_ >> 8;
          uVar442 = (ushort)bVar10;
          uVar449 = (ushort)((uint)uVar231 >> 0x18);
          uVar451 = (ushort)((uint6)uVar232 >> 0x28);
          uVar452 = (ushort)((ulong)uVar233 >> 0x38);
          uVar454 = (ushort)((unkuint10)auVar236._0_10_ >> 0x48);
          uVar455 = auVar236._10_2_ >> 8;
          uVar457 = auVar240._12_2_ >> 8;
          uVar458 = auVar244._14_2_ >> 8;
          bVar78 = (uVar276 != 0) * (uVar276 < 0x100) * cVar9 - (0xff < uVar276);
          cVar7 = (uVar280 != 0) * (uVar280 < 0x100) * cVar7 - (0xff < uVar280);
          uVar199 = CONCAT13(cVar7,CONCAT12((uVar278 != 0) * (uVar278 < 0x100) * cVar3 -
                                            (0xff < uVar278),
                                            CONCAT11(bVar78,(uVar250 != 0) * (uVar250 < 0x100) *
                                                            bVar2 - (0xff < uVar250))));
          cVar6 = (uVar284 != 0) * (uVar284 < 0x100) * cVar6 - (0xff < uVar284);
          uVar201 = CONCAT15(cVar6,CONCAT14((uVar282 != 0) * (uVar282 < 0x100) * cVar8 -
                                            (0xff < uVar282),uVar199));
          cVar4 = (uVar288 != 0) * (uVar288 < 0x100) * cVar4 - (0xff < uVar288);
          uVar203 = CONCAT17(cVar4,CONCAT16((uVar286 != 0) * (uVar286 < 0x100) * cVar5 -
                                            (0xff < uVar286),uVar201));
          cVar5 = (uVar449 != 0) * (uVar449 < 0x100) * cVar17 - (0xff < uVar449);
          auVar207._0_10_ =
               CONCAT19(cVar5,CONCAT18((uVar442 != 0) * (uVar442 < 0x100) * bVar10 -
                                       (0xff < uVar442),uVar203));
          auVar207[10] = (uVar451 != 0) * (uVar451 < 0x100) * cVar16 - (0xff < uVar451);
          cVar8 = (uVar452 != 0) * (uVar452 < 0x100) * cVar15 - (0xff < uVar452);
          auVar207[0xb] = cVar8;
          auVar212[0xc] = (uVar454 != 0) * (uVar454 < 0x100) * cVar14 - (0xff < uVar454);
          auVar212._0_12_ = auVar207;
          cVar9 = (uVar455 != 0) * (uVar455 < 0x100) * cVar13 - (0xff < uVar455);
          auVar212[0xd] = cVar9;
          auVar229[0xe] = (uVar457 != 0) * (uVar457 < 0x100) * cVar12 - (0xff < uVar457);
          auVar229._0_14_ = auVar212;
          cVar3 = (uVar458 != 0) * (uVar458 < 0x100) * cVar11 - (0xff < uVar458);
          auVar229[0xf] = cVar3;
          uVar250 = (ushort)bVar18;
          uVar276 = (ushort)((uint)uVar252 >> 0x18);
          uVar278 = (ushort)((uint6)uVar253 >> 0x28);
          uVar280 = (ushort)((ulong)uVar254 >> 0x38);
          uVar282 = (ushort)((unkuint10)auVar259._0_10_ >> 0x48);
          uVar284 = auVar259._10_2_ >> 8;
          uVar286 = auVar266._12_2_ >> 8;
          uVar288 = auVar273._14_2_ >> 8;
          uVar442 = (ushort)bVar54;
          uVar449 = (ushort)((uint)uVar368 >> 0x18);
          uVar451 = (ushort)((uint6)uVar369 >> 0x28);
          uVar452 = (ushort)((ulong)uVar370 >> 0x38);
          uVar454 = (ushort)((unkuint10)auVar375._0_10_ >> 0x48);
          uVar455 = auVar375._10_2_ >> 8;
          uVar457 = auVar382._12_2_ >> 8;
          uVar458 = auVar389._14_2_ >> 8;
          bVar2 = (uVar276 != 0) * (uVar276 < 0x100) * cVar25 - (0xff < uVar276);
          cVar11 = (uVar280 != 0) * (uVar280 < 0x100) * cVar23 - (0xff < uVar280);
          uVar174 = CONCAT13(cVar11,CONCAT12((uVar278 != 0) * (uVar278 < 0x100) * cVar24 -
                                             (0xff < uVar278),
                                             CONCAT11(bVar2,(uVar250 != 0) * (uVar250 < 0x100) *
                                                            bVar18 - (0xff < uVar250))));
          cVar12 = (uVar284 != 0) * (uVar284 < 0x100) * cVar21 - (0xff < uVar284);
          uVar176 = CONCAT15(cVar12,CONCAT14((uVar282 != 0) * (uVar282 < 0x100) * cVar22 -
                                             (0xff < uVar282),uVar174));
          cVar13 = (uVar288 != 0) * (uVar288 < 0x100) * cVar20 - (0xff < uVar288);
          uVar178 = CONCAT17(cVar13,CONCAT16((uVar286 != 0) * (uVar286 < 0x100) * cVar19 -
                                             (0xff < uVar286),uVar176));
          cVar17 = (uVar449 != 0) * (uVar449 < 0x100) * cVar34 - (0xff < uVar449);
          auVar260._0_10_ =
               CONCAT19(cVar17,CONCAT18((uVar442 != 0) * (uVar442 < 0x100) * bVar54 -
                                        (0xff < uVar442),uVar178));
          auVar260[10] = (uVar451 != 0) * (uVar451 < 0x100) * cVar36 - (0xff < uVar451);
          cVar14 = (uVar452 != 0) * (uVar452 < 0x100) * cVar37 - (0xff < uVar452);
          auVar260[0xb] = cVar14;
          auVar267[0xc] = (uVar454 != 0) * (uVar454 < 0x100) * cVar35 - (0xff < uVar454);
          auVar267._0_12_ = auVar260;
          cVar15 = (uVar455 != 0) * (uVar455 < 0x100) * cVar33 - (0xff < uVar455);
          auVar267[0xd] = cVar15;
          auVar274[0xe] = (uVar457 != 0) * (uVar457 < 0x100) * cVar31 - (0xff < uVar457);
          auVar274._0_14_ = auVar267;
          cVar16 = (uVar458 != 0) * (uVar458 < 0x100) * cVar27 - (0xff < uVar458);
          auVar274[0xf] = cVar16;
          uVar250 = (ushort)bVar26;
          uVar276 = (ushort)((uint)uVar423 >> 0x18);
          uVar278 = (ushort)((uint6)uVar424 >> 0x28);
          uVar280 = (ushort)((ulong)uVar425 >> 0x38);
          uVar282 = (ushort)((unkuint10)auVar435._0_10_ >> 0x48);
          uVar284 = auVar435._10_2_ >> 8;
          uVar286 = auVar437._12_2_ >> 8;
          uVar288 = auVar439._14_2_ >> 8;
          uVar442 = (ushort)bVar38;
          uVar449 = (ushort)((uint)uVar443 >> 0x18);
          uVar451 = (ushort)((uint6)uVar444 >> 0x28);
          uVar452 = (ushort)((ulong)uVar445 >> 0x38);
          uVar454 = (ushort)((unkuint10)auVar465._0_10_ >> 0x48);
          uVar455 = auVar465._10_2_ >> 8;
          uVar457 = auVar467._12_2_ >> 8;
          uVar458 = auVar469._14_2_ >> 8;
          bVar10 = (uVar276 != 0) * (uVar276 < 0x100) * cVar39 - (0xff < uVar276);
          cVar19 = (uVar280 != 0) * (uVar280 < 0x100) * cVar45 - (0xff < uVar280);
          uVar198 = CONCAT13(cVar19,CONCAT12((uVar278 != 0) * (uVar278 < 0x100) * cVar41 -
                                             (0xff < uVar278),
                                             CONCAT11(bVar10,(uVar250 != 0) * (uVar250 < 0x100) *
                                                             bVar26 - (0xff < uVar250))));
          cVar20 = (uVar284 != 0) * (uVar284 < 0x100) * cVar28 - (0xff < uVar284);
          uVar200 = CONCAT15(cVar20,CONCAT14((uVar282 != 0) * (uVar282 < 0x100) * cVar32 -
                                             (0xff < uVar282),uVar198));
          cVar21 = (uVar288 != 0) * (uVar288 < 0x100) * cVar30 - (0xff < uVar288);
          uVar202 = CONCAT17(cVar21,CONCAT16((uVar286 != 0) * (uVar286 < 0x100) * cVar29 -
                                             (0xff < uVar286),uVar200));
          cVar22 = (uVar449 != 0) * (uVar449 < 0x100) * cVar44 - (0xff < uVar449);
          auVar436._0_10_ =
               CONCAT19(cVar22,CONCAT18((uVar442 != 0) * (uVar442 < 0x100) * bVar38 -
                                        (0xff < uVar442),uVar202));
          auVar436[10] = (uVar451 != 0) * (uVar451 < 0x100) * cVar43 - (0xff < uVar451);
          cVar23 = (uVar452 != 0) * (uVar452 < 0x100) * cVar42 - (0xff < uVar452);
          auVar436[0xb] = cVar23;
          auVar438[0xc] = (uVar454 != 0) * (uVar454 < 0x100) * cVar40 - (0xff < uVar454);
          auVar438._0_12_ = auVar436;
          cVar24 = (uVar455 != 0) * (uVar455 < 0x100) * cVar49 - (0xff < uVar455);
          auVar438[0xd] = cVar24;
          auVar440[0xe] = (uVar457 != 0) * (uVar457 < 0x100) * cVar53 - (0xff < uVar457);
          auVar440._0_14_ = auVar438;
          cVar25 = (uVar458 != 0) * (uVar458 < 0x100) * cVar52 - (0xff < uVar458);
          auVar440[0xf] = cVar25;
          auVar193 = auVar319 & auVar441;
          auVar222 = auVar421 & auVar441;
          sVar522 = auVar193._0_2_;
          sVar471 = auVar193._2_2_;
          bVar18 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[2] - (0xff < sVar471);
          sVar471 = auVar193._4_2_;
          sVar474 = auVar193._6_2_;
          cVar27 = (0 < sVar474) * (sVar474 < 0x100) * auVar193[6] - (0xff < sVar474);
          uVar252 = CONCAT13(cVar27,CONCAT12((0 < sVar471) * (sVar471 < 0x100) * auVar193[4] -
                                             (0xff < sVar471),
                                             CONCAT11(bVar18,(0 < sVar522) * (sVar522 < 0x100) *
                                                             auVar193[0] - (0xff < sVar522))));
          sVar522 = auVar193._8_2_;
          sVar471 = auVar193._10_2_;
          cVar31 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[10] - (0xff < sVar471);
          uVar253 = CONCAT15(cVar31,CONCAT14((0 < sVar522) * (sVar522 < 0x100) * auVar193[8] -
                                             (0xff < sVar522),uVar252));
          sVar522 = auVar193._12_2_;
          sVar471 = auVar193._14_2_;
          cVar33 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[0xe] - (0xff < sVar471);
          uVar254 = CONCAT17(cVar33,CONCAT16((0 < sVar522) * (sVar522 < 0x100) * auVar193[0xc] -
                                             (0xff < sVar522),uVar253));
          sVar522 = auVar222._0_2_;
          sVar471 = auVar222._2_2_;
          cVar34 = (0 < sVar471) * (sVar471 < 0x100) * auVar222[2] - (0xff < sVar471);
          auVar338._0_10_ =
               CONCAT19(cVar34,CONCAT18((0 < sVar522) * (sVar522 < 0x100) * auVar222[0] -
                                        (0xff < sVar522),uVar254));
          sVar522 = auVar222._4_2_;
          auVar338[10] = (0 < sVar522) * (sVar522 < 0x100) * auVar222[4] - (0xff < sVar522);
          sVar522 = auVar222._6_2_;
          cVar35 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[6] - (0xff < sVar522);
          auVar338[0xb] = cVar35;
          sVar522 = auVar222._8_2_;
          auVar344[0xc] = (0 < sVar522) * (sVar522 < 0x100) * auVar222[8] - (0xff < sVar522);
          auVar344._0_12_ = auVar338;
          sVar522 = auVar222._10_2_;
          cVar36 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[10] - (0xff < sVar522);
          auVar344[0xd] = cVar36;
          sVar522 = auVar222._12_2_;
          auVar350[0xe] = (0 < sVar522) * (sVar522 < 0x100) * auVar222[0xc] - (0xff < sVar522);
          auVar350._0_14_ = auVar344;
          sVar522 = auVar222._14_2_;
          cVar37 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[0xe] - (0xff < sVar522);
          auVar350[0xf] = cVar37;
          auVar193 = auVar195 & auVar441;
          auVar222 = auVar229 & auVar441;
          sVar522 = auVar193._0_2_;
          sVar471 = auVar193._2_2_;
          bVar26 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[2] - (0xff < sVar471);
          sVar471 = auVar193._4_2_;
          sVar474 = auVar193._6_2_;
          cVar30 = (0 < sVar474) * (sVar474 < 0x100) * auVar193[6] - (0xff < sVar474);
          uVar423 = CONCAT13(cVar30,CONCAT12((0 < sVar471) * (sVar471 < 0x100) * auVar193[4] -
                                             (0xff < sVar471),
                                             CONCAT11(bVar26,(0 < sVar522) * (sVar522 < 0x100) *
                                                             auVar193[0] - (0xff < sVar522))));
          sVar522 = auVar193._8_2_;
          sVar471 = auVar193._10_2_;
          cVar29 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[10] - (0xff < sVar471);
          uVar424 = CONCAT15(cVar29,CONCAT14((0 < sVar522) * (sVar522 < 0x100) * auVar193[8] -
                                             (0xff < sVar522),uVar423));
          sVar522 = auVar193._12_2_;
          sVar471 = auVar193._14_2_;
          cVar28 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[0xe] - (0xff < sVar471);
          uVar425 = CONCAT17(cVar28,CONCAT16((0 < sVar522) * (sVar522 < 0x100) * auVar193[0xc] -
                                             (0xff < sVar522),uVar424));
          sVar522 = auVar222._0_2_;
          sVar471 = auVar222._2_2_;
          cVar32 = (0 < sVar471) * (sVar471 < 0x100) * auVar222[2] - (0xff < sVar471);
          auVar428._0_10_ =
               CONCAT19(cVar32,CONCAT18((0 < sVar522) * (sVar522 < 0x100) * auVar222[0] -
                                        (0xff < sVar522),uVar425));
          sVar522 = auVar222._4_2_;
          auVar428[10] = (0 < sVar522) * (sVar522 < 0x100) * auVar222[4] - (0xff < sVar522);
          sVar522 = auVar222._6_2_;
          cVar41 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[6] - (0xff < sVar522);
          auVar428[0xb] = cVar41;
          sVar522 = auVar222._8_2_;
          auVar431[0xc] = (0 < sVar522) * (sVar522 < 0x100) * auVar222[8] - (0xff < sVar522);
          auVar431._0_12_ = auVar428;
          sVar522 = auVar222._10_2_;
          cVar45 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[10] - (0xff < sVar522);
          auVar431[0xd] = cVar45;
          sVar522 = auVar222._12_2_;
          auVar434[0xe] = (0 < sVar522) * (sVar522 < 0x100) * auVar222[0xc] - (0xff < sVar522);
          auVar434._0_14_ = auVar431;
          sVar522 = auVar222._14_2_;
          cVar44 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[0xe] - (0xff < sVar522);
          auVar434[0xf] = cVar44;
          auVar193 = auVar274 & auVar441;
          auVar222 = auVar440 & auVar441;
          sVar522 = auVar193._0_2_;
          sVar471 = auVar193._2_2_;
          bVar38 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[2] - (0xff < sVar471);
          sVar471 = auVar193._4_2_;
          sVar474 = auVar193._6_2_;
          cVar52 = (0 < sVar474) * (sVar474 < 0x100) * auVar193[6] - (0xff < sVar474);
          uVar368 = CONCAT13(cVar52,CONCAT12((0 < sVar471) * (sVar471 < 0x100) * auVar193[4] -
                                             (0xff < sVar471),
                                             CONCAT11(bVar38,(0 < sVar522) * (sVar522 < 0x100) *
                                                             auVar193[0] - (0xff < sVar522))));
          sVar522 = auVar193._8_2_;
          sVar471 = auVar193._10_2_;
          cVar53 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[10] - (0xff < sVar471);
          uVar369 = CONCAT15(cVar53,CONCAT14((0 < sVar522) * (sVar522 < 0x100) * auVar193[8] -
                                             (0xff < sVar522),uVar368));
          sVar522 = auVar193._12_2_;
          sVar471 = auVar193._14_2_;
          cVar49 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[0xe] - (0xff < sVar471);
          uVar370 = CONCAT17(cVar49,CONCAT16((0 < sVar522) * (sVar522 < 0x100) * auVar193[0xc] -
                                             (0xff < sVar522),uVar369));
          sVar522 = auVar222._0_2_;
          sVar471 = auVar222._2_2_;
          cVar39 = (0 < sVar471) * (sVar471 < 0x100) * auVar222[2] - (0xff < sVar471);
          auVar376._0_10_ =
               CONCAT19(cVar39,CONCAT18((0 < sVar522) * (sVar522 < 0x100) * auVar222[0] -
                                        (0xff < sVar522),uVar370));
          sVar522 = auVar222._4_2_;
          auVar376[10] = (0 < sVar522) * (sVar522 < 0x100) * auVar222[4] - (0xff < sVar522);
          sVar522 = auVar222._6_2_;
          cVar43 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[6] - (0xff < sVar522);
          auVar376[0xb] = cVar43;
          sVar522 = auVar222._8_2_;
          auVar383[0xc] = (0 < sVar522) * (sVar522 < 0x100) * auVar222[8] - (0xff < sVar522);
          auVar383._0_12_ = auVar376;
          sVar522 = auVar222._10_2_;
          cVar40 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[10] - (0xff < sVar522);
          auVar383[0xd] = cVar40;
          sVar522 = auVar222._12_2_;
          auVar390[0xe] = (0 < sVar522) * (sVar522 < 0x100) * auVar222[0xc] - (0xff < sVar522);
          auVar390._0_14_ = auVar383;
          sVar522 = auVar222._14_2_;
          cVar42 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[0xe] - (0xff < sVar522);
          auVar390[0xf] = cVar42;
          uVar250 = (ushort)bVar46;
          uVar276 = (ushort)((uint)uVar291 >> 0x18);
          uVar278 = (ushort)((uint6)uVar292 >> 0x28);
          uVar280 = (ushort)((ulong)uVar293 >> 0x38);
          uVar282 = (ushort)((unkuint10)auVar297._0_10_ >> 0x48);
          uVar284 = auVar297._10_2_ >> 8;
          uVar286 = auVar302._12_2_ >> 8;
          uVar288 = auVar319._14_2_ >> 8;
          uVar442 = (ushort)bVar62;
          uVar449 = (ushort)((uint)uVar406 >> 0x18);
          uVar451 = (ushort)((uint6)uVar407 >> 0x28);
          uVar452 = (ushort)((ulong)uVar408 >> 0x38);
          uVar454 = (ushort)((unkuint10)auVar411._0_10_ >> 0x48);
          uVar455 = auVar411._10_2_ >> 8;
          uVar457 = auVar415._12_2_ >> 8;
          uVar458 = auVar421._14_2_ >> 8;
          bVar54 = (uVar276 != 0) * (uVar276 < 0x100) * cVar57 - (0xff < uVar276);
          cVar55 = (uVar280 != 0) * (uVar280 < 0x100) * cVar55 - (0xff < uVar280);
          uVar231 = CONCAT13(cVar55,CONCAT12((uVar278 != 0) * (uVar278 < 0x100) * cVar56 -
                                             (0xff < uVar278),
                                             CONCAT11(bVar54,(uVar250 != 0) * (uVar250 < 0x100) *
                                                             bVar46 - (0xff < uVar250))));
          cVar47 = (uVar284 != 0) * (uVar284 < 0x100) * cVar47 - (0xff < uVar284);
          uVar232 = CONCAT15(cVar47,CONCAT14((uVar282 != 0) * (uVar282 < 0x100) * cVar51 -
                                             (0xff < uVar282),uVar231));
          cVar51 = (uVar288 != 0) * (uVar288 < 0x100) * cVar50 - (0xff < uVar288);
          uVar233 = CONCAT17(cVar51,CONCAT16((uVar286 != 0) * (uVar286 < 0x100) * cVar48 -
                                             (0xff < uVar286),uVar232));
          cVar50 = (uVar449 != 0) * (uVar449 < 0x100) * cVar58 - (0xff < uVar449);
          auVar298._0_10_ =
               CONCAT19(cVar50,CONCAT18((uVar442 != 0) * (uVar442 < 0x100) * bVar62 -
                                        (0xff < uVar442),uVar233));
          auVar298[10] = (uVar451 != 0) * (uVar451 < 0x100) * cVar59 - (0xff < uVar451);
          cVar48 = (uVar452 != 0) * (uVar452 < 0x100) * cVar60 - (0xff < uVar452);
          auVar298[0xb] = cVar48;
          auVar303[0xc] = (uVar454 != 0) * (uVar454 < 0x100) * cVar61 - (0xff < uVar454);
          auVar303._0_12_ = auVar298;
          cVar56 = (uVar455 != 0) * (uVar455 < 0x100) * cVar63 - (0xff < uVar455);
          auVar303[0xd] = cVar56;
          auVar320[0xe] = (uVar457 != 0) * (uVar457 < 0x100) * cVar69 - (0xff < uVar457);
          auVar320._0_14_ = auVar303;
          cVar57 = (uVar458 != 0) * (uVar458 < 0x100) * cVar68 - (0xff < uVar458);
          auVar320[0xf] = cVar57;
          uVar250 = (ushort)bVar70;
          uVar276 = (ushort)((uint)uVar175 >> 0x18);
          uVar278 = (ushort)((uint6)uVar177 >> 0x28);
          uVar280 = (ushort)((ulong)uVar179 >> 0x38);
          uVar282 = (ushort)((unkuint10)auVar181._0_10_ >> 0x48);
          uVar284 = auVar181._10_2_ >> 8;
          uVar286 = auVar185._12_2_ >> 8;
          uVar288 = auVar195._14_2_ >> 8;
          uVar442 = (ushort)bVar78;
          uVar449 = (ushort)((uint)uVar199 >> 0x18);
          uVar451 = (ushort)((uint6)uVar201 >> 0x28);
          uVar452 = (ushort)((ulong)uVar203 >> 0x38);
          uVar454 = (ushort)((unkuint10)auVar207._0_10_ >> 0x48);
          uVar455 = auVar207._10_2_ >> 8;
          uVar457 = auVar212._12_2_ >> 8;
          uVar458 = auVar229._14_2_ >> 8;
          bVar46 = (uVar276 != 0) * (uVar276 < 0x100) * cVar72 - (0xff < uVar276);
          cVar60 = (uVar280 != 0) * (uVar280 < 0x100) * cVar66 - (0xff < uVar280);
          uVar175 = CONCAT13(cVar60,CONCAT12((uVar278 != 0) * (uVar278 < 0x100) * cVar71 -
                                             (0xff < uVar278),
                                             CONCAT11(bVar46,(uVar250 != 0) * (uVar250 < 0x100) *
                                                             bVar70 - (0xff < uVar250))));
          cVar58 = (uVar284 != 0) * (uVar284 < 0x100) * cVar64 - (0xff < uVar284);
          uVar177 = CONCAT15(cVar58,CONCAT14((uVar282 != 0) * (uVar282 < 0x100) * cVar73 -
                                             (0xff < uVar282),uVar175));
          cVar59 = (uVar288 != 0) * (uVar288 < 0x100) * cVar67 - (0xff < uVar288);
          uVar179 = CONCAT17(cVar59,CONCAT16((uVar286 != 0) * (uVar286 < 0x100) * cVar65 -
                                             (0xff < uVar286),uVar177));
          cVar7 = (uVar449 != 0) * (uVar449 < 0x100) * cVar7 - (0xff < uVar449);
          auVar182._0_10_ =
               CONCAT19(cVar7,CONCAT18((uVar442 != 0) * (uVar442 < 0x100) * bVar78 -
                                       (0xff < uVar442),uVar179));
          auVar182[10] = (uVar451 != 0) * (uVar451 < 0x100) * cVar6 - (0xff < uVar451);
          cVar6 = (uVar452 != 0) * (uVar452 < 0x100) * cVar4 - (0xff < uVar452);
          auVar182[0xb] = cVar6;
          auVar186[0xc] = (uVar454 != 0) * (uVar454 < 0x100) * cVar5 - (0xff < uVar454);
          auVar186._0_12_ = auVar182;
          cVar5 = (uVar455 != 0) * (uVar455 < 0x100) * cVar8 - (0xff < uVar455);
          auVar186[0xd] = cVar5;
          auVar196[0xe] = (uVar457 != 0) * (uVar457 < 0x100) * cVar9 - (0xff < uVar457);
          auVar196._0_14_ = auVar186;
          cVar4 = (uVar458 != 0) * (uVar458 < 0x100) * cVar3 - (0xff < uVar458);
          auVar196[0xf] = cVar4;
          uVar250 = (ushort)bVar2;
          uVar276 = (ushort)((uint)uVar174 >> 0x18);
          uVar278 = (ushort)((uint6)uVar176 >> 0x28);
          uVar280 = (ushort)((ulong)uVar178 >> 0x38);
          uVar282 = (ushort)((unkuint10)auVar260._0_10_ >> 0x48);
          uVar284 = auVar260._10_2_ >> 8;
          uVar286 = auVar267._12_2_ >> 8;
          uVar288 = auVar274._14_2_ >> 8;
          uVar442 = (ushort)bVar10;
          uVar449 = (ushort)((uint)uVar198 >> 0x18);
          uVar451 = (ushort)((uint6)uVar200 >> 0x28);
          uVar452 = (ushort)((ulong)uVar202 >> 0x38);
          uVar454 = (ushort)((unkuint10)auVar436._0_10_ >> 0x48);
          uVar455 = auVar436._10_2_ >> 8;
          uVar457 = auVar438._12_2_ >> 8;
          uVar458 = auVar440._14_2_ >> 8;
          bVar62 = (uVar276 != 0) * (uVar276 < 0x100) * cVar11 - (0xff < uVar276);
          cVar8 = (uVar280 != 0) * (uVar280 < 0x100) * cVar13 - (0xff < uVar280);
          uVar198 = CONCAT13(cVar8,CONCAT12((uVar278 != 0) * (uVar278 < 0x100) * cVar12 -
                                            (0xff < uVar278),
                                            CONCAT11(bVar62,(uVar250 != 0) * (uVar250 < 0x100) *
                                                            bVar2 - (0xff < uVar250))));
          cVar9 = (uVar284 != 0) * (uVar284 < 0x100) * cVar14 - (0xff < uVar284);
          uVar200 = CONCAT15(cVar9,CONCAT14((uVar282 != 0) * (uVar282 < 0x100) * cVar17 -
                                            (0xff < uVar282),uVar198));
          cVar3 = (uVar288 != 0) * (uVar288 < 0x100) * cVar16 - (0xff < uVar288);
          uVar202 = CONCAT17(cVar3,CONCAT16((uVar286 != 0) * (uVar286 < 0x100) * cVar15 -
                                            (0xff < uVar286),uVar200));
          cVar17 = (uVar449 != 0) * (uVar449 < 0x100) * cVar19 - (0xff < uVar449);
          auVar261._0_10_ =
               CONCAT19(cVar17,CONCAT18((uVar442 != 0) * (uVar442 < 0x100) * bVar10 -
                                        (0xff < uVar442),uVar202));
          auVar261[10] = (uVar451 != 0) * (uVar451 < 0x100) * cVar20 - (0xff < uVar451);
          cVar16 = (uVar452 != 0) * (uVar452 < 0x100) * cVar21 - (0xff < uVar452);
          auVar261[0xb] = cVar16;
          auVar268[0xc] = (uVar454 != 0) * (uVar454 < 0x100) * cVar22 - (0xff < uVar454);
          auVar268._0_12_ = auVar261;
          cVar15 = (uVar455 != 0) * (uVar455 < 0x100) * cVar23 - (0xff < uVar455);
          auVar268[0xd] = cVar15;
          auVar275[0xe] = (uVar457 != 0) * (uVar457 < 0x100) * cVar24 - (0xff < uVar457);
          auVar275._0_14_ = auVar268;
          cVar14 = (uVar458 != 0) * (uVar458 < 0x100) * cVar25 - (0xff < uVar458);
          auVar275[0xf] = cVar14;
          auVar222 = auVar350 & auVar441;
          auVar193 = auVar434 & auVar441;
          sVar522 = auVar222._0_2_;
          sVar471 = auVar222._2_2_;
          bVar2 = (0 < sVar471) * (sVar471 < 0x100) * auVar222[2] - (0xff < sVar471);
          sVar471 = auVar222._4_2_;
          sVar474 = auVar222._6_2_;
          cVar22 = (0 < sVar474) * (sVar474 < 0x100) * auVar222[6] - (0xff < sVar474);
          uVar199 = CONCAT13(cVar22,CONCAT12((0 < sVar471) * (sVar471 < 0x100) * auVar222[4] -
                                             (0xff < sVar471),
                                             CONCAT11(bVar2,(0 < sVar522) * (sVar522 < 0x100) *
                                                            auVar222[0] - (0xff < sVar522))));
          sVar522 = auVar222._8_2_;
          sVar471 = auVar222._10_2_;
          cVar21 = (0 < sVar471) * (sVar471 < 0x100) * auVar222[10] - (0xff < sVar471);
          uVar201 = CONCAT15(cVar21,CONCAT14((0 < sVar522) * (sVar522 < 0x100) * auVar222[8] -
                                             (0xff < sVar522),uVar199));
          sVar522 = auVar222._12_2_;
          sVar471 = auVar222._14_2_;
          cVar20 = (0 < sVar471) * (sVar471 < 0x100) * auVar222[0xe] - (0xff < sVar471);
          uVar203 = CONCAT17(cVar20,CONCAT16((0 < sVar522) * (sVar522 < 0x100) * auVar222[0xc] -
                                             (0xff < sVar522),uVar201));
          sVar522 = auVar193._0_2_;
          sVar471 = auVar193._2_2_;
          cVar19 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[2] - (0xff < sVar471);
          auVar208._0_10_ =
               CONCAT19(cVar19,CONCAT18((0 < sVar522) * (sVar522 < 0x100) * auVar193[0] -
                                        (0xff < sVar522),uVar203));
          sVar522 = auVar193._4_2_;
          auVar208[10] = (0 < sVar522) * (sVar522 < 0x100) * auVar193[4] - (0xff < sVar522);
          sVar522 = auVar193._6_2_;
          cVar13 = (0 < sVar522) * (sVar522 < 0x100) * auVar193[6] - (0xff < sVar522);
          auVar208[0xb] = cVar13;
          sVar522 = auVar193._8_2_;
          auVar213[0xc] = (0 < sVar522) * (sVar522 < 0x100) * auVar193[8] - (0xff < sVar522);
          auVar213._0_12_ = auVar208;
          sVar522 = auVar193._10_2_;
          cVar11 = (0 < sVar522) * (sVar522 < 0x100) * auVar193[10] - (0xff < sVar522);
          auVar213[0xd] = cVar11;
          sVar522 = auVar193._12_2_;
          auVar230[0xe] = (0 < sVar522) * (sVar522 < 0x100) * auVar193[0xc] - (0xff < sVar522);
          auVar230._0_14_ = auVar213;
          sVar522 = auVar193._14_2_;
          cVar12 = (0 < sVar522) * (sVar522 < 0x100) * auVar193[0xe] - (0xff < sVar522);
          auVar230[0xf] = cVar12;
          auVar193 = auVar390 & auVar441;
          auVar222 = auVar320 & auVar441;
          sVar522 = auVar193._0_2_;
          sVar471 = auVar193._2_2_;
          bVar10 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[2] - (0xff < sVar471);
          sVar471 = auVar193._4_2_;
          sVar474 = auVar193._6_2_;
          cVar23 = (0 < sVar474) * (sVar474 < 0x100) * auVar193[6] - (0xff < sVar474);
          uVar291 = CONCAT13(cVar23,CONCAT12((0 < sVar471) * (sVar471 < 0x100) * auVar193[4] -
                                             (0xff < sVar471),
                                             CONCAT11(bVar10,(0 < sVar522) * (sVar522 < 0x100) *
                                                             auVar193[0] - (0xff < sVar522))));
          sVar522 = auVar193._8_2_;
          sVar471 = auVar193._10_2_;
          cVar24 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[10] - (0xff < sVar471);
          uVar292 = CONCAT15(cVar24,CONCAT14((0 < sVar522) * (sVar522 < 0x100) * auVar193[8] -
                                             (0xff < sVar522),uVar291));
          sVar522 = auVar193._12_2_;
          sVar471 = auVar193._14_2_;
          cVar25 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[0xe] - (0xff < sVar471);
          uVar293 = CONCAT17(cVar25,CONCAT16((0 < sVar522) * (sVar522 < 0x100) * auVar193[0xc] -
                                             (0xff < sVar522),uVar292));
          sVar522 = auVar222._0_2_;
          sVar471 = auVar222._2_2_;
          cVar61 = (0 < sVar471) * (sVar471 < 0x100) * auVar222[2] - (0xff < sVar471);
          auVar412._0_10_ =
               CONCAT19(cVar61,CONCAT18((0 < sVar522) * (sVar522 < 0x100) * auVar222[0] -
                                        (0xff < sVar522),uVar293));
          sVar522 = auVar222._4_2_;
          auVar412[10] = (0 < sVar522) * (sVar522 < 0x100) * auVar222[4] - (0xff < sVar522);
          sVar522 = auVar222._6_2_;
          cVar63 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[6] - (0xff < sVar522);
          auVar412[0xb] = cVar63;
          sVar522 = auVar222._8_2_;
          auVar416[0xc] = (0 < sVar522) * (sVar522 < 0x100) * auVar222[8] - (0xff < sVar522);
          auVar416._0_12_ = auVar412;
          sVar522 = auVar222._10_2_;
          cVar69 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[10] - (0xff < sVar522);
          auVar416[0xd] = cVar69;
          sVar522 = auVar222._12_2_;
          auVar422[0xe] = (0 < sVar522) * (sVar522 < 0x100) * auVar222[0xc] - (0xff < sVar522);
          auVar422._0_14_ = auVar416;
          sVar522 = auVar222._14_2_;
          cVar68 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[0xe] - (0xff < sVar522);
          auVar422[0xf] = cVar68;
          auVar222 = auVar196 & auVar441;
          auVar193 = auVar275 & auVar441;
          sVar522 = auVar222._0_2_;
          sVar471 = auVar222._2_2_;
          bVar70 = (0 < sVar471) * (sVar471 < 0x100) * auVar222[2] - (0xff < sVar471);
          sVar471 = auVar222._4_2_;
          sVar474 = auVar222._6_2_;
          cVar72 = (0 < sVar474) * (sVar474 < 0x100) * auVar222[6] - (0xff < sVar474);
          uVar174 = CONCAT13(cVar72,CONCAT12((0 < sVar471) * (sVar471 < 0x100) * auVar222[4] -
                                             (0xff < sVar471),
                                             CONCAT11(bVar70,(0 < sVar522) * (sVar522 < 0x100) *
                                                             auVar222[0] - (0xff < sVar522))));
          sVar522 = auVar222._8_2_;
          sVar471 = auVar222._10_2_;
          cVar71 = (0 < sVar471) * (sVar471 < 0x100) * auVar222[10] - (0xff < sVar471);
          uVar176 = CONCAT15(cVar71,CONCAT14((0 < sVar522) * (sVar522 < 0x100) * auVar222[8] -
                                             (0xff < sVar522),uVar174));
          sVar522 = auVar222._12_2_;
          sVar471 = auVar222._14_2_;
          cVar67 = (0 < sVar471) * (sVar471 < 0x100) * auVar222[0xe] - (0xff < sVar471);
          uVar178 = CONCAT17(cVar67,CONCAT16((0 < sVar522) * (sVar522 < 0x100) * auVar222[0xc] -
                                             (0xff < sVar522),uVar176));
          sVar522 = auVar193._0_2_;
          sVar471 = auVar193._2_2_;
          cVar73 = (0 < sVar471) * (sVar471 < 0x100) * auVar193[2] - (0xff < sVar471);
          auVar237._0_10_ =
               CONCAT19(cVar73,CONCAT18((0 < sVar522) * (sVar522 < 0x100) * auVar193[0] -
                                        (0xff < sVar522),uVar178));
          sVar522 = auVar193._4_2_;
          auVar237[10] = (0 < sVar522) * (sVar522 < 0x100) * auVar193[4] - (0xff < sVar522);
          sVar522 = auVar193._6_2_;
          cVar66 = (0 < sVar522) * (sVar522 < 0x100) * auVar193[6] - (0xff < sVar522);
          auVar237[0xb] = cVar66;
          sVar522 = auVar193._8_2_;
          auVar241[0xc] = (0 < sVar522) * (sVar522 < 0x100) * auVar193[8] - (0xff < sVar522);
          auVar241._0_12_ = auVar237;
          sVar522 = auVar193._10_2_;
          cVar64 = (0 < sVar522) * (sVar522 < 0x100) * auVar193[10] - (0xff < sVar522);
          auVar241[0xd] = cVar64;
          sVar522 = auVar193._12_2_;
          auVar245[0xe] = (0 < sVar522) * (sVar522 < 0x100) * auVar193[0xc] - (0xff < sVar522);
          auVar245._0_14_ = auVar241;
          sVar522 = auVar193._14_2_;
          cVar65 = (0 < sVar522) * (sVar522 < 0x100) * auVar193[0xe] - (0xff < sVar522);
          auVar245[0xf] = cVar65;
          uVar250 = (ushort)bVar18;
          uVar276 = (ushort)((uint)uVar252 >> 0x18);
          uVar278 = (ushort)((uint6)uVar253 >> 0x28);
          uVar280 = (ushort)((ulong)uVar254 >> 0x38);
          uVar282 = (ushort)((unkuint10)auVar338._0_10_ >> 0x48);
          uVar284 = auVar338._10_2_ >> 8;
          uVar286 = auVar344._12_2_ >> 8;
          uVar288 = auVar350._14_2_ >> 8;
          uVar442 = (ushort)bVar26;
          uVar449 = (ushort)((uint)uVar423 >> 0x18);
          uVar451 = (ushort)((uint6)uVar424 >> 0x28);
          uVar452 = (ushort)((ulong)uVar425 >> 0x38);
          uVar454 = (ushort)((unkuint10)auVar428._0_10_ >> 0x48);
          uVar455 = auVar428._10_2_ >> 8;
          uVar457 = auVar431._12_2_ >> 8;
          uVar458 = auVar434._14_2_ >> 8;
          bVar78 = (uVar276 != 0) * (uVar276 < 0x100) * cVar27 - (0xff < uVar276);
          cVar33 = (uVar280 != 0) * (uVar280 < 0x100) * cVar33 - (0xff < uVar280);
          uVar252 = CONCAT13(cVar33,CONCAT12((uVar278 != 0) * (uVar278 < 0x100) * cVar31 -
                                             (0xff < uVar278),
                                             CONCAT11(bVar78,(uVar250 != 0) * (uVar250 < 0x100) *
                                                             bVar18 - (0xff < uVar250))));
          cVar35 = (uVar284 != 0) * (uVar284 < 0x100) * cVar35 - (0xff < uVar284);
          uVar253 = CONCAT15(cVar35,CONCAT14((uVar282 != 0) * (uVar282 < 0x100) * cVar34 -
                                             (0xff < uVar282),uVar252));
          cVar34 = (uVar288 != 0) * (uVar288 < 0x100) * cVar37 - (0xff < uVar288);
          uVar254 = CONCAT17(cVar34,CONCAT16((uVar286 != 0) * (uVar286 < 0x100) * cVar36 -
                                             (0xff < uVar286),uVar253));
          cVar37 = (uVar449 != 0) * (uVar449 < 0x100) * cVar30 - (0xff < uVar449);
          auVar339._0_10_ =
               CONCAT19(cVar37,CONCAT18((uVar442 != 0) * (uVar442 < 0x100) * bVar26 -
                                        (0xff < uVar442),uVar254));
          auVar339[10] = (uVar451 != 0) * (uVar451 < 0x100) * cVar29 - (0xff < uVar451);
          cVar36 = (uVar452 != 0) * (uVar452 < 0x100) * cVar28 - (0xff < uVar452);
          auVar339[0xb] = cVar36;
          auVar345[0xc] = (uVar454 != 0) * (uVar454 < 0x100) * cVar32 - (0xff < uVar454);
          auVar345._0_12_ = auVar339;
          cVar31 = (uVar455 != 0) * (uVar455 < 0x100) * cVar41 - (0xff < uVar455);
          auVar345[0xd] = cVar31;
          auVar351[0xe] = (uVar457 != 0) * (uVar457 < 0x100) * cVar45 - (0xff < uVar457);
          auVar351._0_14_ = auVar345;
          cVar27 = (uVar458 != 0) * (uVar458 < 0x100) * cVar44 - (0xff < uVar458);
          auVar351[0xf] = cVar27;
          uVar442 = (ushort)bVar38;
          uVar449 = (ushort)((uint)uVar368 >> 0x18);
          uVar451 = (ushort)((uint6)uVar369 >> 0x28);
          uVar452 = (ushort)((ulong)uVar370 >> 0x38);
          uVar454 = (ushort)((unkuint10)auVar376._0_10_ >> 0x48);
          uVar455 = auVar376._10_2_ >> 8;
          uVar457 = auVar383._12_2_ >> 8;
          uVar458 = auVar390._14_2_ >> 8;
          uVar250 = (ushort)bVar54;
          uVar276 = (ushort)((uint)uVar231 >> 0x18);
          uVar278 = (ushort)((uint6)uVar232 >> 0x28);
          uVar280 = (ushort)((ulong)uVar233 >> 0x38);
          uVar282 = (ushort)((unkuint10)auVar298._0_10_ >> 0x48);
          uVar284 = auVar298._10_2_ >> 8;
          uVar286 = auVar303._12_2_ >> 8;
          uVar288 = auVar320._14_2_ >> 8;
          bVar18 = (uVar449 != 0) * (uVar449 < 0x100) * cVar52 - (0xff < uVar449);
          cVar44 = (uVar452 != 0) * (uVar452 < 0x100) * cVar49 - (0xff < uVar452);
          uVar231 = CONCAT13(cVar44,CONCAT12((uVar451 != 0) * (uVar451 < 0x100) * cVar53 -
                                             (0xff < uVar451),
                                             CONCAT11(bVar18,(uVar442 != 0) * (uVar442 < 0x100) *
                                                             bVar38 - (0xff < uVar442))));
          cVar45 = (uVar455 != 0) * (uVar455 < 0x100) * cVar43 - (0xff < uVar455);
          uVar232 = CONCAT15(cVar45,CONCAT14((uVar454 != 0) * (uVar454 < 0x100) * cVar39 -
                                             (0xff < uVar454),uVar231));
          cVar30 = (uVar458 != 0) * (uVar458 < 0x100) * cVar42 - (0xff < uVar458);
          uVar233 = CONCAT17(cVar30,CONCAT16((uVar457 != 0) * (uVar457 < 0x100) * cVar40 -
                                             (0xff < uVar457),uVar232));
          cVar41 = (uVar276 != 0) * (uVar276 < 0x100) * cVar55 - (0xff < uVar276);
          auVar377._0_10_ =
               CONCAT19(cVar41,CONCAT18((uVar250 != 0) * (uVar250 < 0x100) * bVar54 -
                                        (0xff < uVar250),uVar233));
          auVar377[10] = (uVar278 != 0) * (uVar278 < 0x100) * cVar47 - (0xff < uVar278);
          cVar32 = (uVar280 != 0) * (uVar280 < 0x100) * cVar51 - (0xff < uVar280);
          auVar377[0xb] = cVar32;
          auVar384[0xc] = (uVar282 != 0) * (uVar282 < 0x100) * cVar50 - (0xff < uVar282);
          auVar384._0_12_ = auVar377;
          cVar28 = (uVar284 != 0) * (uVar284 < 0x100) * cVar48 - (0xff < uVar284);
          auVar384[0xd] = cVar28;
          auVar391[0xe] = (uVar286 != 0) * (uVar286 < 0x100) * cVar56 - (0xff < uVar286);
          auVar391._0_14_ = auVar384;
          cVar29 = (uVar288 != 0) * (uVar288 < 0x100) * cVar57 - (0xff < uVar288);
          auVar391[0xf] = cVar29;
          uVar250 = (ushort)bVar46;
          uVar276 = (ushort)((uint)uVar175 >> 0x18);
          uVar278 = (ushort)((uint6)uVar177 >> 0x28);
          uVar280 = (ushort)((ulong)uVar179 >> 0x38);
          uVar282 = (ushort)((unkuint10)auVar182._0_10_ >> 0x48);
          uVar284 = auVar182._10_2_ >> 8;
          uVar286 = auVar186._12_2_ >> 8;
          uVar288 = auVar196._14_2_ >> 8;
          uVar442 = (ushort)bVar62;
          uVar449 = (ushort)((uint)uVar198 >> 0x18);
          uVar451 = (ushort)((uint6)uVar200 >> 0x28);
          uVar452 = (ushort)((ulong)uVar202 >> 0x38);
          uVar454 = (ushort)((unkuint10)auVar261._0_10_ >> 0x48);
          uVar455 = auVar261._10_2_ >> 8;
          uVar457 = auVar268._12_2_ >> 8;
          uVar458 = auVar275._14_2_ >> 8;
          bVar26 = (uVar276 != 0) * (uVar276 < 0x100) * cVar60 - (0xff < uVar276);
          cVar43 = (uVar280 != 0) * (uVar280 < 0x100) * cVar59 - (0xff < uVar280);
          uVar175 = CONCAT13(cVar43,CONCAT12((uVar278 != 0) * (uVar278 < 0x100) * cVar58 -
                                             (0xff < uVar278),
                                             CONCAT11(bVar26,(uVar250 != 0) * (uVar250 < 0x100) *
                                                             bVar46 - (0xff < uVar250))));
          cVar6 = (uVar284 != 0) * (uVar284 < 0x100) * cVar6 - (0xff < uVar284);
          uVar177 = CONCAT15(cVar6,CONCAT14((uVar282 != 0) * (uVar282 < 0x100) * cVar7 -
                                            (0xff < uVar282),uVar175));
          cVar4 = (uVar288 != 0) * (uVar288 < 0x100) * cVar4 - (0xff < uVar288);
          uVar179 = CONCAT17(cVar4,CONCAT16((uVar286 != 0) * (uVar286 < 0x100) * cVar5 -
                                            (0xff < uVar286),uVar177));
          cVar5 = (uVar449 != 0) * (uVar449 < 0x100) * cVar8 - (0xff < uVar449);
          auVar183._0_10_ =
               CONCAT19(cVar5,CONCAT18((uVar442 != 0) * (uVar442 < 0x100) * bVar62 -
                                       (0xff < uVar442),uVar179));
          auVar183[10] = (uVar451 != 0) * (uVar451 < 0x100) * cVar9 - (0xff < uVar451);
          cVar7 = (uVar452 != 0) * (uVar452 < 0x100) * cVar3 - (0xff < uVar452);
          auVar183[0xb] = cVar7;
          auVar187[0xc] = (uVar454 != 0) * (uVar454 < 0x100) * cVar17 - (0xff < uVar454);
          auVar187._0_12_ = auVar183;
          cVar8 = (uVar455 != 0) * (uVar455 < 0x100) * cVar16 - (0xff < uVar455);
          auVar187[0xd] = cVar8;
          auVar197[0xe] = (uVar457 != 0) * (uVar457 < 0x100) * cVar15 - (0xff < uVar457);
          auVar197._0_14_ = auVar187;
          cVar9 = (uVar458 != 0) * (uVar458 < 0x100) * cVar14 - (0xff < uVar458);
          auVar197[0xf] = cVar9;
          auVar222 = auVar230 & auVar441;
          auVar193 = auVar422 & auVar441;
          sVar522 = auVar222._0_2_;
          sVar474 = auVar222._2_2_;
          sVar480 = auVar222._4_2_;
          sVar504 = auVar222._6_2_;
          sVar506 = auVar222._8_2_;
          sVar246 = auVar222._10_2_;
          sVar248 = auVar222._12_2_;
          sVar251 = auVar222._14_2_;
          sVar279 = auVar193._0_2_;
          sVar283 = auVar193._2_2_;
          sVar287 = auVar193._4_2_;
          sVar524 = auVar193._6_2_;
          sVar526 = auVar193._8_2_;
          sVar324 = auVar193._10_2_;
          sVar330 = auVar193._12_2_;
          sVar352 = auVar193._14_2_;
          auVar312 = auVar245 & auVar441;
          auVar314 = auVar351 & auVar441;
          sVar471 = auVar312._0_2_;
          sVar477 = auVar312._2_2_;
          in_XMM4[1] = (0 < sVar477) * (sVar477 < 0x100) * auVar312[2] - (0xff < sVar477);
          in_XMM4[0] = (0 < sVar471) * (sVar471 < 0x100) * auVar312[0] - (0xff < sVar471);
          sVar471 = auVar312._4_2_;
          in_XMM4[2] = (0 < sVar471) * (sVar471 < 0x100) * auVar312[4] - (0xff < sVar471);
          sVar471 = auVar312._6_2_;
          in_XMM4[3] = (0 < sVar471) * (sVar471 < 0x100) * auVar312[6] - (0xff < sVar471);
          sVar471 = auVar312._8_2_;
          in_XMM4[4] = (0 < sVar471) * (sVar471 < 0x100) * auVar312[8] - (0xff < sVar471);
          sVar471 = auVar312._10_2_;
          in_XMM4[5] = (0 < sVar471) * (sVar471 < 0x100) * auVar312[10] - (0xff < sVar471);
          sVar471 = auVar312._12_2_;
          in_XMM4[6] = (0 < sVar471) * (sVar471 < 0x100) * auVar312[0xc] - (0xff < sVar471);
          sVar471 = auVar312._14_2_;
          in_XMM4[7] = (0 < sVar471) * (sVar471 < 0x100) * auVar312[0xe] - (0xff < sVar471);
          sVar471 = auVar314._0_2_;
          in_XMM4[8] = (0 < sVar471) * (sVar471 < 0x100) * auVar314[0] - (0xff < sVar471);
          sVar471 = auVar314._2_2_;
          in_XMM4[9] = (0 < sVar471) * (sVar471 < 0x100) * auVar314[2] - (0xff < sVar471);
          sVar471 = auVar314._4_2_;
          in_XMM4[10] = (0 < sVar471) * (sVar471 < 0x100) * auVar314[4] - (0xff < sVar471);
          sVar471 = auVar314._6_2_;
          in_XMM4[0xb] = (0 < sVar471) * (sVar471 < 0x100) * auVar314[6] - (0xff < sVar471);
          sVar471 = auVar314._8_2_;
          in_XMM4[0xc] = (0 < sVar471) * (sVar471 < 0x100) * auVar314[8] - (0xff < sVar471);
          sVar471 = auVar314._10_2_;
          in_XMM4[0xd] = (0 < sVar471) * (sVar471 < 0x100) * auVar314[10] - (0xff < sVar471);
          sVar471 = auVar314._12_2_;
          in_XMM4[0xe] = (0 < sVar471) * (sVar471 < 0x100) * auVar314[0xc] - (0xff < sVar471);
          sVar471 = auVar314._14_2_;
          in_XMM4[0xf] = (0 < sVar471) * (sVar471 < 0x100) * auVar314[0xe] - (0xff < sVar471);
          auVar312 = auVar391 & auVar441;
          auVar441 = auVar197 & auVar441;
          sVar471 = auVar312._0_2_;
          sVar477 = auVar312._2_2_;
          sVar503 = auVar312._4_2_;
          sVar505 = auVar312._6_2_;
          sVar450 = auVar312._8_2_;
          sVar247 = auVar312._10_2_;
          sVar249 = auVar312._12_2_;
          sVar277 = auVar312._14_2_;
          sVar281 = auVar441._0_2_;
          sVar285 = auVar441._2_2_;
          sVar289 = auVar441._4_2_;
          sVar321 = auVar441._6_2_;
          sVar528 = auVar441._8_2_;
          sVar327 = auVar441._10_2_;
          sVar332 = auVar441._12_2_;
          sVar354 = auVar441._14_2_;
          uVar442 = (ushort)bVar2;
          uVar449 = (ushort)((uint)uVar199 >> 0x18);
          uVar451 = (ushort)((uint6)uVar201 >> 0x28);
          uVar452 = (ushort)((ulong)uVar203 >> 0x38);
          uVar454 = (ushort)((unkuint10)auVar208._0_10_ >> 0x48);
          uVar455 = auVar208._10_2_ >> 8;
          uVar457 = auVar213._12_2_ >> 8;
          uVar458 = auVar230._14_2_ >> 8;
          uVar481 = (ushort)bVar10;
          uVar495 = (ushort)((uint)uVar291 >> 0x18);
          uVar496 = (ushort)((uint6)uVar292 >> 0x28);
          uVar497 = (ushort)((ulong)uVar293 >> 0x38);
          uVar498 = (ushort)((unkuint10)auVar412._0_10_ >> 0x48);
          uVar499 = auVar412._10_2_ >> 8;
          uVar500 = auVar416._12_2_ >> 8;
          uVar501 = auVar422._14_2_ >> 8;
          uVar290 = (ushort)bVar70;
          uVar322 = (ushort)((uint)uVar174 >> 0x18);
          uVar323 = (ushort)((uint6)uVar176 >> 0x28);
          uVar325 = (ushort)((ulong)uVar178 >> 0x38);
          uVar326 = (ushort)((unkuint10)auVar237._0_10_ >> 0x48);
          uVar328 = auVar237._10_2_ >> 8;
          uVar329 = auVar241._12_2_ >> 8;
          uVar331 = auVar245._14_2_ >> 8;
          uVar333 = (ushort)bVar78;
          uVar353 = (ushort)((uint)uVar252 >> 0x18);
          uVar355 = (ushort)((uint6)uVar253 >> 0x28);
          uVar357 = (ushort)((ulong)uVar254 >> 0x38);
          uVar359 = (ushort)((unkuint10)auVar339._0_10_ >> 0x48);
          uVar361 = auVar339._10_2_ >> 8;
          uVar363 = auVar345._12_2_ >> 8;
          uVar365 = auVar351._14_2_ >> 8;
          uVar367 = (ushort)bVar18;
          uVar393 = (ushort)((uint)uVar231 >> 0x18);
          uVar395 = (ushort)((uint6)uVar232 >> 0x28);
          uVar397 = (ushort)((ulong)uVar233 >> 0x38);
          uVar399 = (ushort)((unkuint10)auVar377._0_10_ >> 0x48);
          uVar401 = auVar377._10_2_ >> 8;
          uVar403 = auVar384._12_2_ >> 8;
          uVar405 = auVar391._14_2_ >> 8;
          uVar250 = (ushort)bVar26;
          uVar276 = (ushort)((uint)uVar175 >> 0x18);
          uVar278 = (ushort)((uint6)uVar177 >> 0x28);
          uVar280 = (ushort)((ulong)uVar179 >> 0x38);
          uVar282 = (ushort)((unkuint10)auVar183._0_10_ >> 0x48);
          uVar284 = auVar183._10_2_ >> 8;
          uVar286 = auVar187._12_2_ >> 8;
          uVar288 = auVar197._14_2_ >> 8;
          puVar1 = puVar169 + RGB_stride;
          *puVar1 = (0 < sVar522) * (sVar522 < 0x100) * auVar222[0] - (0xff < sVar522);
          puVar1[1] = (0 < sVar474) * (sVar474 < 0x100) * auVar222[2] - (0xff < sVar474);
          puVar1[2] = (0 < sVar480) * (sVar480 < 0x100) * auVar222[4] - (0xff < sVar480);
          puVar1[3] = (0 < sVar504) * (sVar504 < 0x100) * auVar222[6] - (0xff < sVar504);
          puVar1[4] = (0 < sVar506) * (sVar506 < 0x100) * auVar222[8] - (0xff < sVar506);
          puVar1[5] = (0 < sVar246) * (sVar246 < 0x100) * auVar222[10] - (0xff < sVar246);
          puVar1[6] = (0 < sVar248) * (sVar248 < 0x100) * auVar222[0xc] - (0xff < sVar248);
          puVar1[7] = (0 < sVar251) * (sVar251 < 0x100) * auVar222[0xe] - (0xff < sVar251);
          puVar1[8] = (0 < sVar279) * (sVar279 < 0x100) * auVar193[0] - (0xff < sVar279);
          puVar1[9] = (0 < sVar283) * (sVar283 < 0x100) * auVar193[2] - (0xff < sVar283);
          puVar1[10] = (0 < sVar287) * (sVar287 < 0x100) * auVar193[4] - (0xff < sVar287);
          puVar1[0xb] = (0 < sVar524) * (sVar524 < 0x100) * auVar193[6] - (0xff < sVar524);
          puVar1[0xc] = (0 < sVar526) * (sVar526 < 0x100) * auVar193[8] - (0xff < sVar526);
          puVar1[0xd] = (0 < sVar324) * (sVar324 < 0x100) * auVar193[10] - (0xff < sVar324);
          puVar1[0xe] = (0 < sVar330) * (sVar330 < 0x100) * auVar193[0xc] - (0xff < sVar330);
          puVar1[0xf] = (0 < sVar352) * (sVar352 < 0x100) * auVar193[0xe] - (0xff < sVar352);
          *(undefined1 (*) [16])(puVar169 + (ulong)RGB_stride + 0x10) = in_XMM4;
          puVar1 = puVar169 + (ulong)RGB_stride + 0x20;
          *puVar1 = (0 < sVar471) * (sVar471 < 0x100) * auVar312[0] - (0xff < sVar471);
          puVar1[1] = (0 < sVar477) * (sVar477 < 0x100) * auVar312[2] - (0xff < sVar477);
          puVar1[2] = (0 < sVar503) * (sVar503 < 0x100) * auVar312[4] - (0xff < sVar503);
          puVar1[3] = (0 < sVar505) * (sVar505 < 0x100) * auVar312[6] - (0xff < sVar505);
          puVar1[4] = (0 < sVar450) * (sVar450 < 0x100) * auVar312[8] - (0xff < sVar450);
          puVar1[5] = (0 < sVar247) * (sVar247 < 0x100) * auVar312[10] - (0xff < sVar247);
          puVar1[6] = (0 < sVar249) * (sVar249 < 0x100) * auVar312[0xc] - (0xff < sVar249);
          puVar1[7] = (0 < sVar277) * (sVar277 < 0x100) * auVar312[0xe] - (0xff < sVar277);
          puVar1[8] = (0 < sVar281) * (sVar281 < 0x100) * auVar441[0] - (0xff < sVar281);
          puVar1[9] = (0 < sVar285) * (sVar285 < 0x100) * auVar441[2] - (0xff < sVar285);
          puVar1[10] = (0 < sVar289) * (sVar289 < 0x100) * auVar441[4] - (0xff < sVar289);
          puVar1[0xb] = (0 < sVar321) * (sVar321 < 0x100) * auVar441[6] - (0xff < sVar321);
          puVar1[0xc] = (0 < sVar528) * (sVar528 < 0x100) * auVar441[8] - (0xff < sVar528);
          puVar1[0xd] = (0 < sVar327) * (sVar327 < 0x100) * auVar441[10] - (0xff < sVar327);
          puVar1[0xe] = (0 < sVar332) * (sVar332 < 0x100) * auVar441[0xc] - (0xff < sVar332);
          puVar1[0xf] = (0 < sVar354) * (sVar354 < 0x100) * auVar441[0xe] - (0xff < sVar354);
          puVar1 = puVar169 + (ulong)RGB_stride + 0x30;
          *puVar1 = (uVar442 != 0) * (uVar442 < 0x100) * bVar2 - (0xff < uVar442);
          puVar1[1] = (uVar449 != 0) * (uVar449 < 0x100) * cVar22 - (0xff < uVar449);
          puVar1[2] = (uVar451 != 0) * (uVar451 < 0x100) * cVar21 - (0xff < uVar451);
          puVar1[3] = (uVar452 != 0) * (uVar452 < 0x100) * cVar20 - (0xff < uVar452);
          puVar1[4] = (uVar454 != 0) * (uVar454 < 0x100) * cVar19 - (0xff < uVar454);
          puVar1[5] = (uVar455 != 0) * (uVar455 < 0x100) * cVar13 - (0xff < uVar455);
          puVar1[6] = (uVar457 != 0) * (uVar457 < 0x100) * cVar11 - (0xff < uVar457);
          puVar1[7] = (uVar458 != 0) * (uVar458 < 0x100) * cVar12 - (0xff < uVar458);
          puVar1[8] = (uVar481 != 0) * (uVar481 < 0x100) * bVar10 - (0xff < uVar481);
          puVar1[9] = (uVar495 != 0) * (uVar495 < 0x100) * cVar23 - (0xff < uVar495);
          puVar1[10] = (uVar496 != 0) * (uVar496 < 0x100) * cVar24 - (0xff < uVar496);
          puVar1[0xb] = (uVar497 != 0) * (uVar497 < 0x100) * cVar25 - (0xff < uVar497);
          puVar1[0xc] = (uVar498 != 0) * (uVar498 < 0x100) * cVar61 - (0xff < uVar498);
          puVar1[0xd] = (uVar499 != 0) * (uVar499 < 0x100) * cVar63 - (0xff < uVar499);
          puVar1[0xe] = (uVar500 != 0) * (uVar500 < 0x100) * cVar69 - (0xff < uVar500);
          puVar1[0xf] = (uVar501 != 0) * (uVar501 < 0x100) * cVar68 - (0xff < uVar501);
          auVar222 = _DAT_0010a570;
          puVar1 = puVar169 + (ulong)RGB_stride + 0x40;
          *puVar1 = (uVar290 != 0) * (uVar290 < 0x100) * bVar70 - (0xff < uVar290);
          puVar1[1] = (uVar322 != 0) * (uVar322 < 0x100) * cVar72 - (0xff < uVar322);
          puVar1[2] = (uVar323 != 0) * (uVar323 < 0x100) * cVar71 - (0xff < uVar323);
          puVar1[3] = (uVar325 != 0) * (uVar325 < 0x100) * cVar67 - (0xff < uVar325);
          puVar1[4] = (uVar326 != 0) * (uVar326 < 0x100) * cVar73 - (0xff < uVar326);
          puVar1[5] = (uVar328 != 0) * (uVar328 < 0x100) * cVar66 - (0xff < uVar328);
          puVar1[6] = (uVar329 != 0) * (uVar329 < 0x100) * cVar64 - (0xff < uVar329);
          puVar1[7] = (uVar331 != 0) * (uVar331 < 0x100) * cVar65 - (0xff < uVar331);
          puVar1[8] = (uVar333 != 0) * (uVar333 < 0x100) * bVar78 - (0xff < uVar333);
          puVar1[9] = (uVar353 != 0) * (uVar353 < 0x100) * cVar33 - (0xff < uVar353);
          puVar1[10] = (uVar355 != 0) * (uVar355 < 0x100) * cVar35 - (0xff < uVar355);
          puVar1[0xb] = (uVar357 != 0) * (uVar357 < 0x100) * cVar34 - (0xff < uVar357);
          puVar1[0xc] = (uVar359 != 0) * (uVar359 < 0x100) * cVar37 - (0xff < uVar359);
          puVar1[0xd] = (uVar361 != 0) * (uVar361 < 0x100) * cVar36 - (0xff < uVar361);
          puVar1[0xe] = (uVar363 != 0) * (uVar363 < 0x100) * cVar31 - (0xff < uVar363);
          puVar1[0xf] = (uVar365 != 0) * (uVar365 < 0x100) * cVar27 - (0xff < uVar365);
          puVar1 = puVar169 + (ulong)RGB_stride + 0x50;
          *puVar1 = (uVar367 != 0) * (uVar367 < 0x100) * bVar18 - (0xff < uVar367);
          puVar1[1] = (uVar393 != 0) * (uVar393 < 0x100) * cVar44 - (0xff < uVar393);
          puVar1[2] = (uVar395 != 0) * (uVar395 < 0x100) * cVar45 - (0xff < uVar395);
          puVar1[3] = (uVar397 != 0) * (uVar397 < 0x100) * cVar30 - (0xff < uVar397);
          puVar1[4] = (uVar399 != 0) * (uVar399 < 0x100) * cVar41 - (0xff < uVar399);
          puVar1[5] = (uVar401 != 0) * (uVar401 < 0x100) * cVar32 - (0xff < uVar401);
          puVar1[6] = (uVar403 != 0) * (uVar403 < 0x100) * cVar28 - (0xff < uVar403);
          puVar1[7] = (uVar405 != 0) * (uVar405 < 0x100) * cVar29 - (0xff < uVar405);
          puVar1[8] = (uVar250 != 0) * (uVar250 < 0x100) * bVar26 - (0xff < uVar250);
          puVar1[9] = (uVar276 != 0) * (uVar276 < 0x100) * cVar43 - (0xff < uVar276);
          puVar1[10] = (uVar278 != 0) * (uVar278 < 0x100) * cVar6 - (0xff < uVar278);
          puVar1[0xb] = (uVar280 != 0) * (uVar280 < 0x100) * cVar4 - (0xff < uVar280);
          puVar1[0xc] = (uVar282 != 0) * (uVar282 < 0x100) * cVar5 - (0xff < uVar282);
          puVar1[0xd] = (uVar284 != 0) * (uVar284 < 0x100) * cVar7 - (0xff < uVar284);
          puVar1[0xe] = (uVar286 != 0) * (uVar286 < 0x100) * cVar8 - (0xff < uVar286);
          puVar1[0xf] = (uVar288 != 0) * (uVar288 < 0x100) * cVar9 - (0xff < uVar288);
          lVar167 = lVar167 + 0x20;
          uVar168 = uVar168 + 0x10;
          puVar169 = puVar169 + 0x60;
        } while ((uint)lVar167 < width - 0x1f);
      }
      uVar171 = uVar171 + 2;
      uVar170 = (ulong)(uint)((int)uVar170 + iVar119);
      Y_stride = Y_stride + iVar119;
      uVar172 = uVar172 + iVar120;
      RGB_stride = RGB_stride + iVar120;
    } while (uVar171 < height - 1);
  }
  return;
}

Assistant:

void yuv420_rgb24_sseu(
	uint32_t width, uint32_t height, 
	const uint8_t *Y, const uint8_t *U, const uint8_t *V, uint32_t Y_stride, uint32_t UV_stride, 
	uint8_t *RGB, uint32_t RGB_stride, 
	YCbCrType yuv_type)
{
	#define LOAD_SI128 _mm_loadu_si128
	#define SAVE_SI128 _mm_storeu_si128
	const YUV2RGBParam *const param = &(YUV2RGB[yuv_type]);
	
	uint32_t x, y;
	for(y=0; y<(height-1); y+=2)
	{
		const uint8_t *y_ptr1=Y+y*Y_stride,
			*y_ptr2=Y+(y+1)*Y_stride,
			*u_ptr=U+(y/2)*UV_stride,
			*v_ptr=V+(y/2)*UV_stride;
		
		uint8_t *rgb_ptr1=RGB+y*RGB_stride,
			*rgb_ptr2=RGB+(y+1)*RGB_stride;
		
		for(x=0; x<(width-31); x+=32)
		{
			YUV2RGB_32_PLANAR
			
			y_ptr1+=32;
			y_ptr2+=32;
			u_ptr+=16; 
			v_ptr+=16;
			rgb_ptr1+=96;
			rgb_ptr2+=96;
		}
	}
	#undef LOAD_SI128
	#undef SAVE_SI128
}